

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersectorK<4,8>::
     occluded_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  ulong uVar6;
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  long lVar12;
  __int_type_conflict _Var13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  bool bVar52;
  bool bVar53;
  bool bVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  bool bVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  ulong uVar78;
  long lVar79;
  long lVar80;
  uint uVar81;
  ulong uVar82;
  long lVar84;
  bool bVar85;
  vint4 bi_2;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar102 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  vint4 bi_1;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar141;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar142;
  float fVar169;
  float fVar170;
  vint4 bi;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar171;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar172;
  float fVar204;
  float fVar205;
  vint4 ai_1;
  undefined1 auVar173 [16];
  float fVar206;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar207;
  float fVar228;
  float fVar229;
  vint4 ai_2;
  undefined1 auVar208 [16];
  float fVar230;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  float fVar231;
  float fVar246;
  float fVar247;
  undefined1 auVar232 [16];
  float fVar248;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar263;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar257 [16];
  float fVar264;
  float fVar265;
  undefined1 auVar262 [32];
  vint4 ai;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [32];
  vfloat4 a0_1;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [32];
  float fVar307;
  float fVar316;
  float fVar317;
  undefined1 auVar308 [16];
  float fVar318;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [32];
  float fVar319;
  float fVar327;
  float fVar328;
  undefined1 auVar320 [16];
  float fVar329;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float fVar330;
  float fVar331;
  float fVar336;
  float fVar338;
  undefined1 auVar332 [16];
  float fVar340;
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar337;
  float fVar339;
  float fVar341;
  undefined1 auVar335 [16];
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar357;
  float fVar358;
  undefined1 auVar350 [16];
  float fVar359;
  undefined1 auVar351 [16];
  undefined1 auVar353 [16];
  undefined1 auVar352 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  float fVar360;
  float fVar361;
  undefined1 auVar356 [32];
  float fVar362;
  float fVar363;
  float fVar370;
  float fVar372;
  float fVar374;
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  float fVar371;
  float fVar373;
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  float fVar375;
  float fVar376;
  float fVar383;
  float fVar385;
  vfloat4 a0;
  float fVar387;
  undefined1 auVar377 [16];
  float fVar384;
  float fVar386;
  float fVar388;
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar382 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_711;
  undefined1 local_6d0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5d0 [8];
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  uint local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined1 local_4b0 [8];
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  undefined1 local_490 [8];
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  uint auStack_470 [4];
  RTCFilterFunctionNArguments local_460;
  undefined1 local_430 [8];
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [8];
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [16];
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [8];
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  float afStack_300 [8];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  float local_240;
  float fStack_23c;
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [16];
  undefined1 local_170 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  undefined1 local_140 [16];
  undefined1 local_130 [16];
  undefined1 local_120 [16];
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar83;
  undefined1 auVar203 [32];
  undefined1 auVar381 [32];
  
  PVar7 = prim[1];
  uVar78 = (ulong)(byte)PVar7;
  lVar79 = uVar78 * 0x25;
  auVar129 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar129 = vinsertps_avx(auVar129,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar179 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar179 = vinsertps_avx(auVar179,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  fVar142 = *(float *)(prim + lVar79 + 0x12);
  auVar129 = vsubps_avx(auVar129,*(undefined1 (*) [16])(prim + lVar79 + 6));
  auVar112._0_4_ = fVar142 * auVar129._0_4_;
  auVar112._4_4_ = fVar142 * auVar129._4_4_;
  auVar112._8_4_ = fVar142 * auVar129._8_4_;
  auVar112._12_4_ = fVar142 * auVar129._12_4_;
  auVar266._0_4_ = fVar142 * auVar179._0_4_;
  auVar266._4_4_ = fVar142 * auVar179._4_4_;
  auVar266._8_4_ = fVar142 * auVar179._8_4_;
  auVar266._12_4_ = fVar142 * auVar179._12_4_;
  auVar129 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 4 + 6)));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar179 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 5 + 6)));
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar244 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 6 + 6)));
  auVar244 = vcvtdq2ps_avx(auVar244);
  auVar280 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0xf + 6)));
  auVar280 = vcvtdq2ps_avx(auVar280);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar155 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar78 + 6)));
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x1a + 6)));
  auVar155 = vcvtdq2ps_avx(auVar155);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x1b + 6)));
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar78 * 0x1c + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar103 = vshufps_avx(auVar266,auVar266,0);
  auVar158 = vshufps_avx(auVar266,auVar266,0x55);
  auVar273 = vshufps_avx(auVar266,auVar266,0xaa);
  fVar142 = auVar273._0_4_;
  fVar169 = auVar273._4_4_;
  fVar170 = auVar273._8_4_;
  fVar171 = auVar273._12_4_;
  fVar207 = auVar158._0_4_;
  fVar228 = auVar158._4_4_;
  fVar229 = auVar158._8_4_;
  fVar230 = auVar158._12_4_;
  fVar172 = auVar103._0_4_;
  fVar204 = auVar103._4_4_;
  fVar205 = auVar103._8_4_;
  fVar206 = auVar103._12_4_;
  auVar332._0_4_ = fVar172 * auVar129._0_4_ + fVar207 * auVar179._0_4_ + fVar142 * auVar244._0_4_;
  auVar332._4_4_ = fVar204 * auVar129._4_4_ + fVar228 * auVar179._4_4_ + fVar169 * auVar244._4_4_;
  auVar332._8_4_ = fVar205 * auVar129._8_4_ + fVar229 * auVar179._8_4_ + fVar170 * auVar244._8_4_;
  auVar332._12_4_ =
       fVar206 * auVar129._12_4_ + fVar230 * auVar179._12_4_ + fVar171 * auVar244._12_4_;
  auVar350._0_4_ = fVar172 * auVar280._0_4_ + fVar207 * auVar15._0_4_ + auVar155._0_4_ * fVar142;
  auVar350._4_4_ = fVar204 * auVar280._4_4_ + fVar228 * auVar15._4_4_ + auVar155._4_4_ * fVar169;
  auVar350._8_4_ = fVar205 * auVar280._8_4_ + fVar229 * auVar15._8_4_ + auVar155._8_4_ * fVar170;
  auVar350._12_4_ = fVar206 * auVar280._12_4_ + fVar230 * auVar15._12_4_ + auVar155._12_4_ * fVar171
  ;
  auVar267._0_4_ = fVar172 * auVar196._0_4_ + fVar207 * auVar128._0_4_ + auVar195._0_4_ * fVar142;
  auVar267._4_4_ = fVar204 * auVar196._4_4_ + fVar228 * auVar128._4_4_ + auVar195._4_4_ * fVar169;
  auVar267._8_4_ = fVar205 * auVar196._8_4_ + fVar229 * auVar128._8_4_ + auVar195._8_4_ * fVar170;
  auVar267._12_4_ =
       fVar206 * auVar196._12_4_ + fVar230 * auVar128._12_4_ + auVar195._12_4_ * fVar171;
  auVar103 = vshufps_avx(auVar112,auVar112,0);
  auVar158 = vshufps_avx(auVar112,auVar112,0x55);
  auVar273 = vshufps_avx(auVar112,auVar112,0xaa);
  fVar142 = auVar273._0_4_;
  fVar169 = auVar273._4_4_;
  fVar170 = auVar273._8_4_;
  fVar171 = auVar273._12_4_;
  fVar207 = auVar158._0_4_;
  fVar228 = auVar158._4_4_;
  fVar229 = auVar158._8_4_;
  fVar230 = auVar158._12_4_;
  fVar172 = auVar103._0_4_;
  fVar204 = auVar103._4_4_;
  fVar205 = auVar103._8_4_;
  fVar206 = auVar103._12_4_;
  auVar143._0_4_ = fVar172 * auVar129._0_4_ + fVar207 * auVar179._0_4_ + fVar142 * auVar244._0_4_;
  auVar143._4_4_ = fVar204 * auVar129._4_4_ + fVar228 * auVar179._4_4_ + fVar169 * auVar244._4_4_;
  auVar143._8_4_ = fVar205 * auVar129._8_4_ + fVar229 * auVar179._8_4_ + fVar170 * auVar244._8_4_;
  auVar143._12_4_ =
       fVar206 * auVar129._12_4_ + fVar230 * auVar179._12_4_ + fVar171 * auVar244._12_4_;
  auVar113._0_4_ = fVar172 * auVar280._0_4_ + auVar155._0_4_ * fVar142 + fVar207 * auVar15._0_4_;
  auVar113._4_4_ = fVar204 * auVar280._4_4_ + auVar155._4_4_ * fVar169 + fVar228 * auVar15._4_4_;
  auVar113._8_4_ = fVar205 * auVar280._8_4_ + auVar155._8_4_ * fVar170 + fVar229 * auVar15._8_4_;
  auVar113._12_4_ = fVar206 * auVar280._12_4_ + auVar155._12_4_ * fVar171 + fVar230 * auVar15._12_4_
  ;
  auVar86._0_4_ = fVar172 * auVar196._0_4_ + fVar207 * auVar128._0_4_ + auVar195._0_4_ * fVar142;
  auVar86._4_4_ = fVar204 * auVar196._4_4_ + fVar228 * auVar128._4_4_ + auVar195._4_4_ * fVar169;
  auVar86._8_4_ = fVar205 * auVar196._8_4_ + fVar229 * auVar128._8_4_ + auVar195._8_4_ * fVar170;
  auVar86._12_4_ = fVar206 * auVar196._12_4_ + fVar230 * auVar128._12_4_ + auVar195._12_4_ * fVar171
  ;
  auVar249._8_4_ = 0x7fffffff;
  auVar249._0_8_ = 0x7fffffff7fffffff;
  auVar249._12_4_ = 0x7fffffff;
  auVar129 = vandps_avx(auVar332,auVar249);
  auVar208._8_4_ = 0x219392ef;
  auVar208._0_8_ = 0x219392ef219392ef;
  auVar208._12_4_ = 0x219392ef;
  auVar129 = vcmpps_avx(auVar129,auVar208,1);
  auVar179 = vblendvps_avx(auVar332,auVar208,auVar129);
  auVar129 = vandps_avx(auVar350,auVar249);
  auVar129 = vcmpps_avx(auVar129,auVar208,1);
  auVar244 = vblendvps_avx(auVar350,auVar208,auVar129);
  auVar129 = vandps_avx(auVar267,auVar249);
  auVar129 = vcmpps_avx(auVar129,auVar208,1);
  auVar129 = vblendvps_avx(auVar267,auVar208,auVar129);
  auVar280 = vrcpps_avx(auVar179);
  fVar172 = auVar280._0_4_;
  auVar173._0_4_ = fVar172 * auVar179._0_4_;
  fVar204 = auVar280._4_4_;
  auVar173._4_4_ = fVar204 * auVar179._4_4_;
  fVar205 = auVar280._8_4_;
  auVar173._8_4_ = fVar205 * auVar179._8_4_;
  fVar206 = auVar280._12_4_;
  auVar173._12_4_ = fVar206 * auVar179._12_4_;
  auVar268._8_4_ = 0x3f800000;
  auVar268._0_8_ = &DAT_3f8000003f800000;
  auVar268._12_4_ = 0x3f800000;
  auVar179 = vsubps_avx(auVar268,auVar173);
  fVar172 = fVar172 + fVar172 * auVar179._0_4_;
  fVar204 = fVar204 + fVar204 * auVar179._4_4_;
  fVar205 = fVar205 + fVar205 * auVar179._8_4_;
  fVar206 = fVar206 + fVar206 * auVar179._12_4_;
  auVar179 = vrcpps_avx(auVar244);
  fVar207 = auVar179._0_4_;
  auVar232._0_4_ = fVar207 * auVar244._0_4_;
  fVar228 = auVar179._4_4_;
  auVar232._4_4_ = fVar228 * auVar244._4_4_;
  fVar229 = auVar179._8_4_;
  auVar232._8_4_ = fVar229 * auVar244._8_4_;
  fVar230 = auVar179._12_4_;
  auVar232._12_4_ = fVar230 * auVar244._12_4_;
  auVar179 = vsubps_avx(auVar268,auVar232);
  fVar207 = fVar207 + fVar207 * auVar179._0_4_;
  fVar228 = fVar228 + fVar228 * auVar179._4_4_;
  fVar229 = fVar229 + fVar229 * auVar179._8_4_;
  fVar230 = fVar230 + fVar230 * auVar179._12_4_;
  auVar179 = vrcpps_avx(auVar129);
  fVar231 = auVar179._0_4_;
  auVar250._0_4_ = fVar231 * auVar129._0_4_;
  fVar246 = auVar179._4_4_;
  auVar250._4_4_ = fVar246 * auVar129._4_4_;
  fVar247 = auVar179._8_4_;
  auVar250._8_4_ = fVar247 * auVar129._8_4_;
  fVar248 = auVar179._12_4_;
  auVar250._12_4_ = fVar248 * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar268,auVar250);
  fVar231 = fVar231 + fVar231 * auVar129._0_4_;
  fVar246 = fVar246 + fVar246 * auVar129._4_4_;
  fVar247 = fVar247 + fVar247 * auVar129._8_4_;
  fVar248 = fVar248 + fVar248 * auVar129._12_4_;
  auVar129 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar79 + 0x16)) *
                           *(float *)(prim + lVar79 + 0x1a)));
  auVar244 = vshufps_avx(auVar129,auVar129,0);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + uVar78 * 7 + 6);
  auVar129 = vpmovsxwd_avx(auVar129);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar78 * 0xb + 6);
  auVar179 = vpmovsxwd_avx(auVar179);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar179 = vsubps_avx(auVar179,auVar129);
  fVar142 = auVar244._0_4_;
  fVar169 = auVar244._4_4_;
  fVar170 = auVar244._8_4_;
  fVar171 = auVar244._12_4_;
  auVar269._0_4_ = auVar179._0_4_ * fVar142 + auVar129._0_4_;
  auVar269._4_4_ = auVar179._4_4_ * fVar169 + auVar129._4_4_;
  auVar269._8_4_ = auVar179._8_4_ * fVar170 + auVar129._8_4_;
  auVar269._12_4_ = auVar179._12_4_ * fVar171 + auVar129._12_4_;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = *(ulong *)(prim + uVar78 * 9 + 6);
  auVar129 = vpmovsxwd_avx(auVar244);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar280._8_8_ = 0;
  auVar280._0_8_ = *(ulong *)(prim + uVar78 * 0xd + 6);
  auVar179 = vpmovsxwd_avx(auVar280);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar179 = vsubps_avx(auVar179,auVar129);
  auVar277._0_4_ = auVar179._0_4_ * fVar142 + auVar129._0_4_;
  auVar277._4_4_ = auVar179._4_4_ * fVar169 + auVar129._4_4_;
  auVar277._8_4_ = auVar179._8_4_ * fVar170 + auVar129._8_4_;
  auVar277._12_4_ = auVar179._12_4_ * fVar171 + auVar129._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar78 * 0x12 + 6);
  auVar129 = vpmovsxwd_avx(auVar15);
  auVar129 = vcvtdq2ps_avx(auVar129);
  uVar82 = (ulong)(uint)((int)(uVar78 * 5) << 2);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar78 * 2 + uVar82 + 6);
  auVar179 = vpmovsxwd_avx(auVar155);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar179 = vsubps_avx(auVar179,auVar129);
  auVar295._0_4_ = auVar179._0_4_ * fVar142 + auVar129._0_4_;
  auVar295._4_4_ = auVar179._4_4_ * fVar169 + auVar129._4_4_;
  auVar295._8_4_ = auVar179._8_4_ * fVar170 + auVar129._8_4_;
  auVar295._12_4_ = auVar179._12_4_ * fVar171 + auVar129._12_4_;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar82 + 6);
  auVar129 = vpmovsxwd_avx(auVar196);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar78 * 0x18 + 6);
  auVar179 = vpmovsxwd_avx(auVar128);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar179 = vsubps_avx(auVar179,auVar129);
  auVar308._0_4_ = auVar179._0_4_ * fVar142 + auVar129._0_4_;
  auVar308._4_4_ = auVar179._4_4_ * fVar169 + auVar129._4_4_;
  auVar308._8_4_ = auVar179._8_4_ * fVar170 + auVar129._8_4_;
  auVar308._12_4_ = auVar179._12_4_ * fVar171 + auVar129._12_4_;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar78 * 0x1d + 6);
  auVar129 = vpmovsxwd_avx(auVar195);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar78 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar179 = vpmovsxwd_avx(auVar103);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar244 = vsubps_avx(auVar179,auVar129);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar78) + 6);
  auVar179 = vpmovsxwd_avx(auVar158);
  auVar320._0_4_ = auVar244._0_4_ * fVar142 + auVar129._0_4_;
  auVar320._4_4_ = auVar244._4_4_ * fVar169 + auVar129._4_4_;
  auVar320._8_4_ = auVar244._8_4_ * fVar170 + auVar129._8_4_;
  auVar320._12_4_ = auVar244._12_4_ * fVar171 + auVar129._12_4_;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = *(ulong *)(prim + uVar78 * 0x23 + 6);
  auVar244 = vpmovsxwd_avx(auVar273);
  auVar129 = vcvtdq2ps_avx(auVar179);
  auVar179 = vcvtdq2ps_avx(auVar244);
  auVar179 = vsubps_avx(auVar179,auVar129);
  auVar251._0_4_ = auVar129._0_4_ + auVar179._0_4_ * fVar142;
  auVar251._4_4_ = auVar129._4_4_ + auVar179._4_4_ * fVar169;
  auVar251._8_4_ = auVar129._8_4_ + auVar179._8_4_ * fVar170;
  auVar251._12_4_ = auVar129._12_4_ + auVar179._12_4_ * fVar171;
  auVar129 = vsubps_avx(auVar269,auVar143);
  auVar270._0_4_ = fVar172 * auVar129._0_4_;
  auVar270._4_4_ = fVar204 * auVar129._4_4_;
  auVar270._8_4_ = fVar205 * auVar129._8_4_;
  auVar270._12_4_ = fVar206 * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar277,auVar143);
  auVar144._0_4_ = fVar172 * auVar129._0_4_;
  auVar144._4_4_ = fVar204 * auVar129._4_4_;
  auVar144._8_4_ = fVar205 * auVar129._8_4_;
  auVar144._12_4_ = fVar206 * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar295,auVar113);
  auVar174._0_4_ = fVar207 * auVar129._0_4_;
  auVar174._4_4_ = fVar228 * auVar129._4_4_;
  auVar174._8_4_ = fVar229 * auVar129._8_4_;
  auVar174._12_4_ = fVar230 * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar308,auVar113);
  auVar114._0_4_ = fVar207 * auVar129._0_4_;
  auVar114._4_4_ = fVar228 * auVar129._4_4_;
  auVar114._8_4_ = fVar229 * auVar129._8_4_;
  auVar114._12_4_ = fVar230 * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar320,auVar86);
  auVar209._0_4_ = fVar231 * auVar129._0_4_;
  auVar209._4_4_ = fVar246 * auVar129._4_4_;
  auVar209._8_4_ = fVar247 * auVar129._8_4_;
  auVar209._12_4_ = fVar248 * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar251,auVar86);
  auVar87._0_4_ = fVar231 * auVar129._0_4_;
  auVar87._4_4_ = fVar246 * auVar129._4_4_;
  auVar87._8_4_ = fVar247 * auVar129._8_4_;
  auVar87._12_4_ = fVar248 * auVar129._12_4_;
  auVar129 = vpminsd_avx(auVar270,auVar144);
  auVar179 = vpminsd_avx(auVar174,auVar114);
  auVar129 = vmaxps_avx(auVar129,auVar179);
  auVar179 = vpminsd_avx(auVar209,auVar87);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar278._4_4_ = uVar4;
  auVar278._0_4_ = uVar4;
  auVar278._8_4_ = uVar4;
  auVar278._12_4_ = uVar4;
  auVar179 = vmaxps_avx(auVar179,auVar278);
  auVar129 = vmaxps_avx(auVar129,auVar179);
  local_3f0._0_4_ = auVar129._0_4_ * 0.99999964;
  local_3f0._4_4_ = auVar129._4_4_ * 0.99999964;
  local_3f0._8_4_ = auVar129._8_4_ * 0.99999964;
  local_3f0._12_4_ = auVar129._12_4_ * 0.99999964;
  auVar129 = vpmaxsd_avx(auVar270,auVar144);
  auVar179 = vpmaxsd_avx(auVar174,auVar114);
  auVar129 = vminps_avx(auVar129,auVar179);
  auVar179 = vpmaxsd_avx(auVar209,auVar87);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar145._4_4_ = uVar4;
  auVar145._0_4_ = uVar4;
  auVar145._8_4_ = uVar4;
  auVar145._12_4_ = uVar4;
  auVar179 = vminps_avx(auVar179,auVar145);
  auVar129 = vminps_avx(auVar129,auVar179);
  auVar88._0_4_ = auVar129._0_4_ * 1.0000004;
  auVar88._4_4_ = auVar129._4_4_ * 1.0000004;
  auVar88._8_4_ = auVar129._8_4_ * 1.0000004;
  auVar88._12_4_ = auVar129._12_4_ * 1.0000004;
  auVar129 = vpshufd_avx(ZEXT116((byte)PVar7),0);
  auVar179 = vpcmpgtd_avx(auVar129,_DAT_01ff0cf0);
  auVar129 = vcmpps_avx(local_3f0,auVar88,2);
  auVar129 = vandps_avx(auVar129,auVar179);
  uVar75 = vmovmskps_avx(auVar129);
  local_711 = uVar75 != 0;
  if (uVar75 == 0) {
    return local_711;
  }
  uVar75 = uVar75 & 0xff;
  auVar106._16_16_ = mm_lookupmask_ps._240_16_;
  auVar106._0_16_ = mm_lookupmask_ps._240_16_;
  local_320 = vblendps_avx(auVar106,ZEXT832(0) << 0x20,0x80);
  uVar76 = 1 << ((byte)k & 0x1f);
  uVar78 = (ulong)((uVar76 & 0xf) << 4);
  lVar79 = (long)((int)uVar76 >> 4) * 0x10;
  auVar382 = ZEXT464(0) << 0x20;
LAB_0106418d:
  lVar80 = 0;
  if (uVar75 != 0) {
    for (; (uVar75 >> lVar80 & 1) == 0; lVar80 = lVar80 + 1) {
    }
  }
  uVar76 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar76].ptr;
  fVar142 = (pGVar8->time_range).lower;
  fVar207 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar142) / ((pGVar8->time_range).upper - fVar142));
  auVar129 = vroundss_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),9);
  auVar129 = vminss_avx(auVar129,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar244 = vmaxss_avx(ZEXT816(0) << 0x20,auVar129);
  uVar82 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)*(uint *)(prim + lVar80 * 4 + 6) *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar84 = (long)(int)auVar244._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + 0x10 + lVar84);
  pfVar2 = (float *)(*(long *)(_Var9 + lVar84) + lVar10 * uVar82);
  fVar228 = *pfVar2;
  fVar229 = pfVar2[1];
  fVar230 = pfVar2[2];
  fVar231 = pfVar2[3];
  lVar1 = uVar82 + 1;
  auVar129 = *(undefined1 (*) [16])(*(long *)(_Var9 + lVar84) + lVar10 * lVar1);
  p_Var11 = pGVar8[4].occlusionFilterN;
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar12 = *(long *)(lVar10 + 0x10 + lVar84);
  pfVar2 = (float *)(*(long *)(lVar10 + lVar84) + lVar12 * uVar82);
  fVar246 = *pfVar2;
  fVar247 = pfVar2[1];
  fVar248 = pfVar2[2];
  fVar141 = pfVar2[3];
  auVar179 = *(undefined1 (*) [16])(*(long *)(lVar10 + lVar84) + lVar12 * lVar1);
  _Var13 = pGVar8[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar2 = (float *)(*(long *)(p_Var11 + lVar84) + *(long *)(p_Var11 + lVar84 + 0x10) * uVar82);
  pfVar3 = (float *)(*(long *)(p_Var11 + lVar84) + *(long *)(p_Var11 + lVar84 + 0x10) * lVar1);
  auVar271._0_4_ = *pfVar3 * 0.33333334;
  auVar271._4_4_ = pfVar3[1] * 0.33333334;
  auVar271._8_4_ = pfVar3[2] * 0.33333334;
  auVar271._12_4_ = pfVar3[3] * 0.33333334;
  lVar12 = *(long *)(_Var13 + 0x10 + lVar84);
  pfVar3 = (float *)(*(long *)(_Var13 + lVar84) + lVar12 * uVar82);
  fVar207 = fVar207 - auVar244._0_4_;
  fVar319 = fVar228 + *pfVar2 * 0.33333334;
  fVar327 = fVar229 + pfVar2[1] * 0.33333334;
  fVar328 = fVar230 + pfVar2[2] * 0.33333334;
  fVar329 = fVar231 + pfVar2[3] * 0.33333334;
  auVar244 = vsubps_avx(auVar129,auVar271);
  fVar307 = *pfVar3 * 0.33333334 + fVar246;
  fVar316 = pfVar3[1] * 0.33333334 + fVar247;
  fVar317 = pfVar3[2] * 0.33333334 + fVar248;
  fVar318 = pfVar3[3] * 0.33333334 + fVar141;
  pfVar2 = (float *)(*(long *)(_Var13 + lVar84) + lVar12 * lVar1);
  auVar89._0_4_ = *pfVar2 * 0.33333334;
  auVar89._4_4_ = pfVar2[1] * 0.33333334;
  auVar89._8_4_ = pfVar2[2] * 0.33333334;
  auVar89._12_4_ = pfVar2[3] * 0.33333334;
  auVar280 = vsubps_avx(auVar179,auVar89);
  fVar142 = auVar129._0_4_;
  fVar170 = auVar129._4_4_;
  fVar172 = auVar129._8_4_;
  fVar385 = auVar382._8_4_;
  fVar205 = auVar129._12_4_;
  fVar387 = auVar382._12_4_;
  fVar330 = auVar244._0_4_ * 0.0;
  fVar336 = auVar244._4_4_ * 0.0;
  fVar338 = fVar385 * auVar244._8_4_;
  fVar340 = fVar387 * auVar244._12_4_;
  fVar362 = fVar330 + fVar142 * 0.0;
  fVar370 = fVar336 + fVar170 * 0.0;
  fVar372 = fVar338 + fVar385 * fVar172;
  fVar374 = fVar340 + fVar387 * fVar205;
  auVar90._0_4_ = fVar362 + fVar319 * 3.0;
  auVar90._4_4_ = fVar370 + fVar327 * 3.0;
  auVar90._8_4_ = fVar372 + fVar328 * 3.0;
  auVar90._12_4_ = fVar374 + fVar329 * 3.0;
  auVar115._0_4_ = fVar228 * 3.0;
  auVar115._4_4_ = fVar229 * 3.0;
  auVar115._8_4_ = fVar230 * 3.0;
  auVar115._12_4_ = fVar231 * 3.0;
  auVar128 = vsubps_avx(auVar90,auVar115);
  fVar169 = auVar179._0_4_;
  fVar171 = auVar179._4_4_;
  fVar204 = auVar179._8_4_;
  fVar206 = auVar179._12_4_;
  fVar349 = auVar280._0_4_ * 0.0;
  fVar357 = auVar280._4_4_ * 0.0;
  fVar358 = fVar385 * auVar280._8_4_;
  fVar359 = fVar387 * auVar280._12_4_;
  fVar375 = fVar349 + fVar169 * 0.0;
  fVar383 = fVar357 + fVar171 * 0.0;
  fVar385 = fVar358 + fVar385 * fVar204;
  fVar387 = fVar359 + fVar387 * fVar206;
  auVar91._0_4_ = fVar375 + fVar307 * 3.0;
  auVar91._4_4_ = fVar383 + fVar316 * 3.0;
  auVar91._8_4_ = fVar385 + fVar317 * 3.0;
  auVar91._12_4_ = fVar387 + fVar318 * 3.0;
  auVar279._0_4_ = fVar246 * 3.0;
  auVar279._4_4_ = fVar247 * 3.0;
  auVar279._8_4_ = fVar248 * 3.0;
  auVar279._12_4_ = fVar141 * 3.0;
  auVar15 = vsubps_avx(auVar91,auVar279);
  lVar12 = *(long *)(_Var9 + 0x38 + lVar84);
  lVar14 = *(long *)(_Var9 + 0x48 + lVar84);
  auVar86 = *(undefined1 (*) [16])(lVar12 + lVar14 * uVar82);
  fVar319 = fVar319 * 0.0;
  fVar327 = fVar327 * 0.0;
  fVar328 = fVar328 * 0.0;
  fVar329 = fVar329 * 0.0;
  auVar321._0_4_ = fVar362 + fVar319 + fVar228;
  auVar321._4_4_ = fVar370 + fVar327 + fVar229;
  auVar321._8_4_ = fVar372 + fVar328 + fVar230;
  auVar321._12_4_ = fVar374 + fVar329 + fVar231;
  fVar307 = fVar307 * 0.0;
  fVar316 = fVar316 * 0.0;
  fVar317 = fVar317 * 0.0;
  fVar318 = fVar318 * 0.0;
  auVar377._0_4_ = fVar307 + fVar375 + fVar246;
  auVar377._4_4_ = fVar316 + fVar383 + fVar247;
  auVar377._8_4_ = fVar317 + fVar385 + fVar248;
  auVar377._12_4_ = fVar318 + fVar387 + fVar141;
  auVar146._0_4_ = fVar228 * 0.0;
  auVar146._4_4_ = fVar229 * 0.0;
  auVar146._8_4_ = fVar230 * 0.0;
  auVar146._12_4_ = fVar231 * 0.0;
  auVar309._0_4_ = fVar330 + fVar142 + fVar319 + auVar146._0_4_;
  auVar309._4_4_ = fVar336 + fVar170 + fVar327 + auVar146._4_4_;
  auVar309._8_4_ = fVar338 + fVar172 + fVar328 + auVar146._8_4_;
  auVar309._12_4_ = fVar340 + fVar205 + fVar329 + auVar146._12_4_;
  auVar175._0_4_ = fVar142 * 3.0;
  auVar175._4_4_ = fVar170 * 3.0;
  auVar175._8_4_ = fVar172 * 3.0;
  auVar175._12_4_ = fVar205 * 3.0;
  auVar272._0_4_ = auVar244._0_4_ * 3.0;
  auVar272._4_4_ = auVar244._4_4_ * 3.0;
  auVar272._8_4_ = auVar244._8_4_ * 3.0;
  auVar272._12_4_ = auVar244._12_4_ * 3.0;
  auVar129 = vsubps_avx(auVar175,auVar272);
  auVar92._0_4_ = fVar319 + auVar129._0_4_;
  auVar92._4_4_ = fVar327 + auVar129._4_4_;
  auVar92._8_4_ = fVar328 + auVar129._8_4_;
  auVar92._12_4_ = fVar329 + auVar129._12_4_;
  auVar195 = vsubps_avx(auVar92,auVar146);
  auVar147._0_4_ = fVar246 * 0.0;
  auVar147._4_4_ = fVar247 * 0.0;
  auVar147._8_4_ = fVar248 * 0.0;
  auVar147._12_4_ = fVar141 * 0.0;
  auVar93._0_4_ = auVar147._0_4_ + fVar307 + fVar349 + fVar169;
  auVar93._4_4_ = auVar147._4_4_ + fVar316 + fVar357 + fVar171;
  auVar93._8_4_ = auVar147._8_4_ + fVar317 + fVar358 + fVar204;
  auVar93._12_4_ = auVar147._12_4_ + fVar318 + fVar359 + fVar206;
  auVar176._0_4_ = fVar169 * 3.0;
  auVar176._4_4_ = fVar171 * 3.0;
  auVar176._8_4_ = fVar204 * 3.0;
  auVar176._12_4_ = fVar206 * 3.0;
  auVar210._0_4_ = auVar280._0_4_ * 3.0;
  auVar210._4_4_ = auVar280._4_4_ * 3.0;
  auVar210._8_4_ = auVar280._8_4_ * 3.0;
  auVar210._12_4_ = auVar280._12_4_ * 3.0;
  auVar129 = vsubps_avx(auVar176,auVar210);
  auVar177._0_4_ = fVar307 + auVar129._0_4_;
  auVar177._4_4_ = fVar316 + auVar129._4_4_;
  auVar177._8_4_ = fVar317 + auVar129._8_4_;
  auVar177._12_4_ = fVar318 + auVar129._12_4_;
  auVar196 = vsubps_avx(auVar177,auVar147);
  auVar129 = vshufps_avx(auVar128,auVar128,0xc9);
  auVar179 = vshufps_avx(auVar377,auVar377,0xc9);
  fVar228 = auVar128._0_4_;
  auVar211._0_4_ = fVar228 * auVar179._0_4_;
  fVar230 = auVar128._4_4_;
  auVar211._4_4_ = fVar230 * auVar179._4_4_;
  fVar247 = auVar128._8_4_;
  auVar211._8_4_ = fVar247 * auVar179._8_4_;
  fVar248 = auVar128._12_4_;
  auVar211._12_4_ = fVar248 * auVar179._12_4_;
  auVar233._0_4_ = auVar377._0_4_ * auVar129._0_4_;
  auVar233._4_4_ = auVar377._4_4_ * auVar129._4_4_;
  auVar233._8_4_ = auVar377._8_4_ * auVar129._8_4_;
  auVar233._12_4_ = auVar377._12_4_ * auVar129._12_4_;
  auVar179 = vsubps_avx(auVar233,auVar211);
  auVar244 = vshufps_avx(auVar179,auVar179,0xc9);
  auVar179 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar212._0_4_ = fVar228 * auVar179._0_4_;
  auVar212._4_4_ = fVar230 * auVar179._4_4_;
  auVar212._8_4_ = fVar247 * auVar179._8_4_;
  auVar212._12_4_ = fVar248 * auVar179._12_4_;
  auVar148._0_4_ = auVar15._0_4_ * auVar129._0_4_;
  auVar148._4_4_ = auVar15._4_4_ * auVar129._4_4_;
  auVar148._8_4_ = auVar15._8_4_ * auVar129._8_4_;
  auVar148._12_4_ = auVar15._12_4_ * auVar129._12_4_;
  auVar129 = vsubps_avx(auVar148,auVar212);
  auVar280 = vshufps_avx(auVar129,auVar129,0xc9);
  auVar179 = vshufps_avx(auVar195,auVar195,0xc9);
  auVar129 = vshufps_avx(auVar93,auVar93,0xc9);
  fVar362 = auVar195._0_4_;
  auVar149._0_4_ = fVar362 * auVar129._0_4_;
  fVar370 = auVar195._4_4_;
  auVar149._4_4_ = fVar370 * auVar129._4_4_;
  fVar372 = auVar195._8_4_;
  auVar149._8_4_ = fVar372 * auVar129._8_4_;
  fVar374 = auVar195._12_4_;
  auVar149._12_4_ = fVar374 * auVar129._12_4_;
  auVar94._0_4_ = auVar179._0_4_ * auVar93._0_4_;
  auVar94._4_4_ = auVar179._4_4_ * auVar93._4_4_;
  auVar94._8_4_ = auVar179._8_4_ * auVar93._8_4_;
  auVar94._12_4_ = auVar179._12_4_ * auVar93._12_4_;
  auVar129 = vsubps_avx(auVar94,auVar149);
  auVar15 = vshufps_avx(auVar129,auVar129,0xc9);
  auVar155 = vshufps_avx(auVar196,auVar196,0xc9);
  auVar129 = vdpps_avx(auVar244,auVar244,0x7f);
  auVar95._0_4_ = fVar362 * auVar155._0_4_;
  auVar95._4_4_ = fVar370 * auVar155._4_4_;
  auVar95._8_4_ = fVar372 * auVar155._8_4_;
  auVar95._12_4_ = fVar374 * auVar155._12_4_;
  auVar178._0_4_ = auVar179._0_4_ * auVar196._0_4_;
  auVar178._4_4_ = auVar179._4_4_ * auVar196._4_4_;
  auVar178._8_4_ = auVar179._8_4_ * auVar196._8_4_;
  auVar178._12_4_ = auVar179._12_4_ * auVar196._12_4_;
  auVar196 = vsubps_avx(auVar178,auVar95);
  fVar169 = auVar129._0_4_;
  auVar158 = ZEXT416((uint)fVar169);
  auVar179 = vrsqrtss_avx(auVar158,auVar158);
  fVar142 = auVar179._0_4_;
  auVar179 = ZEXT416((uint)(fVar142 * 1.5 - fVar169 * 0.5 * fVar142 * fVar142 * fVar142));
  auVar155 = vshufps_avx(auVar179,auVar179,0);
  auVar179 = vdpps_avx(auVar244,auVar280,0x7f);
  fVar172 = auVar155._0_4_ * auVar244._0_4_;
  fVar204 = auVar155._4_4_ * auVar244._4_4_;
  fVar205 = auVar155._8_4_ * auVar244._8_4_;
  fVar206 = auVar155._12_4_ * auVar244._12_4_;
  auVar129 = vshufps_avx(auVar129,auVar129,0);
  auVar252._0_4_ = auVar129._0_4_ * auVar280._0_4_;
  auVar252._4_4_ = auVar129._4_4_ * auVar280._4_4_;
  auVar252._8_4_ = auVar129._8_4_ * auVar280._8_4_;
  auVar252._12_4_ = auVar129._12_4_ * auVar280._12_4_;
  auVar129 = vshufps_avx(auVar179,auVar179,0);
  auVar234._0_4_ = auVar129._0_4_ * auVar244._0_4_;
  auVar234._4_4_ = auVar129._4_4_ * auVar244._4_4_;
  auVar234._8_4_ = auVar129._8_4_ * auVar244._8_4_;
  auVar234._12_4_ = auVar129._12_4_ * auVar244._12_4_;
  auVar103 = vsubps_avx(auVar252,auVar234);
  auVar129 = vrcpss_avx(auVar158,auVar158);
  auVar129 = ZEXT416((uint)(auVar129._0_4_ * (2.0 - fVar169 * auVar129._0_4_)));
  auVar244 = vshufps_avx(auVar129,auVar129,0);
  auVar179 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar229 = auVar179._0_4_;
  auVar273 = ZEXT416((uint)fVar229);
  auVar129 = vrsqrtss_avx(auVar273,auVar273);
  fVar142 = auVar129._0_4_;
  auVar129 = *(undefined1 (*) [16])(lVar12 + lVar14 * lVar1);
  pfVar2 = (float *)(*(long *)(p_Var11 + lVar84 + 0x38) +
                    *(long *)(p_Var11 + lVar84 + 0x48) * uVar82);
  auVar280 = vshufps_avx(auVar196,auVar196,0xc9);
  auVar179 = vshufps_avx(auVar179,auVar179,0);
  auVar364._0_4_ = auVar179._0_4_ * auVar280._0_4_;
  auVar364._4_4_ = auVar179._4_4_ * auVar280._4_4_;
  auVar364._8_4_ = auVar179._8_4_ * auVar280._8_4_;
  auVar364._12_4_ = auVar179._12_4_ * auVar280._12_4_;
  auVar179 = vdpps_avx(auVar15,auVar280,0x7f);
  auVar280 = ZEXT416((uint)(fVar142 * 1.5 - fVar142 * fVar142 * fVar142 * fVar229 * 0.5));
  auVar280 = vshufps_avx(auVar280,auVar280,0);
  auVar179 = vshufps_avx(auVar179,auVar179,0);
  auVar213._0_4_ = auVar179._0_4_ * auVar15._0_4_;
  auVar213._4_4_ = auVar179._4_4_ * auVar15._4_4_;
  auVar213._8_4_ = auVar179._8_4_ * auVar15._8_4_;
  auVar213._12_4_ = auVar179._12_4_ * auVar15._12_4_;
  fVar142 = auVar280._0_4_ * auVar15._0_4_;
  fVar169 = auVar280._4_4_ * auVar15._4_4_;
  fVar170 = auVar280._8_4_ * auVar15._8_4_;
  fVar171 = auVar280._12_4_ * auVar15._12_4_;
  auVar158 = vsubps_avx(auVar364,auVar213);
  auVar179 = vrcpss_avx(auVar273,auVar273);
  auVar179 = ZEXT416((uint)(auVar179._0_4_ * (2.0 - fVar229 * auVar179._0_4_)));
  auVar179 = vshufps_avx(auVar179,auVar179,0);
  auVar15 = vshufps_avx(auVar321,auVar321,0xff);
  auVar365._0_4_ = auVar15._0_4_ * fVar172;
  auVar365._4_4_ = auVar15._4_4_ * fVar204;
  auVar365._8_4_ = auVar15._8_4_ * fVar205;
  auVar365._12_4_ = auVar15._12_4_ * fVar206;
  auVar273 = vsubps_avx(auVar321,auVar365);
  auVar196 = vshufps_avx(auVar128,auVar128,0xff);
  auVar180._0_4_ =
       auVar196._0_4_ * fVar172 + auVar15._0_4_ * auVar155._0_4_ * auVar244._0_4_ * auVar103._0_4_;
  auVar180._4_4_ =
       auVar196._4_4_ * fVar204 + auVar15._4_4_ * auVar155._4_4_ * auVar244._4_4_ * auVar103._4_4_;
  auVar180._8_4_ =
       auVar196._8_4_ * fVar205 + auVar15._8_4_ * auVar155._8_4_ * auVar244._8_4_ * auVar103._8_4_;
  auVar180._12_4_ =
       auVar196._12_4_ * fVar206 +
       auVar15._12_4_ * auVar155._12_4_ * auVar244._12_4_ * auVar103._12_4_;
  auVar196 = vsubps_avx(auVar128,auVar180);
  auVar244 = vshufps_avx(auVar309,auVar309,0xff);
  auVar235._0_4_ = auVar244._0_4_ * fVar142;
  auVar235._4_4_ = auVar244._4_4_ * fVar169;
  auVar235._8_4_ = auVar244._8_4_ * fVar170;
  auVar235._12_4_ = auVar244._12_4_ * fVar171;
  auVar128 = vsubps_avx(auVar309,auVar235);
  auVar15 = vshufps_avx(auVar195,auVar195,0xff);
  auVar116._0_4_ =
       auVar15._0_4_ * fVar142 + auVar244._0_4_ * auVar280._0_4_ * auVar158._0_4_ * auVar179._0_4_;
  auVar116._4_4_ =
       auVar15._4_4_ * fVar169 + auVar244._4_4_ * auVar280._4_4_ * auVar158._4_4_ * auVar179._4_4_;
  auVar116._8_4_ =
       auVar15._8_4_ * fVar170 + auVar244._8_4_ * auVar280._8_4_ * auVar158._8_4_ * auVar179._8_4_;
  auVar116._12_4_ =
       auVar15._12_4_ * fVar171 +
       auVar244._12_4_ * auVar280._12_4_ * auVar158._12_4_ * auVar179._12_4_;
  auVar195 = vsubps_avx(auVar195,auVar116);
  local_5d0._4_4_ = auVar309._4_4_ + auVar235._4_4_;
  local_5d0._0_4_ = auVar309._0_4_ + auVar235._0_4_;
  fStack_5c8 = auVar309._8_4_ + auVar235._8_4_;
  fStack_5c4 = auVar309._12_4_ + auVar235._12_4_;
  local_6a0._0_4_ = auVar86._0_4_;
  local_6a0._4_4_ = auVar86._4_4_;
  fStack_698 = auVar86._8_4_;
  fStack_694 = auVar86._12_4_;
  fVar349 = (float)local_6a0._0_4_ + *pfVar2 * 0.33333334;
  fVar357 = (float)local_6a0._4_4_ + pfVar2[1] * 0.33333334;
  fVar358 = fStack_698 + pfVar2[2] * 0.33333334;
  fVar359 = fStack_694 + pfVar2[3] * 0.33333334;
  pfVar2 = (float *)(*(long *)(p_Var11 + lVar84 + 0x38) + *(long *)(p_Var11 + lVar84 + 0x48) * lVar1
                    );
  auVar96._0_4_ = *pfVar2 * 0.33333334;
  auVar96._4_4_ = pfVar2[1] * 0.33333334;
  auVar96._8_4_ = pfVar2[2] * 0.33333334;
  auVar96._12_4_ = pfVar2[3] * 0.33333334;
  auVar179 = vsubps_avx(auVar129,auVar96);
  fVar375 = auVar129._0_4_;
  fVar383 = auVar129._4_4_;
  fVar385 = auVar129._8_4_;
  fVar387 = auVar129._12_4_;
  fVar330 = auVar179._0_4_ * 0.0;
  fVar336 = auVar179._4_4_ * 0.0;
  fVar338 = auVar179._8_4_ * 0.0;
  fVar340 = auVar179._12_4_ * 0.0;
  fVar376 = fVar375 * 0.0 + fVar330;
  fVar384 = fVar383 * 0.0 + fVar336;
  fVar386 = fVar385 * 0.0 + fVar338;
  fVar388 = fVar387 * 0.0 + fVar340;
  auVar117._0_4_ = fVar376 + fVar349 * 3.0;
  auVar117._4_4_ = fVar384 + fVar357 * 3.0;
  auVar117._8_4_ = fVar386 + fVar358 * 3.0;
  auVar117._12_4_ = fVar388 + fVar359 * 3.0;
  auVar150._0_4_ = (float)local_6a0._0_4_ * 3.0;
  auVar150._4_4_ = (float)local_6a0._4_4_ * 3.0;
  auVar150._8_4_ = fStack_698 * 3.0;
  auVar150._12_4_ = fStack_694 * 3.0;
  auVar103 = vsubps_avx(auVar117,auVar150);
  lVar12 = *(long *)(lVar10 + 0x38 + lVar84);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar84);
  lVar14 = *(long *)(_Var13 + 0x38 + lVar84);
  lVar84 = *(long *)(_Var13 + 0x48 + lVar84);
  pfVar2 = (float *)(lVar12 + lVar10 * uVar82);
  fVar142 = *pfVar2;
  fVar169 = pfVar2[1];
  fVar170 = pfVar2[2];
  fVar171 = pfVar2[3];
  pfVar2 = (float *)(lVar14 + uVar82 * lVar84);
  fVar307 = fVar142 + *pfVar2 * 0.33333334;
  fVar316 = fVar169 + pfVar2[1] * 0.33333334;
  fVar317 = fVar170 + pfVar2[2] * 0.33333334;
  fVar318 = fVar171 + pfVar2[3] * 0.33333334;
  auVar129 = *(undefined1 (*) [16])(lVar12 + lVar10 * lVar1);
  pfVar2 = (float *)(lVar14 + lVar84 * lVar1);
  auVar151._0_4_ = *pfVar2 * 0.33333334;
  auVar151._4_4_ = pfVar2[1] * 0.33333334;
  auVar151._8_4_ = pfVar2[2] * 0.33333334;
  auVar151._12_4_ = pfVar2[3] * 0.33333334;
  auVar244 = vsubps_avx(auVar129,auVar151);
  fVar172 = auVar129._0_4_;
  fVar204 = auVar129._4_4_;
  fVar205 = auVar129._8_4_;
  fVar206 = auVar129._12_4_;
  fVar229 = auVar244._0_4_ * 0.0;
  fVar231 = auVar244._4_4_ * 0.0;
  fVar246 = auVar244._8_4_ * 0.0;
  fVar141 = auVar244._12_4_ * 0.0;
  fVar319 = fVar172 * 0.0 + fVar229;
  fVar327 = fVar204 * 0.0 + fVar231;
  fVar328 = fVar205 * 0.0 + fVar246;
  fVar329 = fVar206 * 0.0 + fVar141;
  auVar253._0_4_ = fVar307 * 3.0 + fVar319;
  auVar253._4_4_ = fVar316 * 3.0 + fVar327;
  auVar253._8_4_ = fVar317 * 3.0 + fVar328;
  auVar253._12_4_ = fVar318 * 3.0 + fVar329;
  auVar281._0_4_ = fVar142 * 3.0;
  auVar281._4_4_ = fVar169 * 3.0;
  auVar281._8_4_ = fVar170 * 3.0;
  auVar281._12_4_ = fVar171 * 3.0;
  auVar280 = vsubps_avx(auVar253,auVar281);
  auVar282._0_4_ = fVar375 * 3.0;
  auVar282._4_4_ = fVar383 * 3.0;
  auVar282._8_4_ = fVar385 * 3.0;
  auVar282._12_4_ = fVar387 * 3.0;
  auVar333._0_4_ = auVar179._0_4_ * 3.0;
  auVar333._4_4_ = auVar179._4_4_ * 3.0;
  auVar333._8_4_ = auVar179._8_4_ * 3.0;
  auVar333._12_4_ = auVar179._12_4_ * 3.0;
  auVar129 = vsubps_avx(auVar282,auVar333);
  fVar349 = fVar349 * 0.0;
  fVar357 = fVar357 * 0.0;
  fVar358 = fVar358 * 0.0;
  fVar359 = fVar359 * 0.0;
  auVar283._0_4_ = fVar349 + auVar129._0_4_;
  auVar283._4_4_ = fVar357 + auVar129._4_4_;
  auVar283._8_4_ = fVar358 + auVar129._8_4_;
  auVar283._12_4_ = fVar359 + auVar129._12_4_;
  auVar334._0_4_ = (float)local_6a0._0_4_ + fVar349 + fVar376;
  auVar334._4_4_ = (float)local_6a0._4_4_ + fVar357 + fVar384;
  auVar334._8_4_ = fStack_698 + fVar358 + fVar386;
  auVar334._12_4_ = fStack_694 + fVar359 + fVar388;
  auVar296._0_4_ = (float)local_6a0._0_4_ * 0.0;
  auVar296._4_4_ = (float)local_6a0._4_4_ * 0.0;
  auVar296._8_4_ = fStack_698 * 0.0;
  auVar296._12_4_ = fStack_694 * 0.0;
  local_6a0._0_4_ = auVar296._0_4_ + fVar349 + fVar375 + fVar330;
  local_6a0._4_4_ = auVar296._4_4_ + fVar357 + fVar383 + fVar336;
  fStack_698 = auVar296._8_4_ + fVar358 + fVar385 + fVar338;
  fStack_694 = auVar296._12_4_ + fVar359 + fVar387 + fVar340;
  auVar158 = vsubps_avx(auVar283,auVar296);
  auVar97._0_4_ = fVar172 * 3.0;
  auVar97._4_4_ = fVar204 * 3.0;
  auVar97._8_4_ = fVar205 * 3.0;
  auVar97._12_4_ = fVar206 * 3.0;
  auVar181._0_4_ = auVar244._0_4_ * 3.0;
  auVar181._4_4_ = auVar244._4_4_ * 3.0;
  auVar181._8_4_ = auVar244._8_4_ * 3.0;
  auVar181._12_4_ = auVar244._12_4_ * 3.0;
  auVar129 = vsubps_avx(auVar97,auVar181);
  fVar307 = fVar307 * 0.0;
  fVar316 = fVar316 * 0.0;
  fVar317 = fVar317 * 0.0;
  fVar318 = fVar318 * 0.0;
  auVar98._0_4_ = fVar307 + auVar129._0_4_;
  auVar98._4_4_ = fVar316 + auVar129._4_4_;
  auVar98._8_4_ = fVar317 + auVar129._8_4_;
  auVar98._12_4_ = fVar318 + auVar129._12_4_;
  auVar152._0_4_ = fVar142 + fVar307 + fVar319;
  auVar152._4_4_ = fVar169 + fVar316 + fVar327;
  auVar152._8_4_ = fVar170 + fVar317 + fVar328;
  auVar152._12_4_ = fVar171 + fVar318 + fVar329;
  auVar182._0_4_ = fVar142 * 0.0;
  auVar182._4_4_ = fVar169 * 0.0;
  auVar182._8_4_ = fVar170 * 0.0;
  auVar182._12_4_ = fVar171 * 0.0;
  auVar118._0_4_ = auVar182._0_4_ + fVar307 + fVar172 + fVar229;
  auVar118._4_4_ = auVar182._4_4_ + fVar316 + fVar204 + fVar231;
  auVar118._8_4_ = auVar182._8_4_ + fVar317 + fVar205 + fVar246;
  auVar118._12_4_ = auVar182._12_4_ + fVar318 + fVar206 + fVar141;
  auVar179 = vsubps_avx(auVar98,auVar182);
  auVar129 = vshufps_avx(auVar152,auVar152,0xc9);
  fVar328 = auVar103._0_4_;
  auVar183._0_4_ = fVar328 * auVar129._0_4_;
  fVar307 = auVar103._4_4_;
  auVar183._4_4_ = fVar307 * auVar129._4_4_;
  fVar316 = auVar103._8_4_;
  auVar183._8_4_ = fVar316 * auVar129._8_4_;
  fVar317 = auVar103._12_4_;
  auVar183._12_4_ = fVar317 * auVar129._12_4_;
  auVar129 = vshufps_avx(auVar103,auVar103,0xc9);
  auVar153._0_4_ = auVar129._0_4_ * auVar152._0_4_;
  auVar153._4_4_ = auVar129._4_4_ * auVar152._4_4_;
  auVar153._8_4_ = auVar129._8_4_ * auVar152._8_4_;
  auVar153._12_4_ = auVar129._12_4_ * auVar152._12_4_;
  auVar244 = vsubps_avx(auVar153,auVar183);
  auVar184._0_4_ = auVar129._0_4_ * auVar280._0_4_;
  auVar184._4_4_ = auVar129._4_4_ * auVar280._4_4_;
  auVar184._8_4_ = auVar129._8_4_ * auVar280._8_4_;
  auVar184._12_4_ = auVar129._12_4_ * auVar280._12_4_;
  auVar129 = vshufps_avx(auVar280,auVar280,0xc9);
  auVar214._0_4_ = fVar328 * auVar129._0_4_;
  auVar214._4_4_ = fVar307 * auVar129._4_4_;
  auVar214._8_4_ = fVar316 * auVar129._8_4_;
  auVar214._12_4_ = fVar317 * auVar129._12_4_;
  auVar280 = vsubps_avx(auVar184,auVar214);
  auVar129 = vshufps_avx(auVar118,auVar118,0xc9);
  fVar229 = auVar158._0_4_;
  auVar215._0_4_ = fVar229 * auVar129._0_4_;
  fVar246 = auVar158._4_4_;
  auVar215._4_4_ = fVar246 * auVar129._4_4_;
  fVar319 = auVar158._8_4_;
  auVar215._8_4_ = fVar319 * auVar129._8_4_;
  fVar327 = auVar158._12_4_;
  auVar215._12_4_ = fVar327 * auVar129._12_4_;
  auVar129 = vshufps_avx(auVar158,auVar158,0xc9);
  auVar119._0_4_ = auVar129._0_4_ * auVar118._0_4_;
  auVar119._4_4_ = auVar129._4_4_ * auVar118._4_4_;
  auVar119._8_4_ = auVar129._8_4_ * auVar118._8_4_;
  auVar119._12_4_ = auVar129._12_4_ * auVar118._12_4_;
  auVar15 = vsubps_avx(auVar119,auVar215);
  auVar244 = vshufps_avx(auVar244,auVar244,0xc9);
  auVar154._0_4_ = auVar129._0_4_ * auVar179._0_4_;
  auVar154._4_4_ = auVar129._4_4_ * auVar179._4_4_;
  auVar154._8_4_ = auVar129._8_4_ * auVar179._8_4_;
  auVar154._12_4_ = auVar129._12_4_ * auVar179._12_4_;
  auVar129 = vdpps_avx(auVar244,auVar244,0x7f);
  auVar179 = vshufps_avx(auVar179,auVar179,0xc9);
  auVar99._0_4_ = fVar229 * auVar179._0_4_;
  auVar99._4_4_ = fVar246 * auVar179._4_4_;
  auVar99._8_4_ = fVar319 * auVar179._8_4_;
  auVar99._12_4_ = fVar327 * auVar179._12_4_;
  auVar86 = vsubps_avx(auVar154,auVar99);
  fVar142 = auVar129._0_4_;
  auVar155 = ZEXT416((uint)fVar142);
  auVar179 = vrsqrtss_avx(auVar155,auVar155);
  fVar169 = auVar179._0_4_;
  auVar280 = vshufps_avx(auVar280,auVar280,0xc9);
  auVar179 = vdpps_avx(auVar244,auVar280,0x7f);
  auVar129 = vshufps_avx(auVar129,auVar129,0);
  auVar185._0_4_ = auVar129._0_4_ * auVar280._0_4_;
  auVar185._4_4_ = auVar129._4_4_ * auVar280._4_4_;
  auVar185._8_4_ = auVar129._8_4_ * auVar280._8_4_;
  auVar185._12_4_ = auVar129._12_4_ * auVar280._12_4_;
  auVar129 = vshufps_avx(auVar179,auVar179,0);
  auVar254._0_4_ = auVar244._0_4_ * auVar129._0_4_;
  auVar254._4_4_ = auVar244._4_4_ * auVar129._4_4_;
  auVar254._8_4_ = auVar244._8_4_ * auVar129._8_4_;
  auVar254._12_4_ = auVar244._12_4_ * auVar129._12_4_;
  auVar87 = vsubps_avx(auVar185,auVar254);
  auVar129 = vrcpss_avx(auVar155,auVar155);
  auVar129 = ZEXT416((uint)(auVar129._0_4_ * (2.0 - fVar142 * auVar129._0_4_)));
  auVar280 = vshufps_avx(auVar129,auVar129,0);
  auVar15 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar129 = vdpps_avx(auVar15,auVar15,0x7f);
  auVar179 = ZEXT416((uint)(fVar169 * 1.5 - fVar169 * fVar169 * fVar142 * 0.5 * fVar169));
  auVar155 = vshufps_avx(auVar179,auVar179,0);
  fVar142 = auVar244._0_4_ * auVar155._0_4_;
  fVar169 = auVar244._4_4_ * auVar155._4_4_;
  fVar170 = auVar244._8_4_ * auVar155._8_4_;
  fVar171 = auVar244._12_4_ * auVar155._12_4_;
  fVar172 = auVar129._0_4_;
  auVar88 = ZEXT416((uint)fVar172);
  auVar179 = vrsqrtss_avx(auVar88,auVar88);
  fVar204 = auVar179._0_4_;
  auVar244 = vshufps_avx(auVar86,auVar86,0xc9);
  auVar179 = vdpps_avx(auVar15,auVar244,0x7f);
  auVar129 = vshufps_avx(auVar129,auVar129,0);
  auVar100._0_4_ = auVar129._0_4_ * auVar244._0_4_;
  auVar100._4_4_ = auVar129._4_4_ * auVar244._4_4_;
  auVar100._8_4_ = auVar129._8_4_ * auVar244._8_4_;
  auVar100._12_4_ = auVar129._12_4_ * auVar244._12_4_;
  auVar129 = vshufps_avx(auVar179,auVar179,0);
  auVar255._0_4_ = auVar129._0_4_ * auVar15._0_4_;
  auVar255._4_4_ = auVar129._4_4_ * auVar15._4_4_;
  auVar255._8_4_ = auVar129._8_4_ * auVar15._8_4_;
  auVar255._12_4_ = auVar129._12_4_ * auVar15._12_4_;
  auVar86 = vsubps_avx(auVar100,auVar255);
  auVar129 = vrcpss_avx(auVar88,auVar88);
  auVar129 = ZEXT416((uint)(auVar129._0_4_ * (2.0 - fVar172 * auVar129._0_4_)));
  auVar129 = vshufps_avx(auVar129,auVar129,0);
  auVar179 = ZEXT416((uint)(fVar204 * 1.5 - fVar204 * fVar204 * fVar172 * 0.5 * fVar204));
  auVar179 = vshufps_avx(auVar179,auVar179,0);
  fVar172 = auVar15._0_4_ * auVar179._0_4_;
  fVar204 = auVar15._4_4_ * auVar179._4_4_;
  fVar205 = auVar15._8_4_ * auVar179._8_4_;
  fVar206 = auVar15._12_4_ * auVar179._12_4_;
  auVar244 = vshufps_avx(auVar103,auVar103,0xff);
  auVar15 = vshufps_avx(auVar334,auVar334,0xff);
  auVar120._0_4_ = auVar15._0_4_ * fVar142;
  auVar120._4_4_ = auVar15._4_4_ * fVar169;
  auVar120._8_4_ = auVar15._8_4_ * fVar170;
  auVar120._12_4_ = auVar15._12_4_ * fVar171;
  auVar156._0_4_ =
       auVar244._0_4_ * fVar142 + auVar155._0_4_ * auVar280._0_4_ * auVar87._0_4_ * auVar15._0_4_;
  auVar156._4_4_ =
       auVar244._4_4_ * fVar169 + auVar155._4_4_ * auVar280._4_4_ * auVar87._4_4_ * auVar15._4_4_;
  auVar156._8_4_ =
       auVar244._8_4_ * fVar170 + auVar155._8_4_ * auVar280._8_4_ * auVar87._8_4_ * auVar15._8_4_;
  auVar156._12_4_ =
       auVar244._12_4_ * fVar171 +
       auVar155._12_4_ * auVar280._12_4_ * auVar87._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar334,auVar120);
  auVar155 = vsubps_avx(auVar103,auVar156);
  auVar244 = vshufps_avx(auVar158,auVar158,0xff);
  auVar280 = vshufps_avx(_local_6a0,_local_6a0,0xff);
  auVar186._0_4_ = auVar280._0_4_ * fVar172;
  auVar186._4_4_ = auVar280._4_4_ * fVar204;
  auVar186._8_4_ = auVar280._8_4_ * fVar205;
  auVar186._12_4_ = auVar280._12_4_ * fVar206;
  auVar121._0_4_ =
       auVar244._0_4_ * fVar172 + auVar280._0_4_ * auVar179._0_4_ * auVar86._0_4_ * auVar129._0_4_;
  auVar121._4_4_ =
       auVar244._4_4_ * fVar204 + auVar280._4_4_ * auVar179._4_4_ * auVar86._4_4_ * auVar129._4_4_;
  auVar121._8_4_ =
       auVar244._8_4_ * fVar205 + auVar280._8_4_ * auVar179._8_4_ * auVar86._8_4_ * auVar129._8_4_;
  auVar121._12_4_ =
       auVar244._12_4_ * fVar206 +
       auVar280._12_4_ * auVar179._12_4_ * auVar86._12_4_ * auVar129._12_4_;
  auVar244 = vsubps_avx(_local_6a0,auVar186);
  auVar351._0_4_ = (float)local_6a0._0_4_ + auVar186._0_4_;
  auVar351._4_4_ = (float)local_6a0._4_4_ + auVar186._4_4_;
  auVar351._8_4_ = fStack_698 + auVar186._8_4_;
  auVar351._12_4_ = fStack_694 + auVar186._12_4_;
  auVar280 = vsubps_avx(auVar158,auVar121);
  local_640 = auVar196._0_4_;
  fStack_63c = auVar196._4_4_;
  fStack_638 = auVar196._8_4_;
  fStack_634 = auVar196._12_4_;
  local_680 = auVar273._0_4_;
  fStack_67c = auVar273._4_4_;
  fStack_678 = auVar273._8_4_;
  fStack_674 = auVar273._12_4_;
  auVar129 = vshufps_avx(ZEXT416((uint)fVar207),ZEXT416((uint)fVar207),0);
  auVar179 = vshufps_avx(ZEXT416((uint)(1.0 - fVar207)),ZEXT416((uint)(1.0 - fVar207)),0);
  fVar142 = auVar129._0_4_;
  fVar169 = auVar129._4_4_;
  fVar170 = auVar129._8_4_;
  fVar171 = auVar129._12_4_;
  fVar172 = auVar179._0_4_;
  fVar204 = auVar179._4_4_;
  fVar205 = auVar179._8_4_;
  fVar206 = auVar179._12_4_;
  local_4a0._0_4_ = fVar172 * local_680 + fVar142 * auVar15._0_4_;
  local_4a0._4_4_ = fVar204 * fStack_67c + fVar169 * auVar15._4_4_;
  fStack_498 = fVar205 * fStack_678 + fVar170 * auVar15._8_4_;
  fStack_494 = fVar206 * fStack_674 + fVar171 * auVar15._12_4_;
  fVar231 = fVar172 * (local_680 + local_640 * 0.33333334) +
            fVar142 * (auVar15._0_4_ + auVar155._0_4_ * 0.33333334);
  fVar141 = fVar204 * (fStack_67c + fStack_63c * 0.33333334) +
            fVar169 * (auVar15._4_4_ + auVar155._4_4_ * 0.33333334);
  fVar329 = fVar205 * (fStack_678 + fStack_638 * 0.33333334) +
            fVar170 * (auVar15._8_4_ + auVar155._8_4_ * 0.33333334);
  fVar318 = fVar206 * (fStack_674 + fStack_634 * 0.33333334) +
            fVar171 * (auVar15._12_4_ + auVar155._12_4_ * 0.33333334);
  local_5f0 = auVar195._0_4_;
  fStack_5ec = auVar195._4_4_;
  fStack_5e8 = auVar195._8_4_;
  fStack_5e4 = auVar195._12_4_;
  auVar216._0_4_ = local_5f0 * 0.33333334;
  auVar216._4_4_ = fStack_5ec * 0.33333334;
  auVar216._8_4_ = fStack_5e8 * 0.33333334;
  auVar216._12_4_ = fStack_5e4 * 0.33333334;
  auVar129 = vsubps_avx(auVar128,auVar216);
  auVar256._0_4_ = (fVar362 + auVar116._0_4_) * 0.33333334;
  auVar256._4_4_ = (fVar370 + auVar116._4_4_) * 0.33333334;
  auVar256._8_4_ = (fVar372 + auVar116._8_4_) * 0.33333334;
  auVar256._12_4_ = (fVar374 + auVar116._12_4_) * 0.33333334;
  auVar179 = vsubps_avx(_local_5d0,auVar256);
  auVar187._0_4_ = auVar280._0_4_ * 0.33333334;
  auVar187._4_4_ = auVar280._4_4_ * 0.33333334;
  auVar187._8_4_ = auVar280._8_4_ * 0.33333334;
  auVar187._12_4_ = auVar280._12_4_ * 0.33333334;
  auVar280 = vsubps_avx(auVar244,auVar187);
  auVar122._0_4_ = (fVar229 + auVar121._0_4_) * 0.33333334;
  auVar122._4_4_ = (fVar246 + auVar121._4_4_) * 0.33333334;
  auVar122._8_4_ = (fVar319 + auVar121._8_4_) * 0.33333334;
  auVar122._12_4_ = (fVar327 + auVar121._12_4_) * 0.33333334;
  auVar15 = vsubps_avx(auVar351,auVar122);
  local_4b0._0_4_ = fVar172 * auVar129._0_4_ + fVar142 * auVar280._0_4_;
  local_4b0._4_4_ = fVar204 * auVar129._4_4_ + fVar169 * auVar280._4_4_;
  fStack_4a8 = fVar205 * auVar129._8_4_ + fVar170 * auVar280._8_4_;
  fStack_4a4 = fVar206 * auVar129._12_4_ + fVar171 * auVar280._12_4_;
  local_4c0._0_4_ = auVar244._0_4_ * fVar142 + fVar172 * auVar128._0_4_;
  local_4c0._4_4_ = auVar244._4_4_ * fVar169 + fVar204 * auVar128._4_4_;
  fStack_4b8 = auVar244._8_4_ * fVar170 + fVar205 * auVar128._8_4_;
  fStack_4b4 = auVar244._12_4_ * fVar171 + fVar206 * auVar128._12_4_;
  local_4d0._0_4_ =
       fVar172 * (auVar321._0_4_ + auVar365._0_4_) + fVar142 * (auVar334._0_4_ + auVar120._0_4_);
  local_4d0._4_4_ =
       fVar204 * (auVar321._4_4_ + auVar365._4_4_) + fVar169 * (auVar334._4_4_ + auVar120._4_4_);
  fStack_4c8 = fVar205 * (auVar321._8_4_ + auVar365._8_4_) +
               fVar170 * (auVar334._8_4_ + auVar120._8_4_);
  fStack_4c4 = fVar206 * (auVar321._12_4_ + auVar365._12_4_) +
               fVar171 * (auVar334._12_4_ + auVar120._12_4_);
  fVar246 = fVar172 * (auVar321._0_4_ + auVar365._0_4_ + (fVar228 + auVar180._0_4_) * 0.33333334) +
            ((fVar328 + auVar156._0_4_) * 0.33333334 + auVar334._0_4_ + auVar120._0_4_) * fVar142;
  fVar319 = fVar204 * (auVar321._4_4_ + auVar365._4_4_ + (fVar230 + auVar180._4_4_) * 0.33333334) +
            ((fVar307 + auVar156._4_4_) * 0.33333334 + auVar334._4_4_ + auVar120._4_4_) * fVar169;
  fVar307 = fVar205 * (auVar321._8_4_ + auVar365._8_4_ + (fVar247 + auVar180._8_4_) * 0.33333334) +
            ((fVar316 + auVar156._8_4_) * 0.33333334 + auVar334._8_4_ + auVar120._8_4_) * fVar170;
  fVar330 = fVar206 * (auVar321._12_4_ + auVar365._12_4_ + (fVar248 + auVar180._12_4_) * 0.33333334)
            + ((fVar317 + auVar156._12_4_) * 0.33333334 + auVar334._12_4_ + auVar120._12_4_) *
              fVar171;
  fVar247 = fVar172 * auVar179._0_4_ + fVar142 * auVar15._0_4_;
  fVar327 = fVar204 * auVar179._4_4_ + fVar169 * auVar15._4_4_;
  fVar316 = fVar205 * auVar179._8_4_ + fVar170 * auVar15._8_4_;
  fVar336 = fVar206 * auVar179._12_4_ + fVar171 * auVar15._12_4_;
  fVar248 = fVar172 * (auVar309._0_4_ + auVar235._0_4_) + auVar351._0_4_ * fVar142;
  fVar328 = fVar204 * (auVar309._4_4_ + auVar235._4_4_) + auVar351._4_4_ * fVar169;
  fVar317 = fVar205 * (auVar309._8_4_ + auVar235._8_4_) + auVar351._8_4_ * fVar170;
  fVar338 = fVar206 * (auVar309._12_4_ + auVar235._12_4_) + auVar351._12_4_ * fVar171;
  auVar129 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar129 = vinsertps_avx(auVar129,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_360 = vsubps_avx(_local_4a0,auVar129);
  auVar244 = vmovsldup_avx(local_360);
  auVar179 = vmovshdup_avx(local_360);
  auVar280 = vshufps_avx(local_360,local_360,0xaa);
  fVar142 = pre->ray_space[k].vx.field_0.m128[0];
  fVar169 = pre->ray_space[k].vx.field_0.m128[1];
  fVar170 = pre->ray_space[k].vx.field_0.m128[2];
  fVar171 = pre->ray_space[k].vx.field_0.m128[3];
  fVar172 = pre->ray_space[k].vy.field_0.m128[0];
  fVar204 = pre->ray_space[k].vy.field_0.m128[1];
  fVar205 = pre->ray_space[k].vy.field_0.m128[2];
  fVar206 = pre->ray_space[k].vy.field_0.m128[3];
  fVar207 = pre->ray_space[k].vz.field_0.m128[0];
  fVar228 = pre->ray_space[k].vz.field_0.m128[1];
  fVar229 = pre->ray_space[k].vz.field_0.m128[2];
  fVar230 = pre->ray_space[k].vz.field_0.m128[3];
  local_5c0._0_4_ = fVar142 * auVar244._0_4_ + fVar172 * auVar179._0_4_ + fVar207 * auVar280._0_4_;
  local_5c0._4_4_ = fVar169 * auVar244._4_4_ + fVar204 * auVar179._4_4_ + fVar228 * auVar280._4_4_;
  fStack_5b8 = fVar170 * auVar244._8_4_ + fVar205 * auVar179._8_4_ + fVar229 * auVar280._8_4_;
  fStack_5b4 = fVar171 * auVar244._12_4_ + fVar206 * auVar179._12_4_ + fVar230 * auVar280._12_4_;
  auVar68._4_4_ = fVar141;
  auVar68._0_4_ = fVar231;
  auVar68._8_4_ = fVar329;
  auVar68._12_4_ = fVar318;
  local_370 = vsubps_avx(auVar68,auVar129);
  auVar280 = vshufps_avx(local_370,local_370,0xaa);
  auVar179 = vmovshdup_avx(local_370);
  auVar244 = vmovsldup_avx(local_370);
  auVar352._0_8_ =
       CONCAT44(fVar169 * auVar244._4_4_ + fVar204 * auVar179._4_4_ + fVar228 * auVar280._4_4_,
                fVar142 * auVar244._0_4_ + fVar172 * auVar179._0_4_ + fVar207 * auVar280._0_4_);
  auVar352._8_4_ = fVar170 * auVar244._8_4_ + fVar205 * auVar179._8_4_ + fVar229 * auVar280._8_4_;
  auVar352._12_4_ =
       fVar171 * auVar244._12_4_ + fVar206 * auVar179._12_4_ + fVar230 * auVar280._12_4_;
  local_380 = vsubps_avx(_local_4b0,auVar129);
  auVar280 = vshufps_avx(local_380,local_380,0xaa);
  auVar179 = vmovshdup_avx(local_380);
  auVar244 = vmovsldup_avx(local_380);
  auVar366._0_4_ = fVar142 * auVar244._0_4_ + fVar172 * auVar179._0_4_ + fVar207 * auVar280._0_4_;
  auVar366._4_4_ = fVar169 * auVar244._4_4_ + fVar204 * auVar179._4_4_ + fVar228 * auVar280._4_4_;
  auVar366._8_4_ = fVar170 * auVar244._8_4_ + fVar205 * auVar179._8_4_ + fVar229 * auVar280._8_4_;
  auVar366._12_4_ =
       fVar171 * auVar244._12_4_ + fVar206 * auVar179._12_4_ + fVar230 * auVar280._12_4_;
  local_390 = vsubps_avx(_local_4c0,auVar129);
  auVar280 = vshufps_avx(local_390,local_390,0xaa);
  auVar179 = vmovshdup_avx(local_390);
  auVar244 = vmovsldup_avx(local_390);
  auVar123._0_4_ = auVar244._0_4_ * fVar142 + auVar179._0_4_ * fVar172 + fVar207 * auVar280._0_4_;
  auVar123._4_4_ = auVar244._4_4_ * fVar169 + auVar179._4_4_ * fVar204 + fVar228 * auVar280._4_4_;
  auVar123._8_4_ = auVar244._8_4_ * fVar170 + auVar179._8_4_ * fVar205 + fVar229 * auVar280._8_4_;
  auVar123._12_4_ =
       auVar244._12_4_ * fVar171 + auVar179._12_4_ * fVar206 + fVar230 * auVar280._12_4_;
  local_3a0 = vsubps_avx(_local_4d0,auVar129);
  auVar280 = vshufps_avx(local_3a0,local_3a0,0xaa);
  auVar179 = vmovshdup_avx(local_3a0);
  auVar244 = vmovsldup_avx(local_3a0);
  auVar284._0_4_ = auVar244._0_4_ * fVar142 + auVar179._0_4_ * fVar172 + auVar280._0_4_ * fVar207;
  auVar284._4_4_ = auVar244._4_4_ * fVar169 + auVar179._4_4_ * fVar204 + auVar280._4_4_ * fVar228;
  auVar284._8_4_ = auVar244._8_4_ * fVar170 + auVar179._8_4_ * fVar205 + auVar280._8_4_ * fVar229;
  auVar284._12_4_ =
       auVar244._12_4_ * fVar171 + auVar179._12_4_ * fVar206 + auVar280._12_4_ * fVar230;
  auVar66._4_4_ = fVar319;
  auVar66._0_4_ = fVar246;
  auVar66._8_4_ = fVar307;
  auVar66._12_4_ = fVar330;
  local_3b0 = vsubps_avx(auVar66,auVar129);
  auVar280 = vshufps_avx(local_3b0,local_3b0,0xaa);
  auVar179 = vmovshdup_avx(local_3b0);
  auVar244 = vmovsldup_avx(local_3b0);
  auVar297._0_4_ = auVar244._0_4_ * fVar142 + auVar179._0_4_ * fVar172 + auVar280._0_4_ * fVar207;
  auVar297._4_4_ = auVar244._4_4_ * fVar169 + auVar179._4_4_ * fVar204 + auVar280._4_4_ * fVar228;
  auVar297._8_4_ = auVar244._8_4_ * fVar170 + auVar179._8_4_ * fVar205 + auVar280._8_4_ * fVar229;
  auVar297._12_4_ =
       auVar244._12_4_ * fVar171 + auVar179._12_4_ * fVar206 + auVar280._12_4_ * fVar230;
  auVar64._4_4_ = fVar327;
  auVar64._0_4_ = fVar247;
  auVar64._8_4_ = fVar316;
  auVar64._12_4_ = fVar336;
  local_3c0 = vsubps_avx(auVar64,auVar129);
  auVar280 = vshufps_avx(local_3c0,local_3c0,0xaa);
  auVar179 = vmovshdup_avx(local_3c0);
  auVar244 = vmovsldup_avx(local_3c0);
  auVar310._0_4_ = auVar244._0_4_ * fVar142 + auVar179._0_4_ * fVar172 + auVar280._0_4_ * fVar207;
  auVar310._4_4_ = auVar244._4_4_ * fVar169 + auVar179._4_4_ * fVar204 + auVar280._4_4_ * fVar228;
  auVar310._8_4_ = auVar244._8_4_ * fVar170 + auVar179._8_4_ * fVar205 + auVar280._8_4_ * fVar229;
  auVar310._12_4_ =
       auVar244._12_4_ * fVar171 + auVar179._12_4_ * fVar206 + auVar280._12_4_ * fVar230;
  auVar62._4_4_ = fVar328;
  auVar62._0_4_ = fVar248;
  auVar62._8_4_ = fVar317;
  auVar62._12_4_ = fVar338;
  local_3d0 = vsubps_avx(auVar62,auVar129);
  auVar244 = vshufps_avx(local_3d0,local_3d0,0xaa);
  auVar129 = vmovshdup_avx(local_3d0);
  auVar179 = vmovsldup_avx(local_3d0);
  auVar101._0_4_ = fVar142 * auVar179._0_4_ + fVar172 * auVar129._0_4_ + fVar207 * auVar244._0_4_;
  auVar101._4_4_ = fVar169 * auVar179._4_4_ + fVar204 * auVar129._4_4_ + fVar228 * auVar244._4_4_;
  auVar101._8_4_ = fVar170 * auVar179._8_4_ + fVar205 * auVar129._8_4_ + fVar229 * auVar244._8_4_;
  auVar101._12_4_ =
       fVar171 * auVar179._12_4_ + fVar206 * auVar129._12_4_ + fVar230 * auVar244._12_4_;
  auVar280 = vmovlhps_avx(_local_5c0,auVar284);
  auVar15 = vmovlhps_avx(auVar352,auVar297);
  auVar155 = vmovlhps_avx(auVar366,auVar310);
  _local_490 = vmovlhps_avx(auVar123,auVar101);
  auVar129 = vminps_avx(auVar280,auVar15);
  auVar179 = vminps_avx(auVar155,_local_490);
  auVar244 = vminps_avx(auVar129,auVar179);
  auVar129 = vmaxps_avx(auVar280,auVar15);
  auVar179 = vmaxps_avx(auVar155,_local_490);
  auVar129 = vmaxps_avx(auVar129,auVar179);
  auVar179 = vshufpd_avx(auVar244,auVar244,3);
  auVar244 = vminps_avx(auVar244,auVar179);
  auVar179 = vshufpd_avx(auVar129,auVar129,3);
  auVar179 = vmaxps_avx(auVar129,auVar179);
  auVar257._8_4_ = 0x7fffffff;
  auVar257._0_8_ = 0x7fffffff7fffffff;
  auVar257._12_4_ = 0x7fffffff;
  auVar129 = vandps_avx(auVar244,auVar257);
  auVar179 = vandps_avx(auVar179,auVar257);
  auVar129 = vmaxps_avx(auVar129,auVar179);
  auVar179 = vmovshdup_avx(auVar129);
  auVar129 = vmaxss_avx(auVar179,auVar129);
  local_508 = uVar75 + 0xf;
  fVar169 = auVar129._0_4_ * 9.536743e-07;
  register0x00001548 = auVar352._0_8_;
  local_480 = auVar352._0_8_;
  auVar129 = vshufps_avx(ZEXT416((uint)fVar169),ZEXT416((uint)fVar169),0);
  local_280._16_16_ = auVar129;
  local_280._0_16_ = auVar129;
  auVar102._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
  auVar102._8_4_ = auVar129._8_4_ ^ 0x80000000;
  auVar102._12_4_ = auVar129._12_4_ ^ 0x80000000;
  local_2a0._16_16_ = auVar102;
  local_2a0._0_16_ = auVar102;
  auVar129 = vshufps_avx(ZEXT416(uVar76),ZEXT416(uVar76),0);
  local_2c0._16_16_ = auVar129;
  local_2c0._0_16_ = auVar129;
  auVar129 = vpshufd_avx(ZEXT416(*(uint *)(prim + lVar80 * 4 + 6)),0);
  local_2e0._16_16_ = auVar129;
  local_2e0._0_16_ = auVar129;
  bVar74 = false;
  uVar82 = 0;
  fVar142 = *(float *)(ray + k * 4 + 0x60);
  _local_330 = vsubps_avx(auVar15,auVar280);
  _local_340 = vsubps_avx(auVar155,auVar15);
  _local_350 = vsubps_avx(_local_490,auVar155);
  _local_400 = vsubps_avx(_local_4d0,_local_4a0);
  auVar67._4_4_ = fVar319;
  auVar67._0_4_ = fVar246;
  auVar67._8_4_ = fVar307;
  auVar67._12_4_ = fVar330;
  auVar69._4_4_ = fVar141;
  auVar69._0_4_ = fVar231;
  auVar69._8_4_ = fVar329;
  auVar69._12_4_ = fVar318;
  _local_410 = vsubps_avx(auVar67,auVar69);
  auVar65._4_4_ = fVar327;
  auVar65._0_4_ = fVar247;
  auVar65._8_4_ = fVar316;
  auVar65._12_4_ = fVar336;
  _local_420 = vsubps_avx(auVar65,_local_4b0);
  auVar63._4_4_ = fVar328;
  auVar63._0_4_ = fVar248;
  auVar63._8_4_ = fVar317;
  auVar63._12_4_ = fVar338;
  _local_430 = vsubps_avx(auVar63,_local_4c0);
  local_6d0 = ZEXT816(0x3f80000000000000);
  local_3e0 = local_6d0;
  do {
    auVar129 = vshufps_avx(local_6d0,local_6d0,0x50);
    auVar378._8_4_ = 0x3f800000;
    auVar378._0_8_ = &DAT_3f8000003f800000;
    auVar378._12_4_ = 0x3f800000;
    auVar381._16_4_ = 0x3f800000;
    auVar381._0_16_ = auVar378;
    auVar381._20_4_ = 0x3f800000;
    auVar381._24_4_ = 0x3f800000;
    auVar381._28_4_ = 0x3f800000;
    auVar179 = vsubps_avx(auVar378,auVar129);
    fVar170 = auVar129._0_4_;
    fVar171 = auVar129._4_4_;
    fVar172 = auVar129._8_4_;
    fVar204 = auVar129._12_4_;
    fVar205 = auVar179._0_4_;
    fVar206 = auVar179._4_4_;
    fVar207 = auVar179._8_4_;
    fVar228 = auVar179._12_4_;
    auVar157._0_4_ = auVar284._0_4_ * fVar170 + fVar205 * (float)local_5c0._0_4_;
    auVar157._4_4_ = auVar284._4_4_ * fVar171 + fVar206 * (float)local_5c0._4_4_;
    auVar157._8_4_ = auVar284._0_4_ * fVar172 + fVar207 * (float)local_5c0._0_4_;
    auVar157._12_4_ = auVar284._4_4_ * fVar204 + fVar228 * (float)local_5c0._4_4_;
    auVar124._0_4_ = auVar297._0_4_ * fVar170 + local_480._0_4_ * fVar205;
    auVar124._4_4_ = auVar297._4_4_ * fVar171 + local_480._4_4_ * fVar206;
    auVar124._8_4_ = auVar297._0_4_ * fVar172 + local_480._8_4_ * fVar207;
    auVar124._12_4_ = auVar297._4_4_ * fVar204 + local_480._12_4_ * fVar228;
    auVar217._0_4_ = auVar310._0_4_ * fVar170 + auVar366._0_4_ * fVar205;
    auVar217._4_4_ = auVar310._4_4_ * fVar171 + auVar366._4_4_ * fVar206;
    auVar217._8_4_ = auVar310._0_4_ * fVar172 + auVar366._0_4_ * fVar207;
    auVar217._12_4_ = auVar310._4_4_ * fVar204 + auVar366._4_4_ * fVar228;
    auVar188._0_4_ = auVar101._0_4_ * fVar170 + auVar123._0_4_ * fVar205;
    auVar188._4_4_ = auVar101._4_4_ * fVar171 + auVar123._4_4_ * fVar206;
    auVar188._8_4_ = auVar101._0_4_ * fVar172 + auVar123._0_4_ * fVar207;
    auVar188._12_4_ = auVar101._4_4_ * fVar204 + auVar123._4_4_ * fVar228;
    auVar129 = vmovshdup_avx(local_3e0);
    auVar179 = vshufps_avx(local_3e0,local_3e0,0);
    auVar293._16_16_ = auVar179;
    auVar293._0_16_ = auVar179;
    auVar244 = vshufps_avx(local_3e0,local_3e0,0x55);
    auVar107._16_16_ = auVar244;
    auVar107._0_16_ = auVar244;
    auVar106 = vsubps_avx(auVar107,auVar293);
    auVar244 = vshufps_avx(auVar157,auVar157,0);
    auVar196 = vshufps_avx(auVar157,auVar157,0x55);
    auVar128 = vshufps_avx(auVar124,auVar124,0);
    auVar195 = vshufps_avx(auVar124,auVar124,0x55);
    auVar103 = vshufps_avx(auVar217,auVar217,0);
    auVar158 = vshufps_avx(auVar217,auVar217,0x55);
    auVar273 = vshufps_avx(auVar188,auVar188,0);
    auVar86 = vshufps_avx(auVar188,auVar188,0x55);
    auVar129 = ZEXT416((uint)((auVar129._0_4_ - local_3e0._0_4_) * 0.04761905));
    auVar129 = vshufps_avx(auVar129,auVar129,0);
    auVar306._0_4_ = auVar179._0_4_ + auVar106._0_4_ * 0.0;
    auVar306._4_4_ = auVar179._4_4_ + auVar106._4_4_ * 0.14285715;
    auVar306._8_4_ = auVar179._8_4_ + auVar106._8_4_ * 0.2857143;
    auVar306._12_4_ = auVar179._12_4_ + auVar106._12_4_ * 0.42857146;
    auVar306._16_4_ = auVar179._0_4_ + auVar106._16_4_ * 0.5714286;
    auVar306._20_4_ = auVar179._4_4_ + auVar106._20_4_ * 0.71428573;
    auVar306._24_4_ = auVar179._8_4_ + auVar106._24_4_ * 0.8571429;
    auVar306._28_4_ = auVar179._12_4_ + auVar106._28_4_;
    auVar18 = vsubps_avx(auVar381,auVar306);
    fVar358 = auVar128._0_4_;
    fVar362 = auVar128._4_4_;
    fVar383 = auVar128._8_4_;
    fVar387 = auVar128._12_4_;
    fVar170 = auVar18._0_4_;
    fVar205 = auVar18._4_4_;
    fVar229 = auVar18._8_4_;
    fVar357 = auVar18._12_4_;
    fVar360 = auVar244._12_4_;
    fVar370 = auVar18._16_4_;
    fVar372 = auVar18._20_4_;
    fVar374 = auVar18._24_4_;
    fVar263 = auVar195._0_4_;
    fVar264 = auVar195._4_4_;
    fVar265 = auVar195._8_4_;
    fVar348 = auVar195._12_4_;
    local_660 = auVar196._0_4_;
    fStack_65c = auVar196._4_4_;
    fStack_658 = auVar196._8_4_;
    fStack_654 = auVar196._12_4_;
    fVar171 = auVar103._0_4_;
    fVar204 = auVar103._4_4_;
    fVar207 = auVar103._8_4_;
    fVar230 = auVar103._12_4_;
    fVar359 = auVar306._0_4_ * fVar171 + fVar358 * fVar170;
    fVar375 = auVar306._4_4_ * fVar204 + fVar362 * fVar205;
    fVar385 = auVar306._8_4_ * fVar207 + fVar383 * fVar229;
    fVar376 = auVar306._12_4_ * fVar230 + fVar387 * fVar357;
    fVar384 = auVar306._16_4_ * fVar171 + fVar358 * fVar370;
    fVar386 = auVar306._20_4_ * fVar204 + fVar362 * fVar372;
    fVar388 = auVar306._24_4_ * fVar207 + fVar383 * fVar374;
    fVar172 = auVar158._0_4_;
    fVar206 = auVar158._4_4_;
    fVar228 = auVar158._8_4_;
    fVar340 = auVar158._12_4_;
    fVar331 = auVar306._0_4_ * fVar172 + fVar263 * fVar170;
    fVar337 = auVar306._4_4_ * fVar206 + fVar264 * fVar205;
    fVar339 = auVar306._8_4_ * fVar228 + fVar265 * fVar229;
    fVar341 = auVar306._12_4_ * fVar340 + fVar348 * fVar357;
    fVar342 = auVar306._16_4_ * fVar172 + fVar263 * fVar370;
    fVar344 = auVar306._20_4_ * fVar206 + fVar264 * fVar372;
    fVar346 = auVar306._24_4_ * fVar228 + fVar265 * fVar374;
    auVar179 = vshufps_avx(auVar157,auVar157,0xaa);
    auVar196 = vshufps_avx(auVar157,auVar157,0xff);
    fVar349 = fVar230 + 0.0;
    auVar128 = vshufps_avx(auVar124,auVar124,0xaa);
    auVar195 = vshufps_avx(auVar124,auVar124,0xff);
    auVar108._0_4_ =
         fVar170 * (fVar358 * auVar306._0_4_ + auVar244._0_4_ * fVar170) + auVar306._0_4_ * fVar359;
    auVar108._4_4_ =
         fVar205 * (fVar362 * auVar306._4_4_ + auVar244._4_4_ * fVar205) + auVar306._4_4_ * fVar375;
    auVar108._8_4_ =
         fVar229 * (fVar383 * auVar306._8_4_ + auVar244._8_4_ * fVar229) + auVar306._8_4_ * fVar385;
    auVar108._12_4_ =
         fVar357 * (fVar387 * auVar306._12_4_ + fVar360 * fVar357) + auVar306._12_4_ * fVar376;
    auVar108._16_4_ =
         fVar370 * (fVar358 * auVar306._16_4_ + auVar244._0_4_ * fVar370) +
         auVar306._16_4_ * fVar384;
    auVar108._20_4_ =
         fVar372 * (fVar362 * auVar306._20_4_ + auVar244._4_4_ * fVar372) +
         auVar306._20_4_ * fVar386;
    auVar108._24_4_ =
         fVar374 * (fVar383 * auVar306._24_4_ + auVar244._8_4_ * fVar374) +
         auVar306._24_4_ * fVar388;
    auVar108._28_4_ = fVar360 + 1.0 + fVar340;
    auVar200._0_4_ =
         fVar170 * (fVar263 * auVar306._0_4_ + fVar170 * local_660) + auVar306._0_4_ * fVar331;
    auVar200._4_4_ =
         fVar205 * (fVar264 * auVar306._4_4_ + fVar205 * fStack_65c) + auVar306._4_4_ * fVar337;
    auVar200._8_4_ =
         fVar229 * (fVar265 * auVar306._8_4_ + fVar229 * fStack_658) + auVar306._8_4_ * fVar339;
    auVar200._12_4_ =
         fVar357 * (fVar348 * auVar306._12_4_ + fVar357 * fStack_654) + auVar306._12_4_ * fVar341;
    auVar200._16_4_ =
         fVar370 * (fVar263 * auVar306._16_4_ + fVar370 * local_660) + auVar306._16_4_ * fVar342;
    auVar200._20_4_ =
         fVar372 * (fVar264 * auVar306._20_4_ + fVar372 * fStack_65c) + auVar306._20_4_ * fVar344;
    auVar200._24_4_ =
         fVar374 * (fVar265 * auVar306._24_4_ + fVar374 * fStack_658) + auVar306._24_4_ * fVar346;
    auVar200._28_4_ = fVar360 + 1.0 + fVar340;
    auVar225._0_4_ =
         fVar170 * fVar359 + auVar306._0_4_ * (auVar273._0_4_ * auVar306._0_4_ + fVar170 * fVar171);
    auVar225._4_4_ =
         fVar205 * fVar375 + auVar306._4_4_ * (auVar273._4_4_ * auVar306._4_4_ + fVar205 * fVar204);
    auVar225._8_4_ =
         fVar229 * fVar385 + auVar306._8_4_ * (auVar273._8_4_ * auVar306._8_4_ + fVar229 * fVar207);
    auVar225._12_4_ =
         fVar357 * fVar376 +
         auVar306._12_4_ * (auVar273._12_4_ * auVar306._12_4_ + fVar357 * fVar230);
    auVar225._16_4_ =
         fVar370 * fVar384 +
         auVar306._16_4_ * (auVar273._0_4_ * auVar306._16_4_ + fVar370 * fVar171);
    auVar225._20_4_ =
         fVar372 * fVar386 +
         auVar306._20_4_ * (auVar273._4_4_ * auVar306._20_4_ + fVar372 * fVar204);
    auVar225._24_4_ =
         fVar374 * fVar388 +
         auVar306._24_4_ * (auVar273._8_4_ * auVar306._24_4_ + fVar374 * fVar207);
    auVar225._28_4_ = fVar340 + fVar349;
    auVar315._0_4_ =
         fVar170 * fVar331 + auVar306._0_4_ * (auVar86._0_4_ * auVar306._0_4_ + fVar170 * fVar172);
    auVar315._4_4_ =
         fVar205 * fVar337 + auVar306._4_4_ * (auVar86._4_4_ * auVar306._4_4_ + fVar205 * fVar206);
    auVar315._8_4_ =
         fVar229 * fVar339 + auVar306._8_4_ * (auVar86._8_4_ * auVar306._8_4_ + fVar229 * fVar228);
    auVar315._12_4_ =
         fVar357 * fVar341 +
         auVar306._12_4_ * (auVar86._12_4_ * auVar306._12_4_ + fVar357 * fVar340);
    auVar315._16_4_ =
         fVar370 * fVar342 + auVar306._16_4_ * (auVar86._0_4_ * auVar306._16_4_ + fVar370 * fVar172)
    ;
    auVar315._20_4_ =
         fVar372 * fVar344 + auVar306._20_4_ * (auVar86._4_4_ * auVar306._20_4_ + fVar372 * fVar206)
    ;
    auVar315._24_4_ =
         fVar374 * fVar346 + auVar306._24_4_ * (auVar86._8_4_ * auVar306._24_4_ + fVar374 * fVar228)
    ;
    auVar315._28_4_ = fVar349 + fVar340 + 0.0;
    local_1c0._0_4_ = fVar170 * auVar108._0_4_ + auVar306._0_4_ * auVar225._0_4_;
    local_1c0._4_4_ = fVar205 * auVar108._4_4_ + auVar306._4_4_ * auVar225._4_4_;
    local_1c0._8_4_ = fVar229 * auVar108._8_4_ + auVar306._8_4_ * auVar225._8_4_;
    local_1c0._12_4_ = fVar357 * auVar108._12_4_ + auVar306._12_4_ * auVar225._12_4_;
    local_1c0._16_4_ = fVar370 * auVar108._16_4_ + auVar306._16_4_ * auVar225._16_4_;
    local_1c0._20_4_ = fVar372 * auVar108._20_4_ + auVar306._20_4_ * auVar225._20_4_;
    local_1c0._24_4_ = fVar374 * auVar108._24_4_ + auVar306._24_4_ * auVar225._24_4_;
    local_1c0._28_4_ = fVar360 + fVar387 + fVar340 + 0.0;
    local_1e0._0_4_ = fVar170 * auVar200._0_4_ + auVar306._0_4_ * auVar315._0_4_;
    local_1e0._4_4_ = fVar205 * auVar200._4_4_ + auVar306._4_4_ * auVar315._4_4_;
    local_1e0._8_4_ = fVar229 * auVar200._8_4_ + auVar306._8_4_ * auVar315._8_4_;
    local_1e0._12_4_ = fVar357 * auVar200._12_4_ + auVar306._12_4_ * auVar315._12_4_;
    local_1e0._16_4_ = fVar370 * auVar200._16_4_ + auVar306._16_4_ * auVar315._16_4_;
    local_1e0._20_4_ = fVar372 * auVar200._20_4_ + auVar306._20_4_ * auVar315._20_4_;
    local_1e0._24_4_ = fVar374 * auVar200._24_4_ + auVar306._24_4_ * auVar315._24_4_;
    local_1e0._28_4_ = fVar360 + fVar387 + fVar349;
    auVar19 = vsubps_avx(auVar225,auVar108);
    auVar106 = vsubps_avx(auVar315,auVar200);
    local_6a0._0_4_ = auVar129._0_4_;
    local_6a0._4_4_ = auVar129._4_4_;
    fStack_698 = auVar129._8_4_;
    fStack_694 = auVar129._12_4_;
    local_220 = (float)local_6a0._0_4_ * auVar19._0_4_ * 3.0;
    fStack_21c = (float)local_6a0._4_4_ * auVar19._4_4_ * 3.0;
    auVar20._4_4_ = fStack_21c;
    auVar20._0_4_ = local_220;
    fStack_218 = fStack_698 * auVar19._8_4_ * 3.0;
    auVar20._8_4_ = fStack_218;
    fStack_214 = fStack_694 * auVar19._12_4_ * 3.0;
    auVar20._12_4_ = fStack_214;
    fStack_210 = (float)local_6a0._0_4_ * auVar19._16_4_ * 3.0;
    auVar20._16_4_ = fStack_210;
    fStack_20c = (float)local_6a0._4_4_ * auVar19._20_4_ * 3.0;
    auVar20._20_4_ = fStack_20c;
    fStack_208 = fStack_698 * auVar19._24_4_ * 3.0;
    auVar20._24_4_ = fStack_208;
    auVar20._28_4_ = auVar19._28_4_;
    fVar375 = (float)local_6a0._0_4_ * auVar106._0_4_ * 3.0;
    fVar383 = (float)local_6a0._4_4_ * auVar106._4_4_ * 3.0;
    auVar21._4_4_ = fVar383;
    auVar21._0_4_ = fVar375;
    fVar385 = fStack_698 * auVar106._8_4_ * 3.0;
    auVar21._8_4_ = fVar385;
    fVar387 = fStack_694 * auVar106._12_4_ * 3.0;
    auVar21._12_4_ = fVar387;
    fVar376 = (float)local_6a0._0_4_ * auVar106._16_4_ * 3.0;
    auVar21._16_4_ = fVar376;
    fVar384 = (float)local_6a0._4_4_ * auVar106._20_4_ * 3.0;
    auVar21._20_4_ = fVar384;
    fVar386 = fStack_698 * auVar106._24_4_ * 3.0;
    auVar21._24_4_ = fVar386;
    auVar21._28_4_ = auVar225._28_4_;
    auVar20 = vsubps_avx(local_1c0,auVar20);
    auVar106 = vperm2f128_avx(auVar20,auVar20,1);
    auVar106 = vshufps_avx(auVar106,auVar20,0x30);
    auVar106 = vshufps_avx(auVar20,auVar106,0x29);
    auVar21 = vsubps_avx(local_1e0,auVar21);
    auVar20 = vperm2f128_avx(auVar21,auVar21,1);
    auVar20 = vshufps_avx(auVar20,auVar21,0x30);
    auVar107 = vshufps_avx(auVar21,auVar20,0x29);
    fVar363 = auVar128._0_4_;
    fVar371 = auVar128._4_4_;
    fVar373 = auVar128._8_4_;
    fVar171 = auVar195._0_4_;
    fVar206 = auVar195._4_4_;
    fVar230 = auVar195._8_4_;
    fVar358 = auVar195._12_4_;
    fVar361 = auVar196._12_4_;
    auVar129 = vshufps_avx(auVar217,auVar217,0xaa);
    fVar172 = auVar129._0_4_;
    fVar207 = auVar129._4_4_;
    fVar340 = auVar129._8_4_;
    fVar359 = auVar129._12_4_;
    fVar341 = auVar306._0_4_ * fVar172 + fVar363 * fVar170;
    fVar342 = auVar306._4_4_ * fVar207 + fVar371 * fVar205;
    fVar344 = auVar306._8_4_ * fVar340 + fVar373 * fVar229;
    fVar346 = auVar306._12_4_ * fVar359 + auVar128._12_4_ * fVar357;
    fVar343 = auVar306._16_4_ * fVar172 + fVar363 * fVar370;
    fVar345 = auVar306._20_4_ * fVar207 + fVar371 * fVar372;
    fVar347 = auVar306._24_4_ * fVar340 + fVar373 * fVar374;
    fVar348 = fVar361 + fVar360 + fVar348;
    auVar129 = vshufps_avx(auVar217,auVar217,0xff);
    fVar204 = auVar129._0_4_;
    fVar228 = auVar129._4_4_;
    fVar349 = auVar129._8_4_;
    fVar362 = auVar129._12_4_;
    fVar388 = auVar306._0_4_ * fVar204 + fVar170 * fVar171;
    fVar263 = auVar306._4_4_ * fVar228 + fVar205 * fVar206;
    fVar331 = auVar306._8_4_ * fVar349 + fVar229 * fVar230;
    fVar264 = auVar306._12_4_ * fVar362 + fVar357 * fVar358;
    fVar337 = auVar306._16_4_ * fVar204 + fVar370 * fVar171;
    fVar265 = auVar306._20_4_ * fVar228 + fVar372 * fVar206;
    fVar339 = auVar306._24_4_ * fVar349 + fVar374 * fVar230;
    auVar129 = vshufps_avx(auVar188,auVar188,0xaa);
    auVar244 = vshufps_avx(auVar188,auVar188,0xff);
    fVar360 = auVar244._12_4_;
    auVar109._0_4_ =
         auVar306._0_4_ * fVar341 + fVar170 * (fVar363 * auVar306._0_4_ + auVar179._0_4_ * fVar170);
    auVar109._4_4_ =
         auVar306._4_4_ * fVar342 + fVar205 * (fVar371 * auVar306._4_4_ + auVar179._4_4_ * fVar205);
    auVar109._8_4_ =
         auVar306._8_4_ * fVar344 + fVar229 * (fVar373 * auVar306._8_4_ + auVar179._8_4_ * fVar229);
    auVar109._12_4_ =
         auVar306._12_4_ * fVar346 +
         fVar357 * (auVar128._12_4_ * auVar306._12_4_ + auVar179._12_4_ * fVar357);
    auVar109._16_4_ =
         auVar306._16_4_ * fVar343 +
         fVar370 * (fVar363 * auVar306._16_4_ + auVar179._0_4_ * fVar370);
    auVar109._20_4_ =
         auVar306._20_4_ * fVar345 +
         fVar372 * (fVar371 * auVar306._20_4_ + auVar179._4_4_ * fVar372);
    auVar109._24_4_ =
         auVar306._24_4_ * fVar347 +
         fVar374 * (fVar373 * auVar306._24_4_ + auVar179._8_4_ * fVar374);
    auVar109._28_4_ = fVar360 + auVar21._28_4_ + auVar20._28_4_;
    auVar356._0_4_ =
         auVar306._0_4_ * fVar388 + fVar170 * (auVar306._0_4_ * fVar171 + auVar196._0_4_ * fVar170);
    auVar356._4_4_ =
         auVar306._4_4_ * fVar263 + fVar205 * (auVar306._4_4_ * fVar206 + auVar196._4_4_ * fVar205);
    auVar356._8_4_ =
         auVar306._8_4_ * fVar331 + fVar229 * (auVar306._8_4_ * fVar230 + auVar196._8_4_ * fVar229);
    auVar356._12_4_ =
         auVar306._12_4_ * fVar264 + fVar357 * (auVar306._12_4_ * fVar358 + fVar361 * fVar357);
    auVar356._16_4_ =
         auVar306._16_4_ * fVar337 +
         fVar370 * (auVar306._16_4_ * fVar171 + auVar196._0_4_ * fVar370);
    auVar356._20_4_ =
         auVar306._20_4_ * fVar265 +
         fVar372 * (auVar306._20_4_ * fVar206 + auVar196._4_4_ * fVar372);
    auVar356._24_4_ =
         auVar306._24_4_ * fVar339 +
         fVar374 * (auVar306._24_4_ * fVar230 + auVar196._8_4_ * fVar374);
    auVar356._28_4_ = fVar360 + auVar20._28_4_ + auVar225._28_4_;
    auVar20 = vperm2f128_avx(local_1c0,local_1c0,1);
    auVar20 = vshufps_avx(auVar20,local_1c0,0x30);
    auVar108 = vshufps_avx(local_1c0,auVar20,0x29);
    auVar226._0_4_ =
         fVar170 * fVar341 + auVar306._0_4_ * (auVar129._0_4_ * auVar306._0_4_ + fVar170 * fVar172);
    auVar226._4_4_ =
         fVar205 * fVar342 + auVar306._4_4_ * (auVar129._4_4_ * auVar306._4_4_ + fVar205 * fVar207);
    auVar226._8_4_ =
         fVar229 * fVar344 + auVar306._8_4_ * (auVar129._8_4_ * auVar306._8_4_ + fVar229 * fVar340);
    auVar226._12_4_ =
         fVar357 * fVar346 +
         auVar306._12_4_ * (auVar129._12_4_ * auVar306._12_4_ + fVar357 * fVar359);
    auVar226._16_4_ =
         fVar370 * fVar343 +
         auVar306._16_4_ * (auVar129._0_4_ * auVar306._16_4_ + fVar370 * fVar172);
    auVar226._20_4_ =
         fVar372 * fVar345 +
         auVar306._20_4_ * (auVar129._4_4_ * auVar306._20_4_ + fVar372 * fVar207);
    auVar226._24_4_ =
         fVar374 * fVar347 +
         auVar306._24_4_ * (auVar129._8_4_ * auVar306._24_4_ + fVar374 * fVar340);
    auVar226._28_4_ = fVar348 + auVar129._12_4_ + fVar359;
    auVar262._0_4_ =
         fVar170 * fVar388 + auVar306._0_4_ * (auVar244._0_4_ * auVar306._0_4_ + fVar170 * fVar204);
    auVar262._4_4_ =
         fVar205 * fVar263 + auVar306._4_4_ * (auVar244._4_4_ * auVar306._4_4_ + fVar205 * fVar228);
    auVar262._8_4_ =
         fVar229 * fVar331 + auVar306._8_4_ * (auVar244._8_4_ * auVar306._8_4_ + fVar229 * fVar349);
    auVar262._12_4_ =
         fVar357 * fVar264 + auVar306._12_4_ * (fVar360 * auVar306._12_4_ + fVar357 * fVar362);
    auVar262._16_4_ =
         fVar370 * fVar337 +
         auVar306._16_4_ * (auVar244._0_4_ * auVar306._16_4_ + fVar370 * fVar204);
    auVar262._20_4_ =
         fVar372 * fVar265 +
         auVar306._20_4_ * (auVar244._4_4_ * auVar306._20_4_ + fVar372 * fVar228);
    auVar262._24_4_ =
         fVar374 * fVar339 +
         auVar306._24_4_ * (auVar244._8_4_ * auVar306._24_4_ + fVar374 * fVar349);
    auVar262._28_4_ = fVar361 + fVar358 + fVar360 + fVar362;
    auVar276._0_4_ = fVar170 * auVar109._0_4_ + auVar306._0_4_ * auVar226._0_4_;
    auVar276._4_4_ = fVar205 * auVar109._4_4_ + auVar306._4_4_ * auVar226._4_4_;
    auVar276._8_4_ = fVar229 * auVar109._8_4_ + auVar306._8_4_ * auVar226._8_4_;
    auVar276._12_4_ = fVar357 * auVar109._12_4_ + auVar306._12_4_ * auVar226._12_4_;
    auVar276._16_4_ = fVar370 * auVar109._16_4_ + auVar306._16_4_ * auVar226._16_4_;
    auVar276._20_4_ = fVar372 * auVar109._20_4_ + auVar306._20_4_ * auVar226._20_4_;
    auVar276._24_4_ = fVar374 * auVar109._24_4_ + auVar306._24_4_ * auVar226._24_4_;
    auVar276._28_4_ = fVar348 + fVar360 + fVar362;
    auVar294._0_4_ = fVar170 * auVar356._0_4_ + auVar306._0_4_ * auVar262._0_4_;
    auVar294._4_4_ = fVar205 * auVar356._4_4_ + auVar306._4_4_ * auVar262._4_4_;
    auVar294._8_4_ = fVar229 * auVar356._8_4_ + auVar306._8_4_ * auVar262._8_4_;
    auVar294._12_4_ = fVar357 * auVar356._12_4_ + auVar306._12_4_ * auVar262._12_4_;
    auVar294._16_4_ = fVar370 * auVar356._16_4_ + auVar306._16_4_ * auVar262._16_4_;
    auVar294._20_4_ = fVar372 * auVar356._20_4_ + auVar306._20_4_ * auVar262._20_4_;
    auVar294._24_4_ = fVar374 * auVar356._24_4_ + auVar306._24_4_ * auVar262._24_4_;
    auVar294._28_4_ = auVar18._28_4_ + auVar306._28_4_;
    auVar20 = vsubps_avx(auVar226,auVar109);
    auVar18 = vsubps_avx(auVar262,auVar356);
    local_240 = (float)local_6a0._0_4_ * auVar20._0_4_ * 3.0;
    fStack_23c = (float)local_6a0._4_4_ * auVar20._4_4_ * 3.0;
    auVar16._4_4_ = fStack_23c;
    auVar16._0_4_ = local_240;
    fStack_238 = fStack_698 * auVar20._8_4_ * 3.0;
    auVar16._8_4_ = fStack_238;
    fStack_234 = fStack_694 * auVar20._12_4_ * 3.0;
    auVar16._12_4_ = fStack_234;
    fStack_230 = (float)local_6a0._0_4_ * auVar20._16_4_ * 3.0;
    auVar16._16_4_ = fStack_230;
    fStack_22c = (float)local_6a0._4_4_ * auVar20._20_4_ * 3.0;
    auVar16._20_4_ = fStack_22c;
    fStack_228 = fStack_698 * auVar20._24_4_ * 3.0;
    auVar16._24_4_ = fStack_228;
    auVar16._28_4_ = auVar262._28_4_;
    local_260 = (float)local_6a0._0_4_ * auVar18._0_4_ * 3.0;
    fStack_25c = (float)local_6a0._4_4_ * auVar18._4_4_ * 3.0;
    auVar17._4_4_ = fStack_25c;
    auVar17._0_4_ = local_260;
    fStack_258 = fStack_698 * auVar18._8_4_ * 3.0;
    auVar17._8_4_ = fStack_258;
    fStack_254 = fStack_694 * auVar18._12_4_ * 3.0;
    auVar17._12_4_ = fStack_254;
    local_6a0._0_4_ = (float)local_6a0._0_4_ * auVar18._16_4_ * 3.0;
    auVar17._16_4_ = local_6a0._0_4_;
    local_6a0._4_4_ = (float)local_6a0._4_4_ * auVar18._20_4_ * 3.0;
    auVar17._20_4_ = local_6a0._4_4_;
    fStack_698 = fStack_698 * auVar18._24_4_ * 3.0;
    auVar17._24_4_ = fStack_698;
    auVar17._28_4_ = fStack_694;
    auVar20 = vperm2f128_avx(auVar276,auVar276,1);
    auVar20 = vshufps_avx(auVar20,auVar276,0x30);
    auVar109 = vshufps_avx(auVar276,auVar20,0x29);
    auVar18 = vsubps_avx(auVar276,auVar16);
    auVar20 = vperm2f128_avx(auVar18,auVar18,1);
    auVar20 = vshufps_avx(auVar20,auVar18,0x30);
    auVar16 = vshufps_avx(auVar18,auVar20,0x29);
    auVar18 = vsubps_avx(auVar294,auVar17);
    auVar20 = vperm2f128_avx(auVar18,auVar18,1);
    auVar20 = vshufps_avx(auVar20,auVar18,0x30);
    auVar17 = vshufps_avx(auVar18,auVar20,0x29);
    auVar21 = vsubps_avx(auVar276,local_1c0);
    auVar22 = vsubps_avx(auVar109,auVar108);
    fVar170 = auVar22._0_4_ + auVar21._0_4_;
    fVar171 = auVar22._4_4_ + auVar21._4_4_;
    fVar172 = auVar22._8_4_ + auVar21._8_4_;
    fVar204 = auVar22._12_4_ + auVar21._12_4_;
    fVar205 = auVar22._16_4_ + auVar21._16_4_;
    fVar206 = auVar22._20_4_ + auVar21._20_4_;
    fVar207 = auVar22._24_4_ + auVar21._24_4_;
    auVar18 = vperm2f128_avx(local_1e0,local_1e0,1);
    auVar18 = vshufps_avx(auVar18,local_1e0,0x30);
    local_200 = vshufps_avx(local_1e0,auVar18,0x29);
    auVar18 = vperm2f128_avx(auVar294,auVar294,1);
    auVar18 = vshufps_avx(auVar18,auVar294,0x30);
    auVar200 = vshufps_avx(auVar294,auVar18,0x29);
    auVar18 = vsubps_avx(auVar294,local_1e0);
    auVar226 = vsubps_avx(auVar200,local_200);
    fVar228 = auVar18._0_4_ + auVar226._0_4_;
    fVar229 = auVar18._4_4_ + auVar226._4_4_;
    fVar230 = auVar18._8_4_ + auVar226._8_4_;
    fVar340 = auVar18._12_4_ + auVar226._12_4_;
    fVar349 = auVar18._16_4_ + auVar226._16_4_;
    fVar357 = auVar18._20_4_ + auVar226._20_4_;
    fVar358 = auVar18._24_4_ + auVar226._24_4_;
    fVar359 = auVar18._28_4_;
    auVar18._4_4_ = local_1e0._4_4_ * fVar171;
    auVar18._0_4_ = local_1e0._0_4_ * fVar170;
    auVar18._8_4_ = local_1e0._8_4_ * fVar172;
    auVar18._12_4_ = local_1e0._12_4_ * fVar204;
    auVar18._16_4_ = local_1e0._16_4_ * fVar205;
    auVar18._20_4_ = local_1e0._20_4_ * fVar206;
    auVar18._24_4_ = local_1e0._24_4_ * fVar207;
    auVar18._28_4_ = fVar359;
    auVar23._4_4_ = fVar229 * local_1c0._4_4_;
    auVar23._0_4_ = fVar228 * local_1c0._0_4_;
    auVar23._8_4_ = fVar230 * local_1c0._8_4_;
    auVar23._12_4_ = fVar340 * local_1c0._12_4_;
    auVar23._16_4_ = fVar349 * local_1c0._16_4_;
    auVar23._20_4_ = fVar357 * local_1c0._20_4_;
    auVar23._24_4_ = fVar358 * local_1c0._24_4_;
    auVar23._28_4_ = auVar20._28_4_;
    auVar18 = vsubps_avx(auVar18,auVar23);
    local_220 = local_1c0._0_4_ + local_220;
    fStack_21c = local_1c0._4_4_ + fStack_21c;
    fStack_218 = local_1c0._8_4_ + fStack_218;
    fStack_214 = local_1c0._12_4_ + fStack_214;
    fStack_210 = local_1c0._16_4_ + fStack_210;
    fStack_20c = local_1c0._20_4_ + fStack_20c;
    fStack_208 = local_1c0._24_4_ + fStack_208;
    fStack_204 = local_1c0._28_4_ + auVar19._28_4_;
    fVar375 = local_1e0._0_4_ + fVar375;
    fVar383 = local_1e0._4_4_ + fVar383;
    fVar385 = local_1e0._8_4_ + fVar385;
    fVar387 = local_1e0._12_4_ + fVar387;
    fVar376 = local_1e0._16_4_ + fVar376;
    fVar384 = local_1e0._20_4_ + fVar384;
    fVar386 = local_1e0._24_4_ + fVar386;
    auVar19._4_4_ = fVar383 * fVar171;
    auVar19._0_4_ = fVar375 * fVar170;
    auVar19._8_4_ = fVar385 * fVar172;
    auVar19._12_4_ = fVar387 * fVar204;
    auVar19._16_4_ = fVar376 * fVar205;
    auVar19._20_4_ = fVar384 * fVar206;
    auVar19._24_4_ = fVar386 * fVar207;
    auVar19._28_4_ = fVar359;
    auVar24._4_4_ = fVar229 * fStack_21c;
    auVar24._0_4_ = fVar228 * local_220;
    auVar24._8_4_ = fVar230 * fStack_218;
    auVar24._12_4_ = fVar340 * fStack_214;
    auVar24._16_4_ = fVar349 * fStack_210;
    auVar24._20_4_ = fVar357 * fStack_20c;
    auVar24._24_4_ = fVar358 * fStack_208;
    auVar24._28_4_ = fStack_204;
    auVar19 = vsubps_avx(auVar19,auVar24);
    auVar25._4_4_ = auVar107._4_4_ * fVar171;
    auVar25._0_4_ = auVar107._0_4_ * fVar170;
    auVar25._8_4_ = auVar107._8_4_ * fVar172;
    auVar25._12_4_ = auVar107._12_4_ * fVar204;
    auVar25._16_4_ = auVar107._16_4_ * fVar205;
    auVar25._20_4_ = auVar107._20_4_ * fVar206;
    auVar25._24_4_ = auVar107._24_4_ * fVar207;
    auVar25._28_4_ = fVar359;
    local_660 = auVar106._0_4_;
    fStack_65c = auVar106._4_4_;
    fStack_658 = auVar106._8_4_;
    fStack_654 = auVar106._12_4_;
    fStack_650 = auVar106._16_4_;
    fStack_64c = auVar106._20_4_;
    fStack_648 = auVar106._24_4_;
    auVar26._4_4_ = fVar229 * fStack_65c;
    auVar26._0_4_ = fVar228 * local_660;
    auVar26._8_4_ = fVar230 * fStack_658;
    auVar26._12_4_ = fVar340 * fStack_654;
    auVar26._16_4_ = fVar349 * fStack_650;
    auVar26._20_4_ = fVar357 * fStack_64c;
    auVar26._24_4_ = fVar358 * fStack_648;
    auVar26._28_4_ = 0x40400000;
    auVar23 = vsubps_avx(auVar25,auVar26);
    auVar27._4_4_ = local_200._4_4_ * fVar171;
    auVar27._0_4_ = local_200._0_4_ * fVar170;
    auVar27._8_4_ = local_200._8_4_ * fVar172;
    auVar27._12_4_ = local_200._12_4_ * fVar204;
    auVar27._16_4_ = local_200._16_4_ * fVar205;
    auVar27._20_4_ = local_200._20_4_ * fVar206;
    auVar27._24_4_ = local_200._24_4_ * fVar207;
    auVar27._28_4_ = fVar359;
    auVar28._4_4_ = auVar108._4_4_ * fVar229;
    auVar28._0_4_ = auVar108._0_4_ * fVar228;
    auVar28._8_4_ = auVar108._8_4_ * fVar230;
    auVar28._12_4_ = auVar108._12_4_ * fVar340;
    auVar28._16_4_ = auVar108._16_4_ * fVar349;
    auVar28._20_4_ = auVar108._20_4_ * fVar357;
    auVar28._24_4_ = auVar108._24_4_ * fVar358;
    auVar28._28_4_ = local_200._28_4_;
    auVar24 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = auVar294._4_4_ * fVar171;
    auVar29._0_4_ = auVar294._0_4_ * fVar170;
    auVar29._8_4_ = auVar294._8_4_ * fVar172;
    auVar29._12_4_ = auVar294._12_4_ * fVar204;
    auVar29._16_4_ = auVar294._16_4_ * fVar205;
    auVar29._20_4_ = auVar294._20_4_ * fVar206;
    auVar29._24_4_ = auVar294._24_4_ * fVar207;
    auVar29._28_4_ = fVar359;
    auVar30._4_4_ = fVar229 * auVar276._4_4_;
    auVar30._0_4_ = fVar228 * auVar276._0_4_;
    auVar30._8_4_ = fVar230 * auVar276._8_4_;
    auVar30._12_4_ = fVar340 * auVar276._12_4_;
    auVar30._16_4_ = fVar349 * auVar276._16_4_;
    auVar30._20_4_ = fVar357 * auVar276._20_4_;
    auVar30._24_4_ = fVar358 * auVar276._24_4_;
    auVar30._28_4_ = auVar107._28_4_;
    auVar25 = vsubps_avx(auVar29,auVar30);
    local_240 = auVar276._0_4_ + local_240;
    fStack_23c = auVar276._4_4_ + fStack_23c;
    fStack_238 = auVar276._8_4_ + fStack_238;
    fStack_234 = auVar276._12_4_ + fStack_234;
    fStack_230 = auVar276._16_4_ + fStack_230;
    fStack_22c = auVar276._20_4_ + fStack_22c;
    fStack_228 = auVar276._24_4_ + fStack_228;
    fStack_224 = auVar276._28_4_ + auVar262._28_4_;
    local_260 = auVar294._0_4_ + local_260;
    fStack_25c = auVar294._4_4_ + fStack_25c;
    fStack_258 = auVar294._8_4_ + fStack_258;
    fStack_254 = auVar294._12_4_ + fStack_254;
    fStack_250 = auVar294._16_4_ + (float)local_6a0._0_4_;
    fStack_24c = auVar294._20_4_ + (float)local_6a0._4_4_;
    fStack_248 = auVar294._24_4_ + fStack_698;
    fStack_244 = auVar294._28_4_ + fStack_694;
    auVar31._4_4_ = fStack_25c * fVar171;
    auVar31._0_4_ = local_260 * fVar170;
    auVar31._8_4_ = fStack_258 * fVar172;
    auVar31._12_4_ = fStack_254 * fVar204;
    auVar31._16_4_ = fStack_250 * fVar205;
    auVar31._20_4_ = fStack_24c * fVar206;
    auVar31._24_4_ = fStack_248 * fVar207;
    auVar31._28_4_ = auVar294._28_4_ + fStack_694;
    auVar32._4_4_ = fStack_23c * fVar229;
    auVar32._0_4_ = local_240 * fVar228;
    auVar32._8_4_ = fStack_238 * fVar230;
    auVar32._12_4_ = fStack_234 * fVar340;
    auVar32._16_4_ = fStack_230 * fVar349;
    auVar32._20_4_ = fStack_22c * fVar357;
    auVar32._24_4_ = fStack_228 * fVar358;
    auVar32._28_4_ = fStack_224;
    auVar26 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = auVar17._4_4_ * fVar171;
    auVar33._0_4_ = auVar17._0_4_ * fVar170;
    auVar33._8_4_ = auVar17._8_4_ * fVar172;
    auVar33._12_4_ = auVar17._12_4_ * fVar204;
    auVar33._16_4_ = auVar17._16_4_ * fVar205;
    auVar33._20_4_ = auVar17._20_4_ * fVar206;
    auVar33._24_4_ = auVar17._24_4_ * fVar207;
    auVar33._28_4_ = fStack_224;
    auVar34._4_4_ = fVar229 * auVar16._4_4_;
    auVar34._0_4_ = fVar228 * auVar16._0_4_;
    auVar34._8_4_ = fVar230 * auVar16._8_4_;
    auVar34._12_4_ = fVar340 * auVar16._12_4_;
    auVar34._16_4_ = fVar349 * auVar16._16_4_;
    auVar34._20_4_ = fVar357 * auVar16._20_4_;
    auVar34._24_4_ = fVar358 * auVar16._24_4_;
    auVar34._28_4_ = auVar16._28_4_;
    auVar27 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar200._4_4_ * fVar171;
    auVar35._0_4_ = auVar200._0_4_ * fVar170;
    auVar35._8_4_ = auVar200._8_4_ * fVar172;
    auVar35._12_4_ = auVar200._12_4_ * fVar204;
    auVar35._16_4_ = auVar200._16_4_ * fVar205;
    auVar35._20_4_ = auVar200._20_4_ * fVar206;
    auVar35._24_4_ = auVar200._24_4_ * fVar207;
    auVar35._28_4_ = auVar22._28_4_ + auVar21._28_4_;
    auVar22._4_4_ = auVar109._4_4_ * fVar229;
    auVar22._0_4_ = auVar109._0_4_ * fVar228;
    auVar22._8_4_ = auVar109._8_4_ * fVar230;
    auVar22._12_4_ = auVar109._12_4_ * fVar340;
    auVar22._16_4_ = auVar109._16_4_ * fVar349;
    auVar22._20_4_ = auVar109._20_4_ * fVar357;
    auVar22._24_4_ = auVar109._24_4_ * fVar358;
    auVar22._28_4_ = fVar359 + auVar226._28_4_;
    auVar22 = vsubps_avx(auVar35,auVar22);
    auVar20 = vminps_avx(auVar18,auVar19);
    auVar106 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vminps_avx(auVar23,auVar24);
    auVar18 = vminps_avx(auVar20,auVar18);
    auVar20 = vmaxps_avx(auVar23,auVar24);
    auVar106 = vmaxps_avx(auVar106,auVar20);
    auVar19 = vminps_avx(auVar25,auVar26);
    auVar20 = vmaxps_avx(auVar25,auVar26);
    auVar21 = vminps_avx(auVar27,auVar22);
    auVar19 = vminps_avx(auVar19,auVar21);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar27,auVar22);
    auVar20 = vmaxps_avx(auVar20,auVar18);
    auVar20 = vmaxps_avx(auVar106,auVar20);
    auVar106 = vcmpps_avx(auVar19,local_280,2);
    auVar20 = vcmpps_avx(auVar20,local_2a0,5);
    auVar106 = vandps_avx(auVar20,auVar106);
    auVar20 = local_320 & auVar106;
    uVar77 = 0;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0x7f,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0xbf,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0')
    {
      auVar20 = vsubps_avx(auVar108,local_1c0);
      auVar18 = vsubps_avx(auVar109,auVar276);
      fVar171 = auVar20._0_4_ + auVar18._0_4_;
      fVar172 = auVar20._4_4_ + auVar18._4_4_;
      fVar204 = auVar20._8_4_ + auVar18._8_4_;
      fVar205 = auVar20._12_4_ + auVar18._12_4_;
      fVar206 = auVar20._16_4_ + auVar18._16_4_;
      fVar207 = auVar20._20_4_ + auVar18._20_4_;
      fVar228 = auVar20._24_4_ + auVar18._24_4_;
      auVar19 = vsubps_avx(local_200,local_1e0);
      auVar21 = vsubps_avx(auVar200,auVar294);
      fVar229 = auVar19._0_4_ + auVar21._0_4_;
      fVar230 = auVar19._4_4_ + auVar21._4_4_;
      fVar340 = auVar19._8_4_ + auVar21._8_4_;
      fVar349 = auVar19._12_4_ + auVar21._12_4_;
      fVar357 = auVar19._16_4_ + auVar21._16_4_;
      fVar358 = auVar19._20_4_ + auVar21._20_4_;
      fVar359 = auVar19._24_4_ + auVar21._24_4_;
      fVar170 = auVar21._28_4_;
      auVar36._4_4_ = local_1e0._4_4_ * fVar172;
      auVar36._0_4_ = local_1e0._0_4_ * fVar171;
      auVar36._8_4_ = local_1e0._8_4_ * fVar204;
      auVar36._12_4_ = local_1e0._12_4_ * fVar205;
      auVar36._16_4_ = local_1e0._16_4_ * fVar206;
      auVar36._20_4_ = local_1e0._20_4_ * fVar207;
      auVar36._24_4_ = local_1e0._24_4_ * fVar228;
      auVar36._28_4_ = local_1e0._28_4_;
      auVar37._4_4_ = local_1c0._4_4_ * fVar230;
      auVar37._0_4_ = local_1c0._0_4_ * fVar229;
      auVar37._8_4_ = local_1c0._8_4_ * fVar340;
      auVar37._12_4_ = local_1c0._12_4_ * fVar349;
      auVar37._16_4_ = local_1c0._16_4_ * fVar357;
      auVar37._20_4_ = local_1c0._20_4_ * fVar358;
      auVar37._24_4_ = local_1c0._24_4_ * fVar359;
      auVar37._28_4_ = local_1c0._28_4_;
      auVar21 = vsubps_avx(auVar36,auVar37);
      auVar38._4_4_ = fVar383 * fVar172;
      auVar38._0_4_ = fVar375 * fVar171;
      auVar38._8_4_ = fVar385 * fVar204;
      auVar38._12_4_ = fVar387 * fVar205;
      auVar38._16_4_ = fVar376 * fVar206;
      auVar38._20_4_ = fVar384 * fVar207;
      auVar38._24_4_ = fVar386 * fVar228;
      auVar38._28_4_ = local_1e0._28_4_;
      auVar39._4_4_ = fVar230 * fStack_21c;
      auVar39._0_4_ = fVar229 * local_220;
      auVar39._8_4_ = fVar340 * fStack_218;
      auVar39._12_4_ = fVar349 * fStack_214;
      auVar39._16_4_ = fVar357 * fStack_210;
      auVar39._20_4_ = fVar358 * fStack_20c;
      auVar39._24_4_ = fVar359 * fStack_208;
      auVar39._28_4_ = fVar170;
      auVar22 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar172 * auVar107._4_4_;
      auVar40._0_4_ = fVar171 * auVar107._0_4_;
      auVar40._8_4_ = fVar204 * auVar107._8_4_;
      auVar40._12_4_ = fVar205 * auVar107._12_4_;
      auVar40._16_4_ = fVar206 * auVar107._16_4_;
      auVar40._20_4_ = fVar207 * auVar107._20_4_;
      auVar40._24_4_ = fVar228 * auVar107._24_4_;
      auVar40._28_4_ = fVar170;
      auVar41._4_4_ = fVar230 * fStack_65c;
      auVar41._0_4_ = fVar229 * local_660;
      auVar41._8_4_ = fVar340 * fStack_658;
      auVar41._12_4_ = fVar349 * fStack_654;
      auVar41._16_4_ = fVar357 * fStack_650;
      auVar41._20_4_ = fVar358 * fStack_64c;
      auVar41._24_4_ = fVar359 * fStack_648;
      auVar41._28_4_ = local_1e0._28_4_ + auVar225._28_4_;
      auVar107 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = local_200._4_4_ * fVar172;
      auVar42._0_4_ = local_200._0_4_ * fVar171;
      auVar42._8_4_ = local_200._8_4_ * fVar204;
      auVar42._12_4_ = local_200._12_4_ * fVar205;
      auVar42._16_4_ = local_200._16_4_ * fVar206;
      auVar42._20_4_ = local_200._20_4_ * fVar207;
      auVar42._24_4_ = local_200._24_4_ * fVar228;
      auVar42._28_4_ = local_1e0._28_4_ + auVar225._28_4_;
      auVar43._4_4_ = auVar108._4_4_ * fVar230;
      auVar43._0_4_ = auVar108._0_4_ * fVar229;
      auVar43._8_4_ = auVar108._8_4_ * fVar340;
      auVar43._12_4_ = auVar108._12_4_ * fVar349;
      auVar43._16_4_ = auVar108._16_4_ * fVar357;
      auVar43._20_4_ = auVar108._20_4_ * fVar358;
      uVar4 = auVar108._28_4_;
      auVar43._24_4_ = auVar108._24_4_ * fVar359;
      auVar43._28_4_ = uVar4;
      auVar108 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = auVar294._4_4_ * fVar172;
      auVar44._0_4_ = auVar294._0_4_ * fVar171;
      auVar44._8_4_ = auVar294._8_4_ * fVar204;
      auVar44._12_4_ = auVar294._12_4_ * fVar205;
      auVar44._16_4_ = auVar294._16_4_ * fVar206;
      auVar44._20_4_ = auVar294._20_4_ * fVar207;
      auVar44._24_4_ = auVar294._24_4_ * fVar228;
      auVar44._28_4_ = auVar294._28_4_;
      auVar45._4_4_ = auVar276._4_4_ * fVar230;
      auVar45._0_4_ = auVar276._0_4_ * fVar229;
      auVar45._8_4_ = auVar276._8_4_ * fVar340;
      auVar45._12_4_ = auVar276._12_4_ * fVar349;
      auVar45._16_4_ = auVar276._16_4_ * fVar357;
      auVar45._20_4_ = auVar276._20_4_ * fVar358;
      auVar45._24_4_ = auVar276._24_4_ * fVar359;
      auVar45._28_4_ = auVar276._28_4_;
      auVar226 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar172 * fStack_25c;
      auVar46._0_4_ = fVar171 * local_260;
      auVar46._8_4_ = fVar204 * fStack_258;
      auVar46._12_4_ = fVar205 * fStack_254;
      auVar46._16_4_ = fVar206 * fStack_250;
      auVar46._20_4_ = fVar207 * fStack_24c;
      auVar46._24_4_ = fVar228 * fStack_248;
      auVar46._28_4_ = auVar294._28_4_;
      auVar47._4_4_ = fVar230 * fStack_23c;
      auVar47._0_4_ = fVar229 * local_240;
      auVar47._8_4_ = fVar340 * fStack_238;
      auVar47._12_4_ = fVar349 * fStack_234;
      auVar47._16_4_ = fVar357 * fStack_230;
      auVar47._20_4_ = fVar358 * fStack_22c;
      auVar47._24_4_ = fVar359 * fStack_228;
      auVar47._28_4_ = uVar4;
      auVar23 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar172 * auVar17._4_4_;
      auVar48._0_4_ = fVar171 * auVar17._0_4_;
      auVar48._8_4_ = fVar204 * auVar17._8_4_;
      auVar48._12_4_ = fVar205 * auVar17._12_4_;
      auVar48._16_4_ = fVar206 * auVar17._16_4_;
      auVar48._20_4_ = fVar207 * auVar17._20_4_;
      auVar48._24_4_ = fVar228 * auVar17._24_4_;
      auVar48._28_4_ = uVar4;
      auVar49._4_4_ = fVar230 * auVar16._4_4_;
      auVar49._0_4_ = fVar229 * auVar16._0_4_;
      auVar49._8_4_ = fVar340 * auVar16._8_4_;
      auVar49._12_4_ = fVar349 * auVar16._12_4_;
      auVar49._16_4_ = fVar357 * auVar16._16_4_;
      auVar49._20_4_ = fVar358 * auVar16._20_4_;
      auVar49._24_4_ = fVar359 * auVar16._24_4_;
      auVar49._28_4_ = local_200._28_4_;
      auVar16 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = auVar200._4_4_ * fVar172;
      auVar50._0_4_ = auVar200._0_4_ * fVar171;
      auVar50._8_4_ = auVar200._8_4_ * fVar204;
      auVar50._12_4_ = auVar200._12_4_ * fVar205;
      auVar50._16_4_ = auVar200._16_4_ * fVar206;
      auVar50._20_4_ = auVar200._20_4_ * fVar207;
      auVar50._24_4_ = auVar200._24_4_ * fVar228;
      auVar50._28_4_ = auVar20._28_4_ + auVar18._28_4_;
      auVar51._4_4_ = auVar109._4_4_ * fVar230;
      auVar51._0_4_ = auVar109._0_4_ * fVar229;
      auVar51._8_4_ = auVar109._8_4_ * fVar340;
      auVar51._12_4_ = auVar109._12_4_ * fVar349;
      auVar51._16_4_ = auVar109._16_4_ * fVar357;
      auVar51._20_4_ = auVar109._20_4_ * fVar358;
      auVar51._24_4_ = auVar109._24_4_ * fVar359;
      auVar51._28_4_ = auVar19._28_4_ + fVar170;
      auVar109 = vsubps_avx(auVar50,auVar51);
      auVar18 = vminps_avx(auVar21,auVar22);
      auVar20 = vmaxps_avx(auVar21,auVar22);
      auVar19 = vminps_avx(auVar107,auVar108);
      auVar19 = vminps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar107,auVar108);
      auVar20 = vmaxps_avx(auVar20,auVar18);
      auVar21 = vminps_avx(auVar226,auVar23);
      auVar18 = vmaxps_avx(auVar226,auVar23);
      auVar107 = vminps_avx(auVar16,auVar109);
      auVar21 = vminps_avx(auVar21,auVar107);
      auVar21 = vminps_avx(auVar19,auVar21);
      auVar19 = vmaxps_avx(auVar16,auVar109);
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar20,auVar18);
      auVar20 = vcmpps_avx(auVar21,local_280,2);
      auVar18 = vcmpps_avx(auVar18,local_2a0,5);
      auVar20 = vandps_avx(auVar18,auVar20);
      auVar106 = vandps_avx(auVar106,local_320);
      auVar18 = auVar106 & auVar20;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar106 = vandps_avx(auVar20,auVar106);
        uVar77 = vmovmskps_avx(auVar106);
      }
    }
    if (uVar77 != 0) {
      auStack_470[uVar82] = uVar77;
      uVar5 = vmovlps_avx(local_3e0);
      *(undefined8 *)(afStack_300 + uVar82 * 2) = uVar5;
      uVar6 = vmovlps_avx(local_6d0);
      auStack_1a0[uVar82] = uVar6;
      uVar82 = (ulong)((int)uVar82 + 1);
    }
    auVar382 = ZEXT464(0) << 0x20;
    do {
      if ((int)uVar82 == 0) {
        if (bVar74) {
          return local_711;
        }
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar105._4_4_ = uVar4;
        auVar105._0_4_ = uVar4;
        auVar105._8_4_ = uVar4;
        auVar105._12_4_ = uVar4;
        auVar129 = vcmpps_avx(local_3f0,auVar105,2);
        uVar76 = vmovmskps_avx(auVar129);
        uVar75 = uVar75 & local_508 & uVar76;
        local_711 = uVar75 != 0;
        if (!local_711) {
          return local_711;
        }
        goto LAB_0106418d;
      }
      uVar81 = (int)uVar82 - 1;
      uVar83 = (ulong)uVar81;
      uVar77 = auStack_470[uVar83];
      fVar170 = afStack_300[uVar83 * 2];
      fVar171 = afStack_300[uVar83 * 2 + 1];
      local_6d0._8_8_ = 0;
      local_6d0._0_8_ = auStack_1a0[uVar83];
      uVar6 = 0;
      if (uVar77 != 0) {
        for (; (uVar77 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      uVar77 = uVar77 - 1 & uVar77;
      auStack_470[uVar83] = uVar77;
      if (uVar77 == 0) {
        uVar82 = (ulong)uVar81;
      }
      auVar236._8_4_ = 0x3f800000;
      auVar236._0_8_ = &DAT_3f8000003f800000;
      auVar236._12_4_ = 0x3f800000;
      fVar204 = (float)(uVar6 + 1) * 0.14285715;
      fVar172 = (1.0 - (float)uVar6 * 0.14285715) * fVar170 + fVar171 * (float)uVar6 * 0.14285715;
      fVar170 = (1.0 - fVar204) * fVar170 + fVar171 * fVar204;
      fVar171 = fVar170 - fVar172;
      if (0.16666667 <= fVar171) break;
      auVar129 = vshufps_avx(local_6d0,local_6d0,0x50);
      auVar179 = vsubps_avx(auVar236,auVar129);
      fVar204 = auVar129._0_4_;
      fVar205 = auVar129._4_4_;
      fVar206 = auVar129._8_4_;
      fVar207 = auVar129._12_4_;
      fVar228 = auVar179._0_4_;
      fVar229 = auVar179._4_4_;
      fVar230 = auVar179._8_4_;
      fVar340 = auVar179._12_4_;
      auVar189._0_4_ = auVar284._0_4_ * fVar204 + fVar228 * (float)local_5c0._0_4_;
      auVar189._4_4_ = auVar284._4_4_ * fVar205 + fVar229 * (float)local_5c0._4_4_;
      auVar189._8_4_ = auVar284._0_4_ * fVar206 + fVar230 * (float)local_5c0._0_4_;
      auVar189._12_4_ = auVar284._4_4_ * fVar207 + fVar340 * (float)local_5c0._4_4_;
      auVar218._0_4_ = auVar297._0_4_ * fVar204 + fVar228 * (float)local_480._0_4_;
      auVar218._4_4_ = auVar297._4_4_ * fVar205 + fVar229 * (float)local_480._4_4_;
      auVar218._8_4_ = auVar297._0_4_ * fVar206 + fVar230 * fStack_478;
      auVar218._12_4_ = auVar297._4_4_ * fVar207 + fVar340 * fStack_474;
      auVar237._0_4_ = auVar310._0_4_ * fVar204 + fVar228 * auVar366._0_4_;
      auVar237._4_4_ = auVar310._4_4_ * fVar205 + fVar229 * auVar366._4_4_;
      auVar237._8_4_ = auVar310._0_4_ * fVar206 + fVar230 * auVar366._0_4_;
      auVar237._12_4_ = auVar310._4_4_ * fVar207 + fVar340 * auVar366._4_4_;
      auVar125._0_4_ = auVar101._0_4_ * fVar204 + auVar123._0_4_ * fVar228;
      auVar125._4_4_ = auVar101._4_4_ * fVar205 + auVar123._4_4_ * fVar229;
      auVar125._8_4_ = auVar101._0_4_ * fVar206 + auVar123._0_4_ * fVar230;
      auVar125._12_4_ = auVar101._4_4_ * fVar207 + auVar123._4_4_ * fVar340;
      auVar165._16_16_ = auVar189;
      auVar165._0_16_ = auVar189;
      auVar201._16_16_ = auVar218;
      auVar201._0_16_ = auVar218;
      auVar227._16_16_ = auVar237;
      auVar227._0_16_ = auVar237;
      auVar106 = vshufps_avx(ZEXT2032(CONCAT416(fVar170,ZEXT416((uint)fVar172))),
                             ZEXT2032(CONCAT416(fVar170,ZEXT416((uint)fVar172))),0);
      auVar20 = vsubps_avx(auVar201,auVar165);
      fVar204 = auVar106._0_4_;
      fVar205 = auVar106._4_4_;
      fVar206 = auVar106._8_4_;
      fVar207 = auVar106._12_4_;
      fVar228 = auVar106._16_4_;
      fVar229 = auVar106._20_4_;
      fVar230 = auVar106._24_4_;
      auVar166._0_4_ = auVar189._0_4_ + auVar20._0_4_ * fVar204;
      auVar166._4_4_ = auVar189._4_4_ + auVar20._4_4_ * fVar205;
      auVar166._8_4_ = auVar189._8_4_ + auVar20._8_4_ * fVar206;
      auVar166._12_4_ = auVar189._12_4_ + auVar20._12_4_ * fVar207;
      auVar166._16_4_ = auVar189._0_4_ + auVar20._16_4_ * fVar228;
      auVar166._20_4_ = auVar189._4_4_ + auVar20._20_4_ * fVar229;
      auVar166._24_4_ = auVar189._8_4_ + auVar20._24_4_ * fVar230;
      auVar166._28_4_ = auVar189._12_4_ + auVar20._28_4_;
      auVar20 = vsubps_avx(auVar227,auVar201);
      auVar202._0_4_ = auVar218._0_4_ + auVar20._0_4_ * fVar204;
      auVar202._4_4_ = auVar218._4_4_ + auVar20._4_4_ * fVar205;
      auVar202._8_4_ = auVar218._8_4_ + auVar20._8_4_ * fVar206;
      auVar202._12_4_ = auVar218._12_4_ + auVar20._12_4_ * fVar207;
      auVar202._16_4_ = auVar218._0_4_ + auVar20._16_4_ * fVar228;
      auVar202._20_4_ = auVar218._4_4_ + auVar20._20_4_ * fVar229;
      auVar202._24_4_ = auVar218._8_4_ + auVar20._24_4_ * fVar230;
      auVar202._28_4_ = auVar218._12_4_ + auVar20._28_4_;
      auVar129 = vsubps_avx(auVar125,auVar237);
      auVar138._0_4_ = auVar237._0_4_ + auVar129._0_4_ * fVar204;
      auVar138._4_4_ = auVar237._4_4_ + auVar129._4_4_ * fVar205;
      auVar138._8_4_ = auVar237._8_4_ + auVar129._8_4_ * fVar206;
      auVar138._12_4_ = auVar237._12_4_ + auVar129._12_4_ * fVar207;
      auVar138._16_4_ = auVar237._0_4_ + auVar129._0_4_ * fVar228;
      auVar138._20_4_ = auVar237._4_4_ + auVar129._4_4_ * fVar229;
      auVar138._24_4_ = auVar237._8_4_ + auVar129._8_4_ * fVar230;
      auVar138._28_4_ = auVar237._12_4_ + auVar129._12_4_;
      auVar20 = vsubps_avx(auVar202,auVar166);
      auVar167._0_4_ = auVar166._0_4_ + fVar204 * auVar20._0_4_;
      auVar167._4_4_ = auVar166._4_4_ + fVar205 * auVar20._4_4_;
      auVar167._8_4_ = auVar166._8_4_ + fVar206 * auVar20._8_4_;
      auVar167._12_4_ = auVar166._12_4_ + fVar207 * auVar20._12_4_;
      auVar167._16_4_ = auVar166._16_4_ + fVar228 * auVar20._16_4_;
      auVar167._20_4_ = auVar166._20_4_ + fVar229 * auVar20._20_4_;
      auVar167._24_4_ = auVar166._24_4_ + fVar230 * auVar20._24_4_;
      auVar167._28_4_ = auVar166._28_4_ + auVar20._28_4_;
      auVar20 = vsubps_avx(auVar138,auVar202);
      auVar139._0_4_ = auVar202._0_4_ + fVar204 * auVar20._0_4_;
      auVar139._4_4_ = auVar202._4_4_ + fVar205 * auVar20._4_4_;
      auVar139._8_4_ = auVar202._8_4_ + fVar206 * auVar20._8_4_;
      auVar139._12_4_ = auVar202._12_4_ + fVar207 * auVar20._12_4_;
      auVar139._16_4_ = auVar202._16_4_ + fVar228 * auVar20._16_4_;
      auVar139._20_4_ = auVar202._20_4_ + fVar229 * auVar20._20_4_;
      auVar139._24_4_ = auVar202._24_4_ + fVar230 * auVar20._24_4_;
      auVar139._28_4_ = auVar202._28_4_ + auVar20._28_4_;
      auVar20 = vsubps_avx(auVar139,auVar167);
      auVar190._0_4_ = auVar167._0_4_ + fVar204 * auVar20._0_4_;
      auVar190._4_4_ = auVar167._4_4_ + fVar205 * auVar20._4_4_;
      auVar190._8_4_ = auVar167._8_4_ + fVar206 * auVar20._8_4_;
      auVar190._12_4_ = auVar167._12_4_ + fVar207 * auVar20._12_4_;
      auVar203._16_4_ = auVar167._16_4_ + fVar228 * auVar20._16_4_;
      auVar203._0_16_ = auVar190;
      auVar203._20_4_ = auVar167._20_4_ + fVar229 * auVar20._20_4_;
      auVar203._24_4_ = auVar167._24_4_ + fVar230 * auVar20._24_4_;
      auVar203._28_4_ = auVar167._28_4_ + auVar202._28_4_;
      fVar204 = auVar20._4_4_ * 3.0;
      auVar158 = auVar203._16_16_;
      auVar128 = vshufps_avx(ZEXT416((uint)(fVar171 * 0.33333334)),
                             ZEXT416((uint)(fVar171 * 0.33333334)),0);
      auVar298._0_4_ = auVar190._0_4_ + auVar128._0_4_ * auVar20._0_4_ * 3.0;
      auVar298._4_4_ = auVar190._4_4_ + auVar128._4_4_ * fVar204;
      auVar298._8_4_ = auVar190._8_4_ + auVar128._8_4_ * auVar20._8_4_ * 3.0;
      auVar298._12_4_ = auVar190._12_4_ + auVar128._12_4_ * auVar20._12_4_ * 3.0;
      auVar244 = vshufpd_avx(auVar190,auVar190,3);
      auVar196 = vshufpd_avx(auVar158,auVar158,3);
      auVar129 = vsubps_avx(auVar244,auVar190);
      auVar179 = vsubps_avx(auVar196,auVar158);
      auVar126._0_4_ = auVar129._0_4_ + auVar179._0_4_;
      auVar126._4_4_ = auVar129._4_4_ + auVar179._4_4_;
      auVar126._8_4_ = auVar129._8_4_ + auVar179._8_4_;
      auVar126._12_4_ = auVar129._12_4_ + auVar179._12_4_;
      auVar129 = vmovshdup_avx(auVar190);
      auVar179 = vmovshdup_avx(auVar298);
      auVar195 = vshufps_avx(auVar126,auVar126,0);
      auVar103 = vshufps_avx(auVar126,auVar126,0x55);
      fVar229 = auVar103._0_4_;
      fVar230 = auVar103._4_4_;
      fVar340 = auVar103._8_4_;
      fVar349 = auVar103._12_4_;
      fVar205 = auVar195._0_4_;
      fVar206 = auVar195._4_4_;
      fVar207 = auVar195._8_4_;
      fVar228 = auVar195._12_4_;
      auVar285._0_4_ = fVar205 * auVar190._0_4_ + fVar229 * auVar129._0_4_;
      auVar285._4_4_ = fVar206 * auVar190._4_4_ + fVar230 * auVar129._4_4_;
      auVar285._8_4_ = fVar207 * auVar190._8_4_ + fVar340 * auVar129._8_4_;
      auVar285._12_4_ = fVar228 * auVar190._12_4_ + fVar349 * auVar129._12_4_;
      auVar299._0_4_ = auVar298._0_4_ * fVar205 + fVar229 * auVar179._0_4_;
      auVar299._4_4_ = auVar298._4_4_ * fVar206 + fVar230 * auVar179._4_4_;
      auVar299._8_4_ = auVar298._8_4_ * fVar207 + fVar340 * auVar179._8_4_;
      auVar299._12_4_ = auVar298._12_4_ * fVar228 + fVar349 * auVar179._12_4_;
      auVar179 = vshufps_avx(auVar285,auVar285,0xe8);
      auVar195 = vshufps_avx(auVar299,auVar299,0xe8);
      auVar129 = vcmpps_avx(auVar179,auVar195,1);
      uVar77 = vextractps_avx(auVar129,0);
      auVar103 = auVar299;
      if ((uVar77 & 1) == 0) {
        auVar103 = auVar285;
      }
      auVar127._0_4_ = auVar128._0_4_ * auVar20._16_4_ * 3.0;
      auVar127._4_4_ = auVar128._4_4_ * fVar204;
      auVar127._8_4_ = auVar128._8_4_ * auVar20._24_4_ * 3.0;
      auVar127._12_4_ = auVar128._12_4_ * auVar106._28_4_;
      auVar86 = vsubps_avx(auVar158,auVar127);
      auVar128 = vmovshdup_avx(auVar86);
      auVar158 = vmovshdup_avx(auVar158);
      fVar204 = auVar86._0_4_;
      fVar357 = auVar86._4_4_;
      auVar379._0_4_ = fVar205 * fVar204 + fVar229 * auVar128._0_4_;
      auVar379._4_4_ = fVar206 * fVar357 + fVar230 * auVar128._4_4_;
      auVar379._8_4_ = fVar207 * auVar86._8_4_ + fVar340 * auVar128._8_4_;
      auVar379._12_4_ = fVar228 * auVar86._12_4_ + fVar349 * auVar128._12_4_;
      auVar353._0_4_ = fVar205 * auVar203._16_4_ + fVar229 * auVar158._0_4_;
      auVar353._4_4_ = fVar206 * auVar203._20_4_ + fVar230 * auVar158._4_4_;
      auVar353._8_4_ = fVar207 * auVar203._24_4_ + fVar340 * auVar158._8_4_;
      auVar353._12_4_ = fVar228 * auVar203._28_4_ + fVar349 * auVar158._12_4_;
      auVar158 = vshufps_avx(auVar379,auVar379,0xe8);
      auVar273 = vshufps_avx(auVar353,auVar353,0xe8);
      auVar128 = vcmpps_avx(auVar158,auVar273,1);
      uVar77 = vextractps_avx(auVar128,0);
      auVar87 = auVar353;
      if ((uVar77 & 1) == 0) {
        auVar87 = auVar379;
      }
      auVar103 = vmaxss_avx(auVar87,auVar103);
      auVar179 = vminps_avx(auVar179,auVar195);
      auVar195 = vminps_avx(auVar158,auVar273);
      auVar195 = vminps_avx(auVar179,auVar195);
      auVar129 = vshufps_avx(auVar129,auVar129,0x55);
      auVar129 = vblendps_avx(auVar129,auVar128,2);
      auVar128 = vpslld_avx(auVar129,0x1f);
      auVar129 = vshufpd_avx(auVar299,auVar299,1);
      auVar129 = vinsertps_avx(auVar129,auVar353,0x9c);
      auVar179 = vshufpd_avx(auVar285,auVar285,1);
      auVar179 = vinsertps_avx(auVar179,auVar379,0x9c);
      auVar129 = vblendvps_avx(auVar179,auVar129,auVar128);
      auVar179 = vmovshdup_avx(auVar129);
      auVar129 = vmaxss_avx(auVar179,auVar129);
      fVar207 = auVar195._0_4_;
      auVar179 = vmovshdup_avx(auVar195);
      fVar206 = auVar129._0_4_;
      fVar228 = auVar179._0_4_;
      fVar205 = auVar103._0_4_;
      if ((0.0001 <= fVar207) || (fVar206 <= -0.0001)) {
        if ((-0.0001 < fVar205 && fVar228 < 0.0001) ||
           ((fVar207 < 0.0001 && -0.0001 < fVar205 || (fVar228 < 0.0001 && -0.0001 < fVar206))))
        goto LAB_0106587c;
LAB_01066484:
        bVar52 = true;
        auVar382 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_0106587c:
        auVar382 = ZEXT464(0) << 0x20;
        auVar128 = vcmpps_avx(auVar195,ZEXT416(0) << 0x20,1);
        auVar179 = vcmpss_avx(auVar103,ZEXT416(0),1);
        auVar367._8_4_ = 0x3f800000;
        auVar367._0_8_ = &DAT_3f8000003f800000;
        auVar367._12_4_ = 0x3f800000;
        auVar238._8_4_ = 0xbf800000;
        auVar238._0_8_ = 0xbf800000bf800000;
        auVar238._12_4_ = 0xbf800000;
        auVar179 = vblendvps_avx(auVar367,auVar238,auVar179);
        auVar128 = vblendvps_avx(auVar367,auVar238,auVar128);
        auVar158 = vcmpss_avx(auVar179,auVar128,4);
        auVar158 = vpshufd_avx(ZEXT416(auVar158._0_4_ & 1),0x50);
        auVar158 = vpslld_avx(auVar158,0x1f);
        auVar158 = vpsrad_avx(auVar158,0x1f);
        auVar158 = vpandn_avx(auVar158,_DAT_02020eb0);
        auVar273 = vmovshdup_avx(auVar128);
        fVar229 = auVar273._0_4_;
        if ((auVar128._0_4_ != fVar229) || (NAN(auVar128._0_4_) || NAN(fVar229))) {
          if ((fVar228 != fVar207) || (NAN(fVar228) || NAN(fVar207))) {
            fVar207 = -fVar207 / (fVar228 - fVar207);
            auVar128 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar207) * 0.0 + fVar207)));
          }
          else {
            auVar128 = vcmpss_avx(auVar195,ZEXT416(0),0);
            auVar128 = vpshufd_avx(ZEXT416(auVar128._0_4_ & 1),0x50);
            auVar128 = vpslld_avx(auVar128,0x1f);
            auVar128 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar128);
          }
          auVar273 = vcmpps_avx(auVar158,auVar128,1);
          auVar195 = vblendps_avx(auVar158,auVar128,2);
          auVar128 = vblendps_avx(auVar128,auVar158,2);
          auVar158 = vblendvps_avx(auVar128,auVar195,auVar273);
        }
        auVar129 = vcmpss_avx(auVar129,ZEXT416(0),1);
        auVar159._8_4_ = 0xbf800000;
        auVar159._0_8_ = 0xbf800000bf800000;
        auVar159._12_4_ = 0xbf800000;
        auVar129 = vblendvps_avx(auVar367,auVar159,auVar129);
        fVar207 = auVar129._0_4_;
        if ((auVar179._0_4_ != fVar207) || (NAN(auVar179._0_4_) || NAN(fVar207))) {
          if ((fVar206 != fVar205) || (NAN(fVar206) || NAN(fVar205))) {
            fVar205 = -fVar205 / (fVar206 - fVar205);
            auVar129 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar205) * 0.0 + fVar205)));
          }
          else {
            auVar129 = vcmpss_avx(auVar103,ZEXT416(0),0);
            auVar129 = vpshufd_avx(ZEXT416(auVar129._0_4_ & 1),0x50);
            auVar129 = vpslld_avx(auVar129,0x1f);
            auVar129 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar129);
          }
          auVar128 = vcmpps_avx(auVar158,auVar129,1);
          auVar179 = vblendps_avx(auVar158,auVar129,2);
          auVar129 = vblendps_avx(auVar129,auVar158,2);
          auVar158 = vblendvps_avx(auVar129,auVar179,auVar128);
        }
        if ((fVar229 != fVar207) || (NAN(fVar229) || NAN(fVar207))) {
          auVar129 = vcmpps_avx(auVar158,auVar367,1);
          auVar179 = vinsertps_avx(auVar158,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar239._4_12_ = auVar158._4_12_;
          auVar239._0_4_ = 0x3f800000;
          auVar158 = vblendvps_avx(auVar239,auVar179,auVar129);
        }
        auVar129 = vcmpps_avx(auVar158,_DAT_01fec6f0,1);
        auVar55._12_4_ = 0;
        auVar55._0_12_ = auVar158._4_12_;
        auVar179 = vinsertps_avx(auVar158,ZEXT416(0x3f800000),0x10);
        auVar129 = vblendvps_avx(auVar179,auVar55 << 0x20,auVar129);
        auVar179 = vmovshdup_avx(auVar129);
        bVar52 = true;
        if (auVar129._0_4_ <= auVar179._0_4_) {
          auVar130._0_4_ = auVar129._0_4_ + -0.1;
          auVar130._4_4_ = auVar129._4_4_ + 0.1;
          auVar130._8_4_ = auVar129._8_4_ + 0.0;
          auVar130._12_4_ = auVar129._12_4_ + 0.0;
          auVar128 = vshufpd_avx(auVar298,auVar298,3);
          auVar191._8_8_ = 0x3f80000000000000;
          auVar191._0_8_ = 0x3f80000000000000;
          auVar129 = vcmpps_avx(auVar130,auVar191,1);
          auVar56._12_4_ = 0;
          auVar56._0_12_ = auVar130._4_12_;
          auVar179 = vinsertps_avx(auVar130,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar129 = vblendvps_avx(auVar179,auVar56 << 0x20,auVar129);
          auVar179 = vshufpd_avx(auVar86,auVar86,3);
          auVar195 = vshufps_avx(auVar129,auVar129,0x50);
          auVar103 = vsubps_avx(auVar367,auVar195);
          local_640 = auVar244._0_4_;
          fStack_63c = auVar244._4_4_;
          fStack_638 = auVar244._8_4_;
          fStack_634 = auVar244._12_4_;
          fVar205 = auVar195._0_4_;
          fVar206 = auVar195._4_4_;
          fVar207 = auVar195._8_4_;
          fVar228 = auVar195._12_4_;
          local_680 = auVar196._0_4_;
          fStack_67c = auVar196._4_4_;
          fStack_678 = auVar196._8_4_;
          fStack_674 = auVar196._12_4_;
          fVar229 = auVar103._0_4_;
          fVar230 = auVar103._4_4_;
          fVar340 = auVar103._8_4_;
          fVar349 = auVar103._12_4_;
          auVar160._0_4_ = fVar205 * local_640 + fVar229 * auVar190._0_4_;
          auVar160._4_4_ = fVar206 * fStack_63c + fVar230 * auVar190._4_4_;
          auVar160._8_4_ = fVar207 * fStack_638 + fVar340 * auVar190._0_4_;
          auVar160._12_4_ = fVar228 * fStack_634 + fVar349 * auVar190._4_4_;
          auVar219._0_4_ = fVar205 * auVar128._0_4_ + fVar229 * auVar298._0_4_;
          auVar219._4_4_ = fVar206 * auVar128._4_4_ + fVar230 * auVar298._4_4_;
          auVar219._8_4_ = fVar207 * auVar128._8_4_ + fVar340 * auVar298._0_4_;
          auVar219._12_4_ = fVar228 * auVar128._12_4_ + fVar349 * auVar298._4_4_;
          auVar274._0_4_ = fVar205 * auVar179._0_4_ + fVar229 * fVar204;
          auVar274._4_4_ = fVar206 * auVar179._4_4_ + fVar230 * fVar357;
          auVar274._8_4_ = fVar207 * auVar179._8_4_ + fVar340 * fVar204;
          auVar274._12_4_ = fVar228 * auVar179._12_4_ + fVar349 * fVar357;
          auVar286._0_4_ = fVar205 * local_680 + fVar229 * auVar203._16_4_;
          auVar286._4_4_ = fVar206 * fStack_67c + fVar230 * auVar203._20_4_;
          auVar286._8_4_ = fVar207 * fStack_678 + fVar340 * auVar203._16_4_;
          auVar286._12_4_ = fVar228 * fStack_674 + fVar349 * auVar203._20_4_;
          auVar196 = vsubps_avx(auVar367,auVar129);
          auVar179 = vmovshdup_avx(local_6d0);
          auVar244 = vmovsldup_avx(local_6d0);
          local_6d0._0_4_ = auVar196._0_4_ * auVar244._0_4_ + auVar179._0_4_ * auVar129._0_4_;
          local_6d0._4_4_ = auVar196._4_4_ * auVar244._4_4_ + auVar179._4_4_ * auVar129._4_4_;
          local_6d0._8_4_ = auVar196._8_4_ * auVar244._8_4_ + auVar179._8_4_ * auVar129._8_4_;
          local_6d0._12_4_ = auVar196._12_4_ * auVar244._12_4_ + auVar179._12_4_ * auVar129._12_4_;
          auVar86 = vmovshdup_avx(local_6d0);
          auVar129 = vsubps_avx(auVar219,auVar160);
          auVar240._0_4_ = auVar129._0_4_ * 3.0;
          auVar240._4_4_ = auVar129._4_4_ * 3.0;
          auVar240._8_4_ = auVar129._8_4_ * 3.0;
          auVar240._12_4_ = auVar129._12_4_ * 3.0;
          auVar129 = vsubps_avx(auVar274,auVar219);
          auVar258._0_4_ = auVar129._0_4_ * 3.0;
          auVar258._4_4_ = auVar129._4_4_ * 3.0;
          auVar258._8_4_ = auVar129._8_4_ * 3.0;
          auVar258._12_4_ = auVar129._12_4_ * 3.0;
          auVar129 = vsubps_avx(auVar286,auVar274);
          auVar300._0_4_ = auVar129._0_4_ * 3.0;
          auVar300._4_4_ = auVar129._4_4_ * 3.0;
          auVar300._8_4_ = auVar129._8_4_ * 3.0;
          auVar300._12_4_ = auVar129._12_4_ * 3.0;
          auVar179 = vminps_avx(auVar258,auVar300);
          auVar129 = vmaxps_avx(auVar258,auVar300);
          auVar179 = vminps_avx(auVar240,auVar179);
          auVar129 = vmaxps_avx(auVar240,auVar129);
          auVar244 = vshufpd_avx(auVar179,auVar179,3);
          auVar196 = vshufpd_avx(auVar129,auVar129,3);
          auVar179 = vminps_avx(auVar179,auVar244);
          auVar129 = vmaxps_avx(auVar129,auVar196);
          auVar244 = vshufps_avx(ZEXT416((uint)(1.0 / fVar171)),ZEXT416((uint)(1.0 / fVar171)),0);
          auVar241._0_4_ = auVar244._0_4_ * auVar179._0_4_;
          auVar241._4_4_ = auVar244._4_4_ * auVar179._4_4_;
          auVar241._8_4_ = auVar244._8_4_ * auVar179._8_4_;
          auVar241._12_4_ = auVar244._12_4_ * auVar179._12_4_;
          auVar259._0_4_ = auVar129._0_4_ * auVar244._0_4_;
          auVar259._4_4_ = auVar129._4_4_ * auVar244._4_4_;
          auVar259._8_4_ = auVar129._8_4_ * auVar244._8_4_;
          auVar259._12_4_ = auVar129._12_4_ * auVar244._12_4_;
          auVar103 = ZEXT416((uint)(1.0 / (auVar86._0_4_ - local_6d0._0_4_)));
          auVar129 = vshufpd_avx(auVar160,auVar160,3);
          auVar179 = vshufpd_avx(auVar219,auVar219,3);
          auVar244 = vshufpd_avx(auVar274,auVar274,3);
          auVar196 = vshufpd_avx(auVar286,auVar286,3);
          auVar129 = vsubps_avx(auVar129,auVar160);
          auVar128 = vsubps_avx(auVar179,auVar219);
          auVar195 = vsubps_avx(auVar244,auVar274);
          auVar196 = vsubps_avx(auVar196,auVar286);
          auVar179 = vminps_avx(auVar129,auVar128);
          auVar129 = vmaxps_avx(auVar129,auVar128);
          auVar244 = vminps_avx(auVar195,auVar196);
          auVar244 = vminps_avx(auVar179,auVar244);
          auVar179 = vmaxps_avx(auVar195,auVar196);
          auVar129 = vmaxps_avx(auVar129,auVar179);
          auVar179 = vshufps_avx(auVar103,auVar103,0);
          auVar311._0_4_ = auVar179._0_4_ * auVar244._0_4_;
          auVar311._4_4_ = auVar179._4_4_ * auVar244._4_4_;
          auVar311._8_4_ = auVar179._8_4_ * auVar244._8_4_;
          auVar311._12_4_ = auVar179._12_4_ * auVar244._12_4_;
          auVar322._0_4_ = auVar179._0_4_ * auVar129._0_4_;
          auVar322._4_4_ = auVar179._4_4_ * auVar129._4_4_;
          auVar322._8_4_ = auVar179._8_4_ * auVar129._8_4_;
          auVar322._12_4_ = auVar179._12_4_ * auVar129._12_4_;
          auVar129 = vmovsldup_avx(local_6d0);
          auVar275._4_12_ = auVar129._4_12_;
          auVar275._0_4_ = fVar172;
          auVar287._4_12_ = local_6d0._4_12_;
          auVar287._0_4_ = fVar170;
          auVar104._0_4_ = (fVar170 + fVar172) * 0.5;
          auVar104._4_4_ = (local_6d0._4_4_ + auVar129._4_4_) * 0.5;
          auVar104._8_4_ = (local_6d0._8_4_ + auVar129._8_4_) * 0.5;
          auVar104._12_4_ = (local_6d0._12_4_ + auVar129._12_4_) * 0.5;
          auVar129 = vshufps_avx(auVar104,auVar104,0);
          fVar204 = auVar129._0_4_;
          fVar205 = auVar129._4_4_;
          fVar206 = auVar129._8_4_;
          fVar207 = auVar129._12_4_;
          local_5d0._0_4_ = auVar280._0_4_;
          local_5d0._4_4_ = auVar280._4_4_;
          fStack_5c8 = auVar280._8_4_;
          fStack_5c4 = auVar280._12_4_;
          auVar220._0_4_ = fVar204 * (float)local_330._0_4_ + (float)local_5d0._0_4_;
          auVar220._4_4_ = fVar205 * (float)local_330._4_4_ + (float)local_5d0._4_4_;
          auVar220._8_4_ = fVar206 * fStack_328 + fStack_5c8;
          auVar220._12_4_ = fVar207 * fStack_324 + fStack_5c4;
          local_5e0 = auVar15._0_4_;
          fStack_5dc = auVar15._4_4_;
          fStack_5d8 = auVar15._8_4_;
          fStack_5d4 = auVar15._12_4_;
          auVar301._0_4_ = fVar204 * (float)local_340._0_4_ + local_5e0;
          auVar301._4_4_ = fVar205 * (float)local_340._4_4_ + fStack_5dc;
          auVar301._8_4_ = fVar206 * fStack_338 + fStack_5d8;
          auVar301._12_4_ = fVar207 * fStack_334 + fStack_5d4;
          local_5f0 = auVar155._0_4_;
          fStack_5ec = auVar155._4_4_;
          fStack_5e8 = auVar155._8_4_;
          fStack_5e4 = auVar155._12_4_;
          auVar335._0_4_ = fVar204 * (float)local_350._0_4_ + local_5f0;
          auVar335._4_4_ = fVar205 * (float)local_350._4_4_ + fStack_5ec;
          auVar335._8_4_ = fVar206 * fStack_348 + fStack_5e8;
          auVar335._12_4_ = fVar207 * fStack_344 + fStack_5e4;
          auVar129 = vsubps_avx(auVar301,auVar220);
          auVar221._0_4_ = auVar129._0_4_ * fVar204 + auVar220._0_4_;
          auVar221._4_4_ = auVar129._4_4_ * fVar205 + auVar220._4_4_;
          auVar221._8_4_ = auVar129._8_4_ * fVar206 + auVar220._8_4_;
          auVar221._12_4_ = auVar129._12_4_ * fVar207 + auVar220._12_4_;
          auVar129 = vsubps_avx(auVar335,auVar301);
          auVar302._0_4_ = auVar301._0_4_ + auVar129._0_4_ * fVar204;
          auVar302._4_4_ = auVar301._4_4_ + auVar129._4_4_ * fVar205;
          auVar302._8_4_ = auVar301._8_4_ + auVar129._8_4_ * fVar206;
          auVar302._12_4_ = auVar301._12_4_ + auVar129._12_4_ * fVar207;
          auVar129 = vsubps_avx(auVar302,auVar221);
          fVar204 = auVar221._0_4_ + auVar129._0_4_ * fVar204;
          fVar205 = auVar221._4_4_ + auVar129._4_4_ * fVar205;
          auVar161._0_8_ = CONCAT44(fVar205,fVar204);
          auVar161._8_4_ = auVar221._8_4_ + auVar129._8_4_ * fVar206;
          auVar161._12_4_ = auVar221._12_4_ + auVar129._12_4_ * fVar207;
          fVar206 = auVar129._0_4_ * 3.0;
          fVar207 = auVar129._4_4_ * 3.0;
          auVar222._0_8_ = CONCAT44(fVar207,fVar206);
          auVar222._8_4_ = auVar129._8_4_ * 3.0;
          auVar222._12_4_ = auVar129._12_4_ * 3.0;
          auVar303._8_8_ = auVar161._0_8_;
          auVar303._0_8_ = auVar161._0_8_;
          auVar129 = vshufpd_avx(auVar161,auVar161,3);
          auVar179 = vshufps_avx(auVar104,auVar104,0x55);
          auVar195 = vsubps_avx(auVar129,auVar303);
          auVar304._0_4_ = auVar179._0_4_ * auVar195._0_4_ + fVar204;
          auVar304._4_4_ = auVar179._4_4_ * auVar195._4_4_ + fVar205;
          auVar304._8_4_ = auVar179._8_4_ * auVar195._8_4_ + fVar204;
          auVar304._12_4_ = auVar179._12_4_ * auVar195._12_4_ + fVar205;
          auVar354._8_8_ = auVar222._0_8_;
          auVar354._0_8_ = auVar222._0_8_;
          auVar129 = vshufpd_avx(auVar222,auVar222,1);
          auVar129 = vsubps_avx(auVar129,auVar354);
          auVar223._0_4_ = fVar206 + auVar179._0_4_ * auVar129._0_4_;
          auVar223._4_4_ = fVar207 + auVar179._4_4_ * auVar129._4_4_;
          auVar223._8_4_ = fVar206 + auVar179._8_4_ * auVar129._8_4_;
          auVar223._12_4_ = fVar207 + auVar179._12_4_ * auVar129._12_4_;
          auVar179 = vmovshdup_avx(auVar223);
          auVar355._0_8_ = auVar179._0_8_ ^ 0x8000000080000000;
          auVar355._8_4_ = auVar179._8_4_ ^ 0x80000000;
          auVar355._12_4_ = auVar179._12_4_ ^ 0x80000000;
          auVar244 = vmovshdup_avx(auVar195);
          auVar129 = vunpcklps_avx(auVar244,auVar355);
          auVar196 = vshufps_avx(auVar129,auVar355,4);
          auVar162._0_8_ = auVar195._0_8_ ^ 0x8000000080000000;
          auVar162._8_4_ = -auVar195._8_4_;
          auVar162._12_4_ = -auVar195._12_4_;
          auVar129 = vmovlhps_avx(auVar162,auVar223);
          auVar128 = vshufps_avx(auVar129,auVar223,8);
          auVar129 = ZEXT416((uint)(auVar244._0_4_ * auVar223._0_4_ -
                                   auVar179._0_4_ * auVar195._0_4_));
          auVar179 = vshufps_avx(auVar129,auVar129,0);
          auVar129 = vdivps_avx(auVar196,auVar179);
          auVar179 = vdivps_avx(auVar128,auVar179);
          auVar128 = vinsertps_avx(auVar241,auVar311,0x1c);
          auVar195 = vinsertps_avx(auVar259,auVar322,0x1c);
          auVar103 = vinsertps_avx(auVar311,auVar241,0x4c);
          auVar158 = vinsertps_avx(auVar322,auVar259,0x4c);
          auVar244 = vmovsldup_avx(auVar129);
          auVar323._0_4_ = auVar244._0_4_ * auVar128._0_4_;
          auVar323._4_4_ = auVar244._4_4_ * auVar128._4_4_;
          auVar323._8_4_ = auVar244._8_4_ * auVar128._8_4_;
          auVar323._12_4_ = auVar244._12_4_ * auVar128._12_4_;
          auVar312._0_4_ = auVar244._0_4_ * auVar195._0_4_;
          auVar312._4_4_ = auVar244._4_4_ * auVar195._4_4_;
          auVar312._8_4_ = auVar244._8_4_ * auVar195._8_4_;
          auVar312._12_4_ = auVar244._12_4_ * auVar195._12_4_;
          auVar196 = vminps_avx(auVar323,auVar312);
          auVar244 = vmaxps_avx(auVar312,auVar323);
          auVar273 = vmovsldup_avx(auVar179);
          auVar380._0_4_ = auVar273._0_4_ * auVar103._0_4_;
          auVar380._4_4_ = auVar273._4_4_ * auVar103._4_4_;
          auVar380._8_4_ = auVar273._8_4_ * auVar103._8_4_;
          auVar380._12_4_ = auVar273._12_4_ * auVar103._12_4_;
          auVar313._0_4_ = auVar273._0_4_ * auVar158._0_4_;
          auVar313._4_4_ = auVar273._4_4_ * auVar158._4_4_;
          auVar313._8_4_ = auVar273._8_4_ * auVar158._8_4_;
          auVar313._12_4_ = auVar273._12_4_ * auVar158._12_4_;
          auVar273 = vminps_avx(auVar380,auVar313);
          auVar131._0_4_ = auVar196._0_4_ + auVar273._0_4_;
          auVar131._4_4_ = auVar196._4_4_ + auVar273._4_4_;
          auVar131._8_4_ = auVar196._8_4_ + auVar273._8_4_;
          auVar131._12_4_ = auVar196._12_4_ + auVar273._12_4_;
          auVar196 = vmaxps_avx(auVar313,auVar380);
          auVar273 = vsubps_avx(auVar275,auVar104);
          auVar87 = vsubps_avx(auVar287,auVar104);
          auVar288._0_4_ = auVar244._0_4_ + auVar196._0_4_;
          auVar288._4_4_ = auVar244._4_4_ + auVar196._4_4_;
          auVar288._8_4_ = auVar244._8_4_ + auVar196._8_4_;
          auVar288._12_4_ = auVar244._12_4_ + auVar196._12_4_;
          auVar324._8_8_ = 0x3f800000;
          auVar324._0_8_ = 0x3f800000;
          auVar244 = vsubps_avx(auVar324,auVar288);
          auVar196 = vsubps_avx(auVar324,auVar131);
          fVar230 = auVar273._0_4_;
          auVar325._0_4_ = fVar230 * auVar244._0_4_;
          fVar340 = auVar273._4_4_;
          auVar325._4_4_ = fVar340 * auVar244._4_4_;
          fVar349 = auVar273._8_4_;
          auVar325._8_4_ = fVar349 * auVar244._8_4_;
          fVar357 = auVar273._12_4_;
          auVar325._12_4_ = fVar357 * auVar244._12_4_;
          fVar206 = auVar87._0_4_;
          auVar289._0_4_ = auVar244._0_4_ * fVar206;
          fVar207 = auVar87._4_4_;
          auVar289._4_4_ = auVar244._4_4_ * fVar207;
          fVar228 = auVar87._8_4_;
          auVar289._8_4_ = auVar244._8_4_ * fVar228;
          fVar229 = auVar87._12_4_;
          auVar289._12_4_ = auVar244._12_4_ * fVar229;
          auVar368._0_4_ = fVar230 * auVar196._0_4_;
          auVar368._4_4_ = fVar340 * auVar196._4_4_;
          auVar368._8_4_ = fVar349 * auVar196._8_4_;
          auVar368._12_4_ = fVar357 * auVar196._12_4_;
          auVar132._0_4_ = fVar206 * auVar196._0_4_;
          auVar132._4_4_ = fVar207 * auVar196._4_4_;
          auVar132._8_4_ = fVar228 * auVar196._8_4_;
          auVar132._12_4_ = fVar229 * auVar196._12_4_;
          auVar244 = vminps_avx(auVar325,auVar368);
          auVar196 = vminps_avx(auVar289,auVar132);
          auVar273 = vminps_avx(auVar244,auVar196);
          auVar244 = vmaxps_avx(auVar368,auVar325);
          auVar196 = vmaxps_avx(auVar132,auVar289);
          auVar87 = vshufps_avx(auVar104,auVar104,0x54);
          auVar196 = vmaxps_avx(auVar196,auVar244);
          auVar88 = vshufps_avx(auVar304,auVar304,0);
          auVar112 = vshufps_avx(auVar304,auVar304,0x55);
          auVar244 = vhaddps_avx(auVar273,auVar273);
          auVar196 = vhaddps_avx(auVar196,auVar196);
          auVar290._0_4_ = auVar88._0_4_ * auVar129._0_4_ + auVar112._0_4_ * auVar179._0_4_;
          auVar290._4_4_ = auVar88._4_4_ * auVar129._4_4_ + auVar112._4_4_ * auVar179._4_4_;
          auVar290._8_4_ = auVar88._8_4_ * auVar129._8_4_ + auVar112._8_4_ * auVar179._8_4_;
          auVar290._12_4_ = auVar88._12_4_ * auVar129._12_4_ + auVar112._12_4_ * auVar179._12_4_;
          auVar273 = vsubps_avx(auVar87,auVar290);
          fVar204 = auVar273._0_4_ + auVar244._0_4_;
          fVar205 = auVar273._0_4_ + auVar196._0_4_;
          auVar244 = vmaxss_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar204));
          auVar196 = vminss_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar170));
          if (auVar244._0_4_ <= auVar196._0_4_) {
            auVar244 = vmovshdup_avx(auVar129);
            auVar192._0_4_ = auVar128._0_4_ * auVar244._0_4_;
            auVar192._4_4_ = auVar128._4_4_ * auVar244._4_4_;
            auVar192._8_4_ = auVar128._8_4_ * auVar244._8_4_;
            auVar192._12_4_ = auVar128._12_4_ * auVar244._12_4_;
            auVar133._0_4_ = auVar195._0_4_ * auVar244._0_4_;
            auVar133._4_4_ = auVar195._4_4_ * auVar244._4_4_;
            auVar133._8_4_ = auVar195._8_4_ * auVar244._8_4_;
            auVar133._12_4_ = auVar195._12_4_ * auVar244._12_4_;
            auVar196 = vminps_avx(auVar192,auVar133);
            auVar244 = vmaxps_avx(auVar133,auVar192);
            auVar128 = vmovshdup_avx(auVar179);
            auVar242._0_4_ = auVar128._0_4_ * auVar103._0_4_;
            auVar242._4_4_ = auVar128._4_4_ * auVar103._4_4_;
            auVar242._8_4_ = auVar128._8_4_ * auVar103._8_4_;
            auVar242._12_4_ = auVar128._12_4_ * auVar103._12_4_;
            auVar193._0_4_ = auVar128._0_4_ * auVar158._0_4_;
            auVar193._4_4_ = auVar128._4_4_ * auVar158._4_4_;
            auVar193._8_4_ = auVar128._8_4_ * auVar158._8_4_;
            auVar193._12_4_ = auVar128._12_4_ * auVar158._12_4_;
            auVar128 = vminps_avx(auVar242,auVar193);
            auVar260._0_4_ = auVar196._0_4_ + auVar128._0_4_;
            auVar260._4_4_ = auVar196._4_4_ + auVar128._4_4_;
            auVar260._8_4_ = auVar196._8_4_ + auVar128._8_4_;
            auVar260._12_4_ = auVar196._12_4_ + auVar128._12_4_;
            auVar196 = vmaxps_avx(auVar193,auVar242);
            auVar134._0_4_ = auVar244._0_4_ + auVar196._0_4_;
            auVar134._4_4_ = auVar244._4_4_ + auVar196._4_4_;
            auVar134._8_4_ = auVar244._8_4_ + auVar196._8_4_;
            auVar134._12_4_ = auVar244._12_4_ + auVar196._12_4_;
            auVar244 = vsubps_avx(auVar191,auVar134);
            auVar196 = vsubps_avx(auVar191,auVar260);
            auVar243._0_4_ = fVar230 * auVar244._0_4_;
            auVar243._4_4_ = fVar340 * auVar244._4_4_;
            auVar243._8_4_ = fVar349 * auVar244._8_4_;
            auVar243._12_4_ = fVar357 * auVar244._12_4_;
            auVar261._0_4_ = fVar230 * auVar196._0_4_;
            auVar261._4_4_ = fVar340 * auVar196._4_4_;
            auVar261._8_4_ = fVar349 * auVar196._8_4_;
            auVar261._12_4_ = fVar357 * auVar196._12_4_;
            auVar135._0_4_ = fVar206 * auVar244._0_4_;
            auVar135._4_4_ = fVar207 * auVar244._4_4_;
            auVar135._8_4_ = fVar228 * auVar244._8_4_;
            auVar135._12_4_ = fVar229 * auVar244._12_4_;
            auVar194._0_4_ = fVar206 * auVar196._0_4_;
            auVar194._4_4_ = fVar207 * auVar196._4_4_;
            auVar194._8_4_ = fVar228 * auVar196._8_4_;
            auVar194._12_4_ = fVar229 * auVar196._12_4_;
            auVar244 = vminps_avx(auVar243,auVar261);
            auVar196 = vminps_avx(auVar135,auVar194);
            auVar244 = vminps_avx(auVar244,auVar196);
            auVar196 = vmaxps_avx(auVar261,auVar243);
            auVar128 = vmaxps_avx(auVar194,auVar135);
            auVar244 = vhaddps_avx(auVar244,auVar244);
            auVar196 = vmaxps_avx(auVar128,auVar196);
            auVar196 = vhaddps_avx(auVar196,auVar196);
            auVar128 = vmovshdup_avx(auVar273);
            auVar195 = ZEXT416((uint)(auVar128._0_4_ + auVar244._0_4_));
            auVar244 = vmaxss_avx(local_6d0,auVar195);
            auVar128 = ZEXT416((uint)(auVar128._0_4_ + auVar196._0_4_));
            auVar196 = vminss_avx(auVar128,auVar86);
            auVar369._8_4_ = 0x7fffffff;
            auVar369._0_8_ = 0x7fffffff7fffffff;
            auVar369._12_4_ = 0x7fffffff;
            if (auVar244._0_4_ <= auVar196._0_4_) {
              uVar77 = 0;
              auVar382 = ZEXT864(0) << 0x20;
              if ((fVar172 < fVar204) && (fVar205 < fVar170)) {
                auVar244 = vcmpps_avx(auVar128,auVar86,1);
                auVar196 = vcmpps_avx(local_6d0,auVar195,1);
                auVar244 = vandps_avx(auVar196,auVar244);
                uVar77 = auVar244._0_4_;
              }
              if (((uint)uVar82 < 4 && 0.001 <= fVar171) && (uVar77 & 1) == 0) {
                bVar52 = false;
              }
              else {
                lVar80 = 200;
                do {
                  fVar204 = auVar273._0_4_;
                  fVar171 = 1.0 - fVar204;
                  auVar244 = ZEXT416((uint)(fVar171 * fVar171 * fVar171));
                  auVar244 = vshufps_avx(auVar244,auVar244,0);
                  auVar196 = ZEXT416((uint)(fVar204 * 3.0 * fVar171 * fVar171));
                  auVar196 = vshufps_avx(auVar196,auVar196,0);
                  auVar128 = ZEXT416((uint)(fVar171 * fVar204 * fVar204 * 3.0));
                  auVar128 = vshufps_avx(auVar128,auVar128,0);
                  auVar195 = ZEXT416((uint)(fVar204 * fVar204 * fVar204));
                  auVar195 = vshufps_avx(auVar195,auVar195,0);
                  fVar171 = (float)local_5d0._0_4_ * auVar244._0_4_ +
                            local_5e0 * auVar196._0_4_ +
                            (float)local_490._0_4_ * auVar195._0_4_ + local_5f0 * auVar128._0_4_;
                  fVar204 = (float)local_5d0._4_4_ * auVar244._4_4_ +
                            fStack_5dc * auVar196._4_4_ +
                            (float)local_490._4_4_ * auVar195._4_4_ + fStack_5ec * auVar128._4_4_;
                  auVar136._0_8_ = CONCAT44(fVar204,fVar171);
                  auVar136._8_4_ =
                       fStack_5c8 * auVar244._8_4_ +
                       fStack_5d8 * auVar196._8_4_ +
                       fStack_488 * auVar195._8_4_ + fStack_5e8 * auVar128._8_4_;
                  auVar136._12_4_ =
                       fStack_5c4 * auVar244._12_4_ +
                       fStack_5d4 * auVar196._12_4_ +
                       fStack_484 * auVar195._12_4_ + fStack_5e4 * auVar128._12_4_;
                  auVar197._8_8_ = auVar136._0_8_;
                  auVar197._0_8_ = auVar136._0_8_;
                  auVar196 = vshufpd_avx(auVar136,auVar136,1);
                  auVar244 = vmovshdup_avx(auVar273);
                  auVar196 = vsubps_avx(auVar196,auVar197);
                  auVar137._0_4_ = auVar244._0_4_ * auVar196._0_4_ + fVar171;
                  auVar137._4_4_ = auVar244._4_4_ * auVar196._4_4_ + fVar204;
                  auVar137._8_4_ = auVar244._8_4_ * auVar196._8_4_ + fVar171;
                  auVar137._12_4_ = auVar244._12_4_ * auVar196._12_4_ + fVar204;
                  auVar244 = vshufps_avx(auVar137,auVar137,0);
                  auVar196 = vshufps_avx(auVar137,auVar137,0x55);
                  auVar198._0_4_ = auVar129._0_4_ * auVar244._0_4_ + auVar179._0_4_ * auVar196._0_4_
                  ;
                  auVar198._4_4_ = auVar129._4_4_ * auVar244._4_4_ + auVar179._4_4_ * auVar196._4_4_
                  ;
                  auVar198._8_4_ = auVar129._8_4_ * auVar244._8_4_ + auVar179._8_4_ * auVar196._8_4_
                  ;
                  auVar198._12_4_ =
                       auVar129._12_4_ * auVar244._12_4_ + auVar179._12_4_ * auVar196._12_4_;
                  auVar273 = vsubps_avx(auVar273,auVar198);
                  auVar244 = vandps_avx(auVar369,auVar137);
                  auVar196 = vshufps_avx(auVar244,auVar244,0xf5);
                  auVar244 = vmaxss_avx(auVar196,auVar244);
                  if (auVar244._0_4_ < fVar169) {
                    fVar171 = auVar273._0_4_;
                    if ((0.0 <= fVar171) && (fVar171 <= 1.0)) {
                      auVar129 = vmovshdup_avx(auVar273);
                      fVar204 = auVar129._0_4_;
                      if ((0.0 <= fVar204) && (fVar204 <= 1.0)) {
                        auVar129 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar158 = vinsertps_avx(auVar129,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar129 = vdpps_avx(auVar158,local_360,0x7f);
                        auVar179 = vdpps_avx(auVar158,local_370,0x7f);
                        auVar244 = vdpps_avx(auVar158,local_3a0,0x7f);
                        auVar196 = vdpps_avx(auVar158,local_3b0,0x7f);
                        auVar128 = vdpps_avx(auVar158,local_3c0,0x7f);
                        auVar195 = vdpps_avx(auVar158,local_3d0,0x7f);
                        fVar229 = 1.0 - fVar204;
                        auVar103 = vdpps_avx(auVar158,local_380,0x7f);
                        auVar158 = vdpps_avx(auVar158,local_390,0x7f);
                        fVar230 = 1.0 - fVar171;
                        fVar205 = auVar273._4_4_;
                        fVar206 = auVar273._8_4_;
                        fVar207 = auVar273._12_4_;
                        fVar228 = fVar230 * fVar171 * fVar171 * 3.0;
                        auVar245._0_4_ = fVar171 * fVar171 * fVar171;
                        auVar245._4_4_ = fVar205 * fVar205 * fVar205;
                        auVar245._8_4_ = fVar206 * fVar206 * fVar206;
                        auVar245._12_4_ = fVar207 * fVar207 * fVar207;
                        fVar205 = fVar171 * 3.0 * fVar230 * fVar230;
                        fVar206 = fVar230 * fVar230 * fVar230;
                        fVar171 = (fVar229 * auVar129._0_4_ + fVar204 * auVar244._0_4_) * fVar206 +
                                  (fVar229 * auVar179._0_4_ + fVar204 * auVar196._0_4_) * fVar205 +
                                  fVar228 * (fVar229 * auVar103._0_4_ + fVar204 * auVar128._0_4_) +
                                  auVar245._0_4_ *
                                  (auVar195._0_4_ * fVar204 + fVar229 * auVar158._0_4_);
                        if ((fVar142 <= fVar171) &&
                           (fVar204 = *(float *)(ray + k * 4 + 0x100), fVar171 <= fVar204)) {
                          pGVar8 = (context->scene->geometries).items[uVar76].ptr;
                          if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                            bVar85 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar85 = true,
                                  pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            local_f0 = vshufps_avx(auVar273,auVar273,0x55);
                            auVar291._8_4_ = 0x3f800000;
                            auVar291._0_8_ = &DAT_3f8000003f800000;
                            auVar291._12_4_ = 0x3f800000;
                            auVar129 = vsubps_avx(auVar291,local_f0);
                            fVar207 = local_f0._0_4_;
                            fVar229 = local_f0._4_4_;
                            fVar340 = local_f0._8_4_;
                            fVar349 = local_f0._12_4_;
                            fVar357 = auVar129._0_4_;
                            fVar358 = auVar129._4_4_;
                            fVar359 = auVar129._8_4_;
                            fVar362 = auVar129._12_4_;
                            auVar305._0_4_ =
                                 fVar207 * (float)local_4d0._0_4_ + fVar357 * (float)local_4a0._0_4_
                            ;
                            auVar305._4_4_ =
                                 fVar229 * (float)local_4d0._4_4_ + fVar358 * (float)local_4a0._4_4_
                            ;
                            auVar305._8_4_ = fVar340 * fStack_4c8 + fVar359 * fStack_498;
                            auVar305._12_4_ = fVar349 * fStack_4c4 + fVar362 * fStack_494;
                            auVar314._0_4_ = fVar207 * fVar246 + fVar357 * fVar231;
                            auVar314._4_4_ = fVar229 * fVar319 + fVar358 * fVar141;
                            auVar314._8_4_ = fVar340 * fVar307 + fVar359 * fVar329;
                            auVar314._12_4_ = fVar349 * fVar330 + fVar362 * fVar318;
                            auVar326._0_4_ = fVar207 * fVar247 + fVar357 * (float)local_4b0._0_4_;
                            auVar326._4_4_ = fVar229 * fVar327 + fVar358 * (float)local_4b0._4_4_;
                            auVar326._8_4_ = fVar340 * fVar316 + fVar359 * fStack_4a8;
                            auVar326._12_4_ = fVar349 * fVar336 + fVar362 * fStack_4a4;
                            auVar292._0_4_ = fVar207 * fVar248 + fVar357 * (float)local_4c0._0_4_;
                            auVar292._4_4_ = fVar229 * fVar328 + fVar358 * (float)local_4c0._4_4_;
                            auVar292._8_4_ = fVar340 * fVar317 + fVar359 * fStack_4b8;
                            auVar292._12_4_ = fVar349 * fVar338 + fVar362 * fStack_4b4;
                            auVar196 = vsubps_avx(auVar314,auVar305);
                            auVar128 = vsubps_avx(auVar326,auVar314);
                            auVar195 = vsubps_avx(auVar292,auVar326);
                            local_110 = vshufps_avx(auVar273,auVar273,0);
                            fVar207 = local_110._0_4_;
                            fVar340 = local_110._4_4_;
                            fVar349 = local_110._8_4_;
                            fVar358 = local_110._12_4_;
                            auVar129 = vshufps_avx(ZEXT416((uint)fVar230),ZEXT416((uint)fVar230),0);
                            fVar229 = auVar129._0_4_;
                            fVar230 = auVar129._4_4_;
                            fVar357 = auVar129._8_4_;
                            fVar359 = auVar129._12_4_;
                            auVar129 = vshufps_avx(auVar245,auVar245,0);
                            auVar179 = vshufps_avx(ZEXT416((uint)fVar228),ZEXT416((uint)fVar228),0);
                            auVar244 = vshufps_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar205),0);
                            auVar224._0_4_ =
                                 ((auVar128._0_4_ * fVar229 + auVar195._0_4_ * fVar207) * fVar207 +
                                 (auVar196._0_4_ * fVar229 + auVar128._0_4_ * fVar207) * fVar229) *
                                 3.0;
                            auVar224._4_4_ =
                                 ((auVar128._4_4_ * fVar230 + auVar195._4_4_ * fVar340) * fVar340 +
                                 (auVar196._4_4_ * fVar230 + auVar128._4_4_ * fVar340) * fVar230) *
                                 3.0;
                            auVar224._8_4_ =
                                 ((auVar128._8_4_ * fVar357 + auVar195._8_4_ * fVar349) * fVar349 +
                                 (auVar196._8_4_ * fVar357 + auVar128._8_4_ * fVar349) * fVar357) *
                                 3.0;
                            auVar224._12_4_ =
                                 ((auVar128._12_4_ * fVar359 + auVar195._12_4_ * fVar358) * fVar358
                                 + (auVar196._12_4_ * fVar359 + auVar128._12_4_ * fVar358) * fVar359
                                 ) * 3.0;
                            auVar196 = vshufps_avx(ZEXT416((uint)fVar206),ZEXT416((uint)fVar206),0);
                            auVar163._0_4_ =
                                 auVar196._0_4_ * (float)local_400._0_4_ +
                                 auVar244._0_4_ * (float)local_410._0_4_ +
                                 auVar129._0_4_ * (float)local_430._0_4_ +
                                 auVar179._0_4_ * (float)local_420._0_4_;
                            auVar163._4_4_ =
                                 auVar196._4_4_ * (float)local_400._4_4_ +
                                 auVar244._4_4_ * (float)local_410._4_4_ +
                                 auVar129._4_4_ * (float)local_430._4_4_ +
                                 auVar179._4_4_ * (float)local_420._4_4_;
                            auVar163._8_4_ =
                                 auVar196._8_4_ * fStack_3f8 +
                                 auVar244._8_4_ * fStack_408 +
                                 auVar129._8_4_ * fStack_428 + auVar179._8_4_ * fStack_418;
                            auVar163._12_4_ =
                                 auVar196._12_4_ * fStack_3f4 +
                                 auVar244._12_4_ * fStack_404 +
                                 auVar129._12_4_ * fStack_424 + auVar179._12_4_ * fStack_414;
                            auVar129 = vshufps_avx(auVar224,auVar224,0xc9);
                            auVar199._0_4_ = auVar163._0_4_ * auVar129._0_4_;
                            auVar199._4_4_ = auVar163._4_4_ * auVar129._4_4_;
                            auVar199._8_4_ = auVar163._8_4_ * auVar129._8_4_;
                            auVar199._12_4_ = auVar163._12_4_ * auVar129._12_4_;
                            auVar129 = vshufps_avx(auVar163,auVar163,0xc9);
                            auVar164._0_4_ = auVar224._0_4_ * auVar129._0_4_;
                            auVar164._4_4_ = auVar224._4_4_ * auVar129._4_4_;
                            auVar164._8_4_ = auVar224._8_4_ * auVar129._8_4_;
                            auVar164._12_4_ = auVar224._12_4_ * auVar129._12_4_;
                            auVar129 = vsubps_avx(auVar164,auVar199);
                            local_170 = vshufps_avx(auVar129,auVar129,0x55);
                            local_180[0] = (RTCHitN)local_170[0];
                            local_180[1] = (RTCHitN)local_170[1];
                            local_180[2] = (RTCHitN)local_170[2];
                            local_180[3] = (RTCHitN)local_170[3];
                            local_180[4] = (RTCHitN)local_170[4];
                            local_180[5] = (RTCHitN)local_170[5];
                            local_180[6] = (RTCHitN)local_170[6];
                            local_180[7] = (RTCHitN)local_170[7];
                            local_180[8] = (RTCHitN)local_170[8];
                            local_180[9] = (RTCHitN)local_170[9];
                            local_180[10] = (RTCHitN)local_170[10];
                            local_180[0xb] = (RTCHitN)local_170[0xb];
                            local_180[0xc] = (RTCHitN)local_170[0xc];
                            local_180[0xd] = (RTCHitN)local_170[0xd];
                            local_180[0xe] = (RTCHitN)local_170[0xe];
                            local_180[0xf] = (RTCHitN)local_170[0xf];
                            local_150 = vshufps_avx(auVar129,auVar129,0xaa);
                            local_160 = local_150;
                            local_130 = vshufps_avx(auVar129,auVar129,0);
                            local_140 = local_130;
                            local_120 = local_110;
                            local_100 = local_f0;
                            local_e0 = local_2e0._0_8_;
                            uStack_d8 = local_2e0._8_8_;
                            uStack_d0 = local_2e0._16_8_;
                            uStack_c8 = local_2e0._24_8_;
                            local_c0 = local_2c0._0_8_;
                            uStack_b8 = local_2c0._8_8_;
                            uStack_b0 = local_2c0._16_8_;
                            uStack_a8 = local_2c0._24_8_;
                            auVar106 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_9c = context->user->instID[0];
                            local_a0 = uStack_9c;
                            uStack_98 = uStack_9c;
                            uStack_94 = uStack_9c;
                            uStack_90 = uStack_9c;
                            uStack_8c = uStack_9c;
                            uStack_84 = auVar106._28_4_;
                            uVar77 = uStack_84;
                            uStack_88 = uStack_9c;
                            uStack_84 = uStack_9c;
                            uStack_7c = context->user->instPrimID[0];
                            local_80 = uStack_7c;
                            uStack_78 = uStack_7c;
                            uStack_74 = uStack_7c;
                            uStack_70 = uStack_7c;
                            uStack_6c = uStack_7c;
                            uStack_68 = uStack_7c;
                            uStack_64 = uStack_7c;
                            *(float *)(ray + k * 4 + 0x100) = fVar171;
                            local_4f0 = *(undefined8 *)(mm_lookupmask_ps + lVar79);
                            uStack_4e8 = *(undefined8 *)(mm_lookupmask_ps + lVar79 + 8);
                            local_500 = *(undefined8 *)(mm_lookupmask_ps + uVar78);
                            uStack_4f8 = *(undefined8 *)(mm_lookupmask_ps + uVar78 + 8);
                            local_460.valid = (int *)&local_500;
                            local_460.geometryUserPtr = pGVar8->userPtr;
                            local_460.context = context->user;
                            local_460.ray = (RTCRayN *)ray;
                            local_460.hit = local_180;
                            local_460.N = 8;
                            if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar8->occlusionFilterN)(&local_460);
                              auVar382 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            auVar70._8_8_ = uStack_4f8;
                            auVar70._0_8_ = local_500;
                            auVar129 = vpcmpeqd_avx(auVar382._0_16_,auVar70);
                            auVar72._8_8_ = uStack_4e8;
                            auVar72._0_8_ = local_4f0;
                            auVar179 = vpcmpeqd_avx(auVar382._0_16_,auVar72);
                            auVar110._16_16_ = auVar179;
                            auVar110._0_16_ = auVar129;
                            auVar20 = auVar106 & ~auVar110;
                            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0 &&
                                     (auVar20 >> 0x3f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar20 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar20 >> 0x7f,0) == '\0') &&
                                  (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                                  ) && SUB321(auVar20 >> 0xbf,0) == '\0') &&
                                (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0)
                                && -1 < auVar20[0x1f]) {
                              auVar111._0_4_ = auVar129._0_4_ ^ auVar106._0_4_;
                              auVar111._4_4_ = auVar129._4_4_ ^ auVar106._4_4_;
                              auVar111._8_4_ = auVar129._8_4_ ^ auVar106._8_4_;
                              auVar111._12_4_ = auVar129._12_4_ ^ auVar106._12_4_;
                              auVar111._16_4_ = auVar179._0_4_ ^ auVar106._16_4_;
                              auVar111._20_4_ = auVar179._4_4_ ^ auVar106._20_4_;
                              auVar111._24_4_ = auVar179._8_4_ ^ auVar106._24_4_;
                              auVar111._28_4_ = auVar179._12_4_ ^ uVar77;
                            }
                            else {
                              p_Var11 = context->args->filter;
                              if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var11)(&local_460);
                                auVar382 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar71._8_8_ = uStack_4f8;
                              auVar71._0_8_ = local_500;
                              auVar129 = vpcmpeqd_avx(auVar382._0_16_,auVar71);
                              auVar73._8_8_ = uStack_4e8;
                              auVar73._0_8_ = local_4f0;
                              auVar179 = vpcmpeqd_avx(auVar382._0_16_,auVar73);
                              auVar140._16_16_ = auVar179;
                              auVar140._0_16_ = auVar129;
                              auVar111._0_4_ = auVar129._0_4_ ^ auVar106._0_4_;
                              auVar111._4_4_ = auVar129._4_4_ ^ auVar106._4_4_;
                              auVar111._8_4_ = auVar129._8_4_ ^ auVar106._8_4_;
                              auVar111._12_4_ = auVar129._12_4_ ^ auVar106._12_4_;
                              auVar111._16_4_ = auVar179._0_4_ ^ auVar106._16_4_;
                              auVar111._20_4_ = auVar179._4_4_ ^ auVar106._20_4_;
                              auVar111._24_4_ = auVar179._8_4_ ^ auVar106._24_4_;
                              auVar111._28_4_ = auVar179._12_4_ ^ uVar77;
                              auVar168._8_4_ = 0xff800000;
                              auVar168._0_8_ = 0xff800000ff800000;
                              auVar168._12_4_ = 0xff800000;
                              auVar168._16_4_ = 0xff800000;
                              auVar168._20_4_ = 0xff800000;
                              auVar168._24_4_ = 0xff800000;
                              auVar168._28_4_ = 0xff800000;
                              auVar106 = vblendvps_avx(auVar168,*(undefined1 (*) [32])
                                                                 (local_460.ray + 0x100),auVar140);
                              *(undefined1 (*) [32])(local_460.ray + 0x100) = auVar106;
                            }
                            bVar60 = (auVar111 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar61 = (auVar111 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar59 = (auVar111 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar58 = SUB321(auVar111 >> 0x7f,0) != '\0';
                            bVar57 = (auVar111 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar54 = SUB321(auVar111 >> 0xbf,0) != '\0';
                            bVar53 = (auVar111 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar85 = auVar111[0x1f] < '\0';
                            if (((((((!bVar60 && !bVar61) && !bVar59) && !bVar58) && !bVar57) &&
                                 !bVar54) && !bVar53) && !bVar85) {
                              *(float *)(ray + k * 4 + 0x100) = fVar204;
                            }
                            bVar85 = ((((((bVar60 || bVar61) || bVar59) || bVar58) || bVar57) ||
                                      bVar54) || bVar53) || bVar85;
                          }
                          bVar74 = (bool)(bVar74 | bVar85);
                        }
                      }
                    }
                    break;
                  }
                  lVar80 = lVar80 + -1;
                } while (lVar80 != 0);
              }
              goto LAB_01066108;
            }
          }
          goto LAB_01066484;
        }
      }
LAB_01066108:
    } while (bVar52);
    local_3e0 = vinsertps_avx(ZEXT416((uint)fVar172),ZEXT416((uint)fVar170),0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }